

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  Primitive PVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  __int_type_conflict _Var17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [24];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  uint uVar124;
  int iVar125;
  ulong uVar126;
  RTCIntersectArguments *pRVar127;
  uint uVar128;
  long lVar129;
  bool bVar130;
  long lVar131;
  Geometry *pGVar132;
  ulong uVar133;
  long lVar134;
  float fVar135;
  float fVar149;
  float fVar152;
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar136;
  float fVar150;
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar151;
  float fVar154;
  float fVar157;
  float fVar161;
  float fVar162;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar163;
  float fVar178;
  float fVar179;
  vint4 bi;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar180;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  float fVar181;
  float fVar182;
  float fVar194;
  float fVar195;
  vint4 bi_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar196;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  float fVar199;
  undefined1 auVar192 [32];
  float fVar197;
  float fVar198;
  undefined1 auVar193 [64];
  float fVar200;
  float fVar213;
  float fVar214;
  vint4 ai_1;
  undefined1 auVar201 [16];
  float fVar216;
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar203 [16];
  float fVar219;
  float fVar221;
  float fVar223;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar222;
  float fVar224;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  float fVar225;
  float fVar226;
  float fVar235;
  float fVar237;
  vint4 ai_2;
  undefined1 auVar227 [16];
  float fVar239;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar241;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar236;
  float fVar238;
  float fVar240;
  undefined1 auVar234 [64];
  float fVar242;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [16];
  float fVar252;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar253;
  float fVar260;
  float fVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar262;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar263;
  float fVar264;
  undefined1 auVar259 [32];
  vint4 ai;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  float fVar272;
  float fVar273;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar278 [32];
  float fVar283;
  float fVar285;
  float fVar288;
  float fVar292;
  undefined1 auVar279 [32];
  float fVar293;
  float fVar302;
  float fVar303;
  undefined1 auVar294 [16];
  float fVar305;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar304;
  undefined1 auVar301 [64];
  float fVar306;
  float fVar312;
  float fVar313;
  undefined1 auVar307 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar317;
  float fVar318;
  float fVar321;
  float fVar322;
  undefined1 auVar319 [16];
  float fVar323;
  undefined1 auVar320 [32];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar331;
  float fVar337;
  float fVar338;
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar336 [64];
  float fVar342;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar343 [32];
  float fVar347;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_7e0;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint local_7c0;
  undefined4 uStack_7bc;
  undefined1 local_7a0 [16];
  ulong local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 (*local_6e0) [16];
  Precalculations *local_6d8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined1 local_630 [8];
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 local_610 [8];
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [4];
  undefined1 auStack_59c [8];
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [8];
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  LinearSpace3fa *local_510;
  Primitive *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  RTCHitN local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  PVar13 = prim[1];
  uVar126 = (ulong)(byte)PVar13;
  lVar20 = uVar126 * 0x25;
  fVar182 = *(float *)(prim + lVar20 + 0x12);
  auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar140 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar140 = vsubps_avx(auVar140,*(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar164._0_4_ = fVar182 * auVar140._0_4_;
  auVar164._4_4_ = fVar182 * auVar140._4_4_;
  auVar164._8_4_ = fVar182 * auVar140._8_4_;
  auVar164._12_4_ = fVar182 * auVar140._12_4_;
  auVar265._0_4_ = fVar182 * auVar204._0_4_;
  auVar265._4_4_ = fVar182 * auVar204._4_4_;
  auVar265._8_4_ = fVar182 * auVar204._8_4_;
  auVar265._12_4_ = fVar182 * auVar204._12_4_;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 5 + 6)));
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 6)));
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xf + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar126 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1b + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vshufps_avx(auVar265,auVar265,0);
  auVar29 = vshufps_avx(auVar265,auVar265,0x55);
  auVar30 = vshufps_avx(auVar265,auVar265,0xaa);
  fVar182 = auVar30._0_4_;
  fVar198 = auVar30._4_4_;
  fVar196 = auVar30._8_4_;
  fVar318 = auVar30._12_4_;
  fVar225 = auVar29._0_4_;
  fVar235 = auVar29._4_4_;
  fVar237 = auVar29._8_4_;
  fVar239 = auVar29._12_4_;
  fVar200 = auVar28._0_4_;
  fVar213 = auVar28._4_4_;
  fVar214 = auVar28._8_4_;
  fVar216 = auVar28._12_4_;
  auVar324._0_4_ = fVar200 * auVar140._0_4_ + fVar225 * auVar204._0_4_ + fVar182 * auVar205._0_4_;
  auVar324._4_4_ = fVar213 * auVar140._4_4_ + fVar235 * auVar204._4_4_ + fVar198 * auVar205._4_4_;
  auVar324._8_4_ = fVar214 * auVar140._8_4_ + fVar237 * auVar204._8_4_ + fVar196 * auVar205._8_4_;
  auVar324._12_4_ =
       fVar216 * auVar140._12_4_ + fVar239 * auVar204._12_4_ + fVar318 * auVar205._12_4_;
  auVar332._0_4_ = fVar200 * auVar22._0_4_ + fVar225 * auVar23._0_4_ + auVar24._0_4_ * fVar182;
  auVar332._4_4_ = fVar213 * auVar22._4_4_ + fVar235 * auVar23._4_4_ + auVar24._4_4_ * fVar198;
  auVar332._8_4_ = fVar214 * auVar22._8_4_ + fVar237 * auVar23._8_4_ + auVar24._8_4_ * fVar196;
  auVar332._12_4_ = fVar216 * auVar22._12_4_ + fVar239 * auVar23._12_4_ + auVar24._12_4_ * fVar318;
  auVar266._0_4_ = fVar200 * auVar25._0_4_ + fVar225 * auVar26._0_4_ + auVar27._0_4_ * fVar182;
  auVar266._4_4_ = fVar213 * auVar25._4_4_ + fVar235 * auVar26._4_4_ + auVar27._4_4_ * fVar198;
  auVar266._8_4_ = fVar214 * auVar25._8_4_ + fVar237 * auVar26._8_4_ + auVar27._8_4_ * fVar196;
  auVar266._12_4_ = fVar216 * auVar25._12_4_ + fVar239 * auVar26._12_4_ + auVar27._12_4_ * fVar318;
  auVar28 = vshufps_avx(auVar164,auVar164,0);
  auVar29 = vshufps_avx(auVar164,auVar164,0x55);
  auVar30 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar182 = auVar30._0_4_;
  fVar198 = auVar30._4_4_;
  fVar196 = auVar30._8_4_;
  fVar318 = auVar30._12_4_;
  fVar225 = auVar29._0_4_;
  fVar235 = auVar29._4_4_;
  fVar237 = auVar29._8_4_;
  fVar239 = auVar29._12_4_;
  fVar200 = auVar28._0_4_;
  fVar213 = auVar28._4_4_;
  fVar214 = auVar28._8_4_;
  fVar216 = auVar28._12_4_;
  auVar165._0_4_ = fVar200 * auVar140._0_4_ + fVar225 * auVar204._0_4_ + fVar182 * auVar205._0_4_;
  auVar165._4_4_ = fVar213 * auVar140._4_4_ + fVar235 * auVar204._4_4_ + fVar198 * auVar205._4_4_;
  auVar165._8_4_ = fVar214 * auVar140._8_4_ + fVar237 * auVar204._8_4_ + fVar196 * auVar205._8_4_;
  auVar165._12_4_ =
       fVar216 * auVar140._12_4_ + fVar239 * auVar204._12_4_ + fVar318 * auVar205._12_4_;
  auVar137._0_4_ = fVar200 * auVar22._0_4_ + auVar24._0_4_ * fVar182 + fVar225 * auVar23._0_4_;
  auVar137._4_4_ = fVar213 * auVar22._4_4_ + auVar24._4_4_ * fVar198 + fVar235 * auVar23._4_4_;
  auVar137._8_4_ = fVar214 * auVar22._8_4_ + auVar24._8_4_ * fVar196 + fVar237 * auVar23._8_4_;
  auVar137._12_4_ = fVar216 * auVar22._12_4_ + auVar24._12_4_ * fVar318 + fVar239 * auVar23._12_4_;
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar140 = vandps_avx(auVar324,auVar274);
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  auVar140 = vcmpps_avx(auVar140,auVar227,1);
  auVar204 = vblendvps_avx(auVar324,auVar227,auVar140);
  auVar140 = vandps_avx(auVar332,auVar274);
  auVar140 = vcmpps_avx(auVar140,auVar227,1);
  auVar205 = vblendvps_avx(auVar332,auVar227,auVar140);
  auVar140 = vandps_avx(auVar274,auVar266);
  auVar140 = vcmpps_avx(auVar140,auVar227,1);
  auVar140 = vblendvps_avx(auVar266,auVar227,auVar140);
  auVar183._0_4_ = fVar200 * auVar25._0_4_ + fVar225 * auVar26._0_4_ + auVar27._0_4_ * fVar182;
  auVar183._4_4_ = fVar213 * auVar25._4_4_ + fVar235 * auVar26._4_4_ + auVar27._4_4_ * fVar198;
  auVar183._8_4_ = fVar214 * auVar25._8_4_ + fVar237 * auVar26._8_4_ + auVar27._8_4_ * fVar196;
  auVar183._12_4_ = fVar216 * auVar25._12_4_ + fVar239 * auVar26._12_4_ + auVar27._12_4_ * fVar318;
  auVar22 = vrcpps_avx(auVar204);
  fVar200 = auVar22._0_4_;
  auVar201._0_4_ = fVar200 * auVar204._0_4_;
  fVar213 = auVar22._4_4_;
  auVar201._4_4_ = fVar213 * auVar204._4_4_;
  fVar214 = auVar22._8_4_;
  auVar201._8_4_ = fVar214 * auVar204._8_4_;
  fVar216 = auVar22._12_4_;
  auVar201._12_4_ = fVar216 * auVar204._12_4_;
  auVar254._8_4_ = 0x3f800000;
  auVar254._0_8_ = 0x3f8000003f800000;
  auVar254._12_4_ = 0x3f800000;
  auVar204 = vsubps_avx(auVar254,auVar201);
  fVar200 = fVar200 + fVar200 * auVar204._0_4_;
  fVar213 = fVar213 + fVar213 * auVar204._4_4_;
  fVar214 = fVar214 + fVar214 * auVar204._8_4_;
  fVar216 = fVar216 + fVar216 * auVar204._12_4_;
  auVar204 = vrcpps_avx(auVar205);
  fVar225 = auVar204._0_4_;
  auVar243._0_4_ = fVar225 * auVar205._0_4_;
  fVar235 = auVar204._4_4_;
  auVar243._4_4_ = fVar235 * auVar205._4_4_;
  fVar237 = auVar204._8_4_;
  auVar243._8_4_ = fVar237 * auVar205._8_4_;
  fVar239 = auVar204._12_4_;
  auVar243._12_4_ = fVar239 * auVar205._12_4_;
  auVar204 = vsubps_avx(auVar254,auVar243);
  fVar225 = fVar225 + fVar225 * auVar204._0_4_;
  fVar235 = fVar235 + fVar235 * auVar204._4_4_;
  fVar237 = fVar237 + fVar237 * auVar204._8_4_;
  fVar239 = fVar239 + fVar239 * auVar204._12_4_;
  auVar204 = vrcpps_avx(auVar140);
  fVar242 = auVar204._0_4_;
  auVar267._0_4_ = fVar242 * auVar140._0_4_;
  fVar250 = auVar204._4_4_;
  auVar267._4_4_ = fVar250 * auVar140._4_4_;
  fVar251 = auVar204._8_4_;
  auVar267._8_4_ = fVar251 * auVar140._8_4_;
  fVar252 = auVar204._12_4_;
  auVar267._12_4_ = fVar252 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar254,auVar267);
  fVar242 = fVar242 + fVar242 * auVar140._0_4_;
  fVar250 = fVar250 + fVar250 * auVar140._4_4_;
  fVar251 = fVar251 + fVar251 * auVar140._8_4_;
  fVar252 = fVar252 + fVar252 * auVar140._12_4_;
  auVar140 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar20 + 0x16)) *
                           *(float *)(prim + lVar20 + 0x1a)));
  auVar205 = vshufps_avx(auVar140,auVar140,0);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar126 * 7 + 6);
  auVar140 = vpmovsxwd_avx(auVar140);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar126 * 0xb + 6);
  auVar204 = vpmovsxwd_avx(auVar204);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar22 = vsubps_avx(auVar204,auVar140);
  fVar182 = auVar205._0_4_;
  fVar198 = auVar205._4_4_;
  fVar196 = auVar205._8_4_;
  fVar318 = auVar205._12_4_;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar126 * 9 + 6);
  auVar204 = vpmovsxwd_avx(auVar205);
  auVar268._0_4_ = auVar22._0_4_ * fVar182 + auVar140._0_4_;
  auVar268._4_4_ = auVar22._4_4_ * fVar198 + auVar140._4_4_;
  auVar268._8_4_ = auVar22._8_4_ * fVar196 + auVar140._8_4_;
  auVar268._12_4_ = auVar22._12_4_ * fVar318 + auVar140._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar126 * 0xd + 6);
  auVar205 = vpmovsxwd_avx(auVar22);
  auVar140 = vcvtdq2ps_avx(auVar204);
  auVar204 = vcvtdq2ps_avx(auVar205);
  auVar204 = vsubps_avx(auVar204,auVar140);
  auVar275._0_4_ = auVar204._0_4_ * fVar182 + auVar140._0_4_;
  auVar275._4_4_ = auVar204._4_4_ * fVar198 + auVar140._4_4_;
  auVar275._8_4_ = auVar204._8_4_ * fVar196 + auVar140._8_4_;
  auVar275._12_4_ = auVar204._12_4_ * fVar318 + auVar140._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar126 * 0x12 + 6);
  auVar140 = vpmovsxwd_avx(auVar23);
  uVar133 = (ulong)(uint)((int)(uVar126 * 5) << 2);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar126 * 2 + uVar133 + 6);
  auVar204 = vpmovsxwd_avx(auVar24);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar204 = vsubps_avx(auVar204,auVar140);
  auVar294._0_4_ = auVar204._0_4_ * fVar182 + auVar140._0_4_;
  auVar294._4_4_ = auVar204._4_4_ * fVar198 + auVar140._4_4_;
  auVar294._8_4_ = auVar204._8_4_ * fVar196 + auVar140._8_4_;
  auVar294._12_4_ = auVar204._12_4_ * fVar318 + auVar140._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar133 + 6);
  auVar140 = vpmovsxwd_avx(auVar25);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar126 * 0x18 + 6);
  auVar204 = vpmovsxwd_avx(auVar26);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar205 = vsubps_avx(auVar204,auVar140);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar126 * 0x1d + 6);
  auVar204 = vpmovsxwd_avx(auVar27);
  auVar307._0_4_ = auVar205._0_4_ * fVar182 + auVar140._0_4_;
  auVar307._4_4_ = auVar205._4_4_ * fVar198 + auVar140._4_4_;
  auVar307._8_4_ = auVar205._8_4_ * fVar196 + auVar140._8_4_;
  auVar307._12_4_ = auVar205._12_4_ * fVar318 + auVar140._12_4_;
  auVar140 = vcvtdq2ps_avx(auVar204);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar126 + (ulong)(byte)PVar13 * 0x20 + 6);
  auVar204 = vpmovsxwd_avx(auVar28);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar204 = vsubps_avx(auVar204,auVar140);
  auVar319._0_4_ = auVar204._0_4_ * fVar182 + auVar140._0_4_;
  auVar319._4_4_ = auVar204._4_4_ * fVar198 + auVar140._4_4_;
  auVar319._8_4_ = auVar204._8_4_ * fVar196 + auVar140._8_4_;
  auVar319._12_4_ = auVar204._12_4_ * fVar318 + auVar140._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar126) + 6);
  auVar140 = vpmovsxwd_avx(auVar29);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar126 * 0x23 + 6);
  auVar204 = vpmovsxwd_avx(auVar30);
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar204 = vsubps_avx(auVar204,auVar140);
  auVar255._0_4_ = auVar140._0_4_ + auVar204._0_4_ * fVar182;
  auVar255._4_4_ = auVar140._4_4_ + auVar204._4_4_ * fVar198;
  auVar255._8_4_ = auVar140._8_4_ + auVar204._8_4_ * fVar196;
  auVar255._12_4_ = auVar140._12_4_ + auVar204._12_4_ * fVar318;
  auVar140 = vsubps_avx(auVar268,auVar165);
  auVar269._0_4_ = fVar200 * auVar140._0_4_;
  auVar269._4_4_ = fVar213 * auVar140._4_4_;
  auVar269._8_4_ = fVar214 * auVar140._8_4_;
  auVar269._12_4_ = fVar216 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar275,auVar165);
  auVar166._0_4_ = fVar200 * auVar140._0_4_;
  auVar166._4_4_ = fVar213 * auVar140._4_4_;
  auVar166._8_4_ = fVar214 * auVar140._8_4_;
  auVar166._12_4_ = fVar216 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar294,auVar137);
  auVar202._0_4_ = fVar225 * auVar140._0_4_;
  auVar202._4_4_ = fVar235 * auVar140._4_4_;
  auVar202._8_4_ = fVar237 * auVar140._8_4_;
  auVar202._12_4_ = fVar239 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar307,auVar137);
  auVar138._0_4_ = fVar225 * auVar140._0_4_;
  auVar138._4_4_ = fVar235 * auVar140._4_4_;
  auVar138._8_4_ = fVar237 * auVar140._8_4_;
  auVar138._12_4_ = fVar239 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar319,auVar183);
  auVar228._0_4_ = fVar242 * auVar140._0_4_;
  auVar228._4_4_ = fVar250 * auVar140._4_4_;
  auVar228._8_4_ = fVar251 * auVar140._8_4_;
  auVar228._12_4_ = fVar252 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar255,auVar183);
  auVar184._0_4_ = fVar242 * auVar140._0_4_;
  auVar184._4_4_ = fVar250 * auVar140._4_4_;
  auVar184._8_4_ = fVar251 * auVar140._8_4_;
  auVar184._12_4_ = fVar252 * auVar140._12_4_;
  auVar140 = vpminsd_avx(auVar269,auVar166);
  auVar204 = vpminsd_avx(auVar202,auVar138);
  auVar140 = vmaxps_avx(auVar140,auVar204);
  auVar204 = vpminsd_avx(auVar228,auVar184);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar276._4_4_ = uVar12;
  auVar276._0_4_ = uVar12;
  auVar276._8_4_ = uVar12;
  auVar276._12_4_ = uVar12;
  auVar204 = vmaxps_avx(auVar204,auVar276);
  auVar140 = vmaxps_avx(auVar140,auVar204);
  local_2f0._0_4_ = auVar140._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar140._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar140._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar140._12_4_ * 0.99999964;
  auVar140 = vpmaxsd_avx(auVar269,auVar166);
  auVar204 = vpmaxsd_avx(auVar202,auVar138);
  auVar140 = vminps_avx(auVar140,auVar204);
  auVar204 = vpmaxsd_avx(auVar228,auVar184);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar185._4_4_ = uVar12;
  auVar185._0_4_ = uVar12;
  auVar185._8_4_ = uVar12;
  auVar185._12_4_ = uVar12;
  auVar204 = vminps_avx(auVar204,auVar185);
  auVar140 = vminps_avx(auVar140,auVar204);
  auVar139._0_4_ = auVar140._0_4_ * 1.0000004;
  auVar139._4_4_ = auVar140._4_4_ * 1.0000004;
  auVar139._8_4_ = auVar140._8_4_ * 1.0000004;
  auVar139._12_4_ = auVar140._12_4_ * 1.0000004;
  auVar140 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar204 = vpcmpgtd_avx(auVar140,_DAT_01f7fcf0);
  auVar140 = vcmpps_avx(local_2f0,auVar139,2);
  auVar140 = vandps_avx(auVar140,auVar204);
  uVar124 = vmovmskps_avx(auVar140);
  if (uVar124 != 0) {
    uVar124 = uVar124 & 0xff;
    local_500 = mm_lookupmask_ps._16_8_;
    uStack_4f8 = mm_lookupmask_ps._24_8_;
    uStack_4f0 = mm_lookupmask_ps._16_8_;
    uStack_4e8 = mm_lookupmask_ps._24_8_;
    local_510 = pre->ray_space + k;
    local_6e0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_6d8 = pre;
    local_508 = prim;
    do {
      lVar20 = 0;
      if (uVar124 != 0) {
        for (; (uVar124 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      uVar14 = *(uint *)(local_508 + 2);
      local_788 = (ulong)uVar14;
      uVar15 = *(uint *)(local_508 + lVar20 * 4 + 6);
      pGVar132 = (context->scene->geometries).items[local_788].ptr;
      local_640._0_8_ = CONCAT44(0,uVar15);
      uVar126 = (ulong)*(uint *)(*(long *)&pGVar132->field_0x58 +
                                CONCAT44(0,uVar15) *
                                pGVar132[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar182 = (pGVar132->time_range).lower;
      fVar182 = pGVar132->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar182) /
                ((pGVar132->time_range).upper - fVar182));
      auVar140 = vroundss_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),9);
      auVar140 = vminss_avx(auVar140,ZEXT416((uint)(pGVar132->fnumTimeSegments + -1.0)));
      auVar140 = vmaxss_avx(ZEXT816(0) << 0x20,auVar140);
      fVar182 = fVar182 - auVar140._0_4_;
      _Var17 = pGVar132[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar140._0_4_ * 0x38;
      lVar20 = *(long *)(_Var17 + 0x10 + lVar129);
      lVar134 = *(long *)(_Var17 + 0x38 + lVar129);
      lVar18 = *(long *)(_Var17 + 0x48 + lVar129);
      auVar140 = vshufps_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),0);
      pfVar1 = (float *)(lVar134 + uVar126 * lVar18);
      fVar198 = auVar140._0_4_;
      fVar196 = auVar140._4_4_;
      fVar318 = auVar140._8_4_;
      fVar200 = auVar140._12_4_;
      pfVar2 = (float *)(lVar134 + (uVar126 + 1) * lVar18);
      lVar131 = (uVar126 + 2) * lVar18;
      pfVar3 = (float *)(lVar134 + lVar131);
      pfVar4 = (float *)(lVar134 + lVar18 * (uVar126 + 3));
      lVar134 = *(long *)(_Var17 + lVar129);
      auVar140 = vshufps_avx(ZEXT416((uint)(1.0 - fVar182)),ZEXT416((uint)(1.0 - fVar182)),0);
      pfVar5 = (float *)(lVar134 + lVar20 * uVar126);
      fVar182 = auVar140._0_4_;
      fVar213 = auVar140._4_4_;
      fVar214 = auVar140._8_4_;
      fVar216 = auVar140._12_4_;
      pfVar6 = (float *)(lVar134 + lVar20 * (uVar126 + 1));
      pfVar7 = (float *)(lVar134 + lVar20 * (uVar126 + 2));
      pfVar8 = (float *)(lVar134 + lVar20 * (uVar126 + 3));
      uVar16 = (uint)pGVar132[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar20 = (long)(int)uVar16 * 0x44;
      local_6f0 = (undefined1  [8])
                  CONCAT44(fVar196 * pfVar1[1] + fVar213 * pfVar5[1],
                           fVar198 * *pfVar1 + fVar182 * *pfVar5);
      uStack_6e8._0_4_ = fVar318 * pfVar1[2] + fVar214 * pfVar5[2];
      uStack_6e8._4_4_ = fVar200 * pfVar1[3] + fVar216 * pfVar5[3];
      local_610 = (undefined1  [8])
                  CONCAT44(fVar213 * pfVar6[1] + fVar196 * pfVar2[1],
                           fVar182 * *pfVar6 + fVar198 * *pfVar2);
      uStack_608._0_4_ = fVar214 * pfVar6[2] + fVar318 * pfVar2[2];
      uStack_608._4_4_ = fVar216 * pfVar6[3] + fVar200 * pfVar2[3];
      local_620 = (undefined1  [8])
                  CONCAT44(fVar213 * pfVar7[1] + fVar196 * pfVar3[1],
                           fVar182 * *pfVar7 + fVar198 * *pfVar3);
      uStack_618._0_4_ = fVar214 * pfVar7[2] + fVar318 * pfVar3[2];
      uStack_618._4_4_ = fVar216 * pfVar7[3] + fVar200 * pfVar3[3];
      local_630._0_4_ = fVar182 * *pfVar8 + fVar198 * *pfVar4;
      local_630._4_4_ = fVar213 * pfVar8[1] + fVar196 * pfVar4[1];
      fStack_628 = fVar214 * pfVar8[2] + fVar318 * pfVar4[2];
      fStack_624 = fVar216 * pfVar8[3] + fVar200 * pfVar4[3];
      auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar22 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar205 = vsubps_avx(_local_6f0,auVar22);
      auVar140 = vshufps_avx(auVar205,auVar205,0);
      auVar204 = vshufps_avx(auVar205,auVar205,0x55);
      auVar205 = vshufps_avx(auVar205,auVar205,0xaa);
      fVar182 = (local_510->vx).field_0.m128[0];
      fVar198 = (local_510->vx).field_0.m128[1];
      fVar196 = (local_510->vx).field_0.m128[2];
      fVar318 = (local_510->vx).field_0.m128[3];
      fVar200 = (local_510->vy).field_0.m128[0];
      fVar213 = (local_510->vy).field_0.m128[1];
      fVar214 = (local_510->vy).field_0.m128[2];
      fVar216 = (local_510->vy).field_0.m128[3];
      fVar225 = (local_510->vz).field_0.m128[0];
      fVar235 = (local_510->vz).field_0.m128[1];
      fVar237 = (local_510->vz).field_0.m128[2];
      fVar239 = (local_510->vz).field_0.m128[3];
      auVar203._0_8_ =
           CONCAT44(auVar140._4_4_ * fVar198 + auVar204._4_4_ * fVar213 + fVar235 * auVar205._4_4_,
                    auVar140._0_4_ * fVar182 + auVar204._0_4_ * fVar200 + fVar225 * auVar205._0_4_);
      auVar203._8_4_ =
           auVar140._8_4_ * fVar196 + auVar204._8_4_ * fVar214 + fVar237 * auVar205._8_4_;
      auVar203._12_4_ =
           auVar140._12_4_ * fVar318 + auVar204._12_4_ * fVar216 + fVar239 * auVar205._12_4_;
      auVar140 = vblendps_avx(auVar203,_local_6f0,8);
      auVar23 = vsubps_avx(_local_610,auVar22);
      auVar204 = vshufps_avx(auVar23,auVar23,0);
      auVar205 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar270._0_4_ = auVar204._0_4_ * fVar182 + auVar205._0_4_ * fVar200 + fVar225 * auVar23._0_4_
      ;
      auVar270._4_4_ = auVar204._4_4_ * fVar198 + auVar205._4_4_ * fVar213 + fVar235 * auVar23._4_4_
      ;
      auVar270._8_4_ = auVar204._8_4_ * fVar196 + auVar205._8_4_ * fVar214 + fVar237 * auVar23._8_4_
      ;
      auVar270._12_4_ =
           auVar204._12_4_ * fVar318 + auVar205._12_4_ * fVar216 + fVar239 * auVar23._12_4_;
      auVar204 = vblendps_avx(auVar270,_local_610,8);
      auVar24 = vsubps_avx(_local_620,auVar22);
      auVar205 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar277._0_4_ = auVar205._0_4_ * fVar182 + auVar23._0_4_ * fVar200 + auVar24._0_4_ * fVar225;
      auVar277._4_4_ = auVar205._4_4_ * fVar198 + auVar23._4_4_ * fVar213 + auVar24._4_4_ * fVar235;
      auVar277._8_4_ = auVar205._8_4_ * fVar196 + auVar23._8_4_ * fVar214 + auVar24._8_4_ * fVar237;
      auVar277._12_4_ =
           auVar205._12_4_ * fVar318 + auVar23._12_4_ * fVar216 + auVar24._12_4_ * fVar239;
      auVar205 = vblendps_avx(auVar277,_local_620,8);
      auVar24 = vsubps_avx(_local_630,auVar22);
      auVar22 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar167._0_4_ = auVar22._0_4_ * fVar182 + auVar23._0_4_ * fVar200 + fVar225 * auVar24._0_4_;
      auVar167._4_4_ = auVar22._4_4_ * fVar198 + auVar23._4_4_ * fVar213 + fVar235 * auVar24._4_4_;
      auVar167._8_4_ = auVar22._8_4_ * fVar196 + auVar23._8_4_ * fVar214 + fVar237 * auVar24._8_4_;
      auVar167._12_4_ =
           auVar22._12_4_ * fVar318 + auVar23._12_4_ * fVar216 + fVar239 * auVar24._12_4_;
      auVar22 = vblendps_avx(auVar167,_local_630,8);
      auVar229._8_4_ = 0x7fffffff;
      auVar229._0_8_ = 0x7fffffff7fffffff;
      auVar229._12_4_ = 0x7fffffff;
      auVar140 = vandps_avx(auVar140,auVar229);
      auVar204 = vandps_avx(auVar204,auVar229);
      auVar23 = vmaxps_avx(auVar140,auVar204);
      auVar140 = vandps_avx(auVar205,auVar229);
      auVar204 = vandps_avx(auVar22,auVar229);
      auVar140 = vmaxps_avx(auVar140,auVar204);
      auVar140 = vmaxps_avx(auVar23,auVar140);
      auVar204 = vmovshdup_avx(auVar140);
      auVar204 = vmaxss_avx(auVar204,auVar140);
      auVar140 = vshufpd_avx(auVar140,auVar140,1);
      auVar140 = vmaxss_avx(auVar140,auVar204);
      fVar251 = *(float *)(catmullrom_basis0 + lVar20 + 0x908);
      fVar252 = *(float *)(catmullrom_basis0 + lVar20 + 0x90c);
      fVar323 = *(float *)(catmullrom_basis0 + lVar20 + 0x910);
      fVar273 = *(float *)(catmullrom_basis0 + lVar20 + 0x914);
      fVar218 = *(float *)(catmullrom_basis0 + lVar20 + 0x918);
      fVar314 = *(float *)(catmullrom_basis0 + lVar20 + 0x91c);
      fVar281 = *(float *)(catmullrom_basis0 + lVar20 + 0x920);
      auVar204 = vshufps_avx(auVar277,auVar277,0);
      register0x00001250 = auVar204;
      _local_680 = auVar204;
      auVar205 = vshufps_avx(auVar277,auVar277,0x55);
      fVar182 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar20 + 0xd8c);
      fVar198 = *(float *)(catmullrom_basis0 + lVar20 + 0xd90);
      fVar196 = *(float *)(catmullrom_basis0 + lVar20 + 0xd94);
      fVar318 = *(float *)(catmullrom_basis0 + lVar20 + 0xd98);
      fVar200 = *(float *)(catmullrom_basis0 + lVar20 + 0xd9c);
      fVar213 = *(float *)(catmullrom_basis0 + lVar20 + 0xda0);
      fVar214 = *(float *)(catmullrom_basis0 + lVar20 + 0xda4);
      auVar118 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar20 + 0xd8c);
      auVar22 = vshufps_avx(auVar167,auVar167,0);
      register0x00001210 = auVar22;
      _local_4c0 = auVar22;
      fVar135 = auVar22._0_4_;
      fVar149 = auVar22._4_4_;
      fVar152 = auVar22._8_4_;
      fVar155 = auVar22._12_4_;
      fVar163 = auVar204._0_4_;
      fVar178 = auVar204._4_4_;
      fVar179 = auVar204._8_4_;
      fVar180 = auVar204._12_4_;
      auVar204 = vshufps_avx(auVar167,auVar167,0x55);
      register0x00001550 = auVar204;
      _local_780 = auVar204;
      fVar331 = auVar204._0_4_;
      fVar337 = auVar204._4_4_;
      fVar338 = auVar204._8_4_;
      fVar340 = auVar204._12_4_;
      fVar181 = auVar205._0_4_;
      fVar194 = auVar205._4_4_;
      fVar195 = auVar205._8_4_;
      fVar197 = auVar205._12_4_;
      auVar204 = vshufps_avx(_local_620,_local_620,0xff);
      register0x000014d0 = auVar204;
      _local_80 = auVar204;
      auVar205 = vshufps_avx(_local_630,_local_630,0xff);
      register0x00001390 = auVar205;
      _local_120 = auVar205;
      fVar253 = auVar205._0_4_;
      fVar260 = auVar205._4_4_;
      fVar261 = auVar205._8_4_;
      fVar262 = auVar205._12_4_;
      fVar317 = auVar204._0_4_;
      fVar321 = auVar204._4_4_;
      fVar322 = auVar204._8_4_;
      auVar205 = vshufps_avx(auVar270,auVar270,0);
      register0x00001410 = auVar205;
      _local_340 = auVar205;
      pauVar10 = (undefined1 (*) [32])(catmullrom_basis0 + lVar20 + 0x484);
      fVar216 = *(float *)*pauVar10;
      fVar225 = *(float *)(catmullrom_basis0 + lVar20 + 0x488);
      fVar235 = *(float *)(catmullrom_basis0 + lVar20 + 0x48c);
      fVar237 = *(float *)(catmullrom_basis0 + lVar20 + 0x490);
      fVar239 = *(float *)(catmullrom_basis0 + lVar20 + 0x494);
      fVar242 = *(float *)(catmullrom_basis0 + lVar20 + 0x498);
      fVar250 = *(float *)(catmullrom_basis0 + lVar20 + 0x49c);
      auVar119 = *(undefined1 (*) [28])*pauVar10;
      fVar283 = *(float *)(catmullrom_basis0 + lVar20 + 0x4a0);
      _auStack_5f0 = SUB3216(*pauVar10,0x10);
      fVar272 = auVar205._0_4_;
      fVar280 = auVar205._4_4_;
      fVar282 = auVar205._8_4_;
      fVar284 = auVar205._12_4_;
      auVar205 = vshufps_avx(auVar270,auVar270,0x55);
      register0x00001310 = auVar205;
      _local_100 = auVar205;
      fVar226 = auVar205._0_4_;
      fVar236 = auVar205._4_4_;
      fVar238 = auVar205._8_4_;
      fVar240 = auVar205._12_4_;
      auVar205 = vshufps_avx(_local_610,_local_610,0xff);
      register0x00001590 = auVar205;
      _local_140 = auVar205;
      fVar339 = auVar205._0_4_;
      fVar341 = auVar205._4_4_;
      fVar342 = auVar205._8_4_;
      fVar344 = auVar205._12_4_;
      auVar110._8_4_ = auVar203._8_4_;
      auVar110._0_8_ = auVar203._0_8_;
      auVar110._12_4_ = auVar203._12_4_;
      auVar205 = vshufps_avx(auVar110,auVar110,0);
      register0x00001210 = auVar205;
      _local_360 = auVar205;
      fVar220 = *(float *)(catmullrom_basis0 + lVar20);
      fVar315 = *(float *)(catmullrom_basis0 + lVar20 + 4);
      fVar286 = *(float *)(catmullrom_basis0 + lVar20 + 8);
      fVar288 = *(float *)(catmullrom_basis0 + lVar20 + 0xc);
      fVar222 = *(float *)(catmullrom_basis0 + lVar20 + 0x10);
      fVar316 = *(float *)(catmullrom_basis0 + lVar20 + 0x14);
      fVar290 = *(float *)(catmullrom_basis0 + lVar20 + 0x18);
      fVar136 = auVar205._0_4_;
      fVar150 = auVar205._4_4_;
      fVar153 = auVar205._8_4_;
      fVar156 = auVar205._12_4_;
      auVar295._0_4_ = fVar136 * fVar220 + fVar272 * fVar216 + fVar163 * fVar251 + fVar135 * fVar182
      ;
      auVar295._4_4_ = fVar150 * fVar315 + fVar280 * fVar225 + fVar178 * fVar252 + fVar149 * fVar198
      ;
      auVar295._8_4_ = fVar153 * fVar286 + fVar282 * fVar235 + fVar179 * fVar323 + fVar152 * fVar196
      ;
      auVar295._12_4_ =
           fVar156 * fVar288 + fVar284 * fVar237 + fVar180 * fVar273 + fVar155 * fVar318;
      auVar295._16_4_ =
           fVar136 * fVar222 + fVar272 * fVar239 + fVar163 * fVar218 + fVar135 * fVar200;
      auVar295._20_4_ =
           fVar150 * fVar316 + fVar280 * fVar242 + fVar178 * fVar314 + fVar149 * fVar213;
      auVar295._24_4_ =
           fVar153 * fVar290 + fVar282 * fVar250 + fVar179 * fVar281 + fVar152 * fVar214;
      auVar295._28_4_ = fVar283 + fVar180 + fVar155 + 0.0;
      auVar205 = vshufps_avx(auVar110,auVar110,0x55);
      fVar347 = auVar205._0_4_;
      fVar351 = auVar205._4_4_;
      fVar352 = auVar205._8_4_;
      fVar353 = auVar205._12_4_;
      auVar325._0_4_ = fVar347 * fVar220 + fVar226 * fVar216 + fVar181 * fVar251 + fVar331 * fVar182
      ;
      auVar325._4_4_ = fVar351 * fVar315 + fVar236 * fVar225 + fVar194 * fVar252 + fVar337 * fVar198
      ;
      auVar325._8_4_ = fVar352 * fVar286 + fVar238 * fVar235 + fVar195 * fVar323 + fVar338 * fVar196
      ;
      auVar325._12_4_ =
           fVar353 * fVar288 + fVar240 * fVar237 + fVar197 * fVar273 + fVar340 * fVar318;
      auVar325._16_4_ =
           fVar347 * fVar222 + fVar226 * fVar239 + fVar181 * fVar218 + fVar331 * fVar200;
      auVar325._20_4_ =
           fVar351 * fVar316 + fVar236 * fVar242 + fVar194 * fVar314 + fVar337 * fVar213;
      auVar325._24_4_ =
           fVar352 * fVar290 + fVar238 * fVar250 + fVar195 * fVar281 + fVar338 * fVar214;
      auVar325._28_4_ = fVar197 + 0.0 + 0.0 + 0.0;
      auVar205 = vpermilps_avx(_local_6f0,0xff);
      register0x00001490 = auVar205;
      _local_160 = auVar205;
      fVar306 = auVar205._0_4_;
      fVar312 = auVar205._4_4_;
      fVar313 = auVar205._8_4_;
      auVar171._0_4_ = fVar306 * fVar220 + fVar339 * fVar216 + fVar317 * fVar251 + fVar253 * fVar182
      ;
      auVar171._4_4_ = fVar312 * fVar315 + fVar341 * fVar225 + fVar321 * fVar252 + fVar260 * fVar198
      ;
      auVar171._8_4_ = fVar313 * fVar286 + fVar342 * fVar235 + fVar322 * fVar323 + fVar261 * fVar196
      ;
      auVar171._12_4_ =
           auVar205._12_4_ * fVar288 +
           fVar344 * fVar237 + auVar204._12_4_ * fVar273 + fVar262 * fVar318;
      auVar171._16_4_ =
           fVar306 * fVar222 + fVar339 * fVar239 + fVar317 * fVar218 + fVar253 * fVar200;
      auVar171._20_4_ =
           fVar312 * fVar316 + fVar341 * fVar242 + fVar321 * fVar314 + fVar260 * fVar213;
      auVar171._24_4_ =
           fVar313 * fVar290 + fVar342 * fVar250 + fVar322 * fVar281 + fVar261 * fVar214;
      auVar171._28_4_ = 0;
      fVar292 = *(float *)(catmullrom_basis1 + lVar20 + 0x908);
      fVar224 = *(float *)(catmullrom_basis1 + lVar20 + 0x90c);
      fVar199 = *(float *)(catmullrom_basis1 + lVar20 + 0x910);
      fVar151 = *(float *)(catmullrom_basis1 + lVar20 + 0x914);
      fVar154 = *(float *)(catmullrom_basis1 + lVar20 + 0x918);
      fVar157 = *(float *)(catmullrom_basis1 + lVar20 + 0x91c);
      fVar158 = *(float *)(catmullrom_basis1 + lVar20 + 0x920);
      fVar159 = *(float *)(catmullrom_basis1 + lVar20 + 0xd8c);
      fVar160 = *(float *)(catmullrom_basis1 + lVar20 + 0xd90);
      fVar161 = *(float *)(catmullrom_basis1 + lVar20 + 0xd94);
      fVar241 = *(float *)(catmullrom_basis1 + lVar20 + 0xd98);
      fVar263 = *(float *)(catmullrom_basis1 + lVar20 + 0xd9c);
      fVar215 = *(float *)(catmullrom_basis1 + lVar20 + 0xda0);
      fVar217 = *(float *)(catmullrom_basis1 + lVar20 + 0xda4);
      fVar219 = *(float *)(catmullrom_basis1 + lVar20 + 0x484);
      fVar221 = *(float *)(catmullrom_basis1 + lVar20 + 0x488);
      fVar223 = *(float *)(catmullrom_basis1 + lVar20 + 0x48c);
      fVar162 = *(float *)(catmullrom_basis1 + lVar20 + 0x490);
      fVar264 = *(float *)(catmullrom_basis1 + lVar20 + 0x494);
      fVar285 = *(float *)(catmullrom_basis1 + lVar20 + 0x498);
      fVar287 = *(float *)(catmullrom_basis1 + lVar20 + 0x49c);
      fVar198 = fVar340 + 0.0;
      fVar289 = *(float *)(catmullrom_basis1 + lVar20);
      fVar291 = *(float *)(catmullrom_basis1 + lVar20 + 4);
      fVar293 = *(float *)(catmullrom_basis1 + lVar20 + 8);
      fVar302 = *(float *)(catmullrom_basis1 + lVar20 + 0xc);
      fVar303 = *(float *)(catmullrom_basis1 + lVar20 + 0x10);
      fVar304 = *(float *)(catmullrom_basis1 + lVar20 + 0x14);
      fVar305 = *(float *)(catmullrom_basis1 + lVar20 + 0x18);
      auVar278._0_4_ = fVar136 * fVar289 + fVar272 * fVar219 + fVar292 * fVar163 + fVar159 * fVar135
      ;
      auVar278._4_4_ = fVar150 * fVar291 + fVar280 * fVar221 + fVar224 * fVar178 + fVar160 * fVar149
      ;
      auVar278._8_4_ = fVar153 * fVar293 + fVar282 * fVar223 + fVar199 * fVar179 + fVar161 * fVar152
      ;
      auVar278._12_4_ =
           fVar156 * fVar302 + fVar284 * fVar162 + fVar151 * fVar180 + fVar241 * fVar155;
      auVar278._16_4_ =
           fVar136 * fVar303 + fVar272 * fVar264 + fVar154 * fVar163 + fVar263 * fVar135;
      auVar278._20_4_ =
           fVar150 * fVar304 + fVar280 * fVar285 + fVar157 * fVar178 + fVar215 * fVar149;
      auVar278._24_4_ =
           fVar153 * fVar305 + fVar282 * fVar287 + fVar158 * fVar179 + fVar217 * fVar152;
      auVar278._28_4_ = fVar344 + fVar198;
      auVar206._0_4_ = fVar347 * fVar289 + fVar226 * fVar219 + fVar292 * fVar181 + fVar331 * fVar159
      ;
      auVar206._4_4_ = fVar351 * fVar291 + fVar236 * fVar221 + fVar224 * fVar194 + fVar337 * fVar160
      ;
      auVar206._8_4_ = fVar352 * fVar293 + fVar238 * fVar223 + fVar199 * fVar195 + fVar338 * fVar161
      ;
      auVar206._12_4_ =
           fVar353 * fVar302 + fVar240 * fVar162 + fVar151 * fVar197 + fVar340 * fVar241;
      auVar206._16_4_ =
           fVar347 * fVar303 + fVar226 * fVar264 + fVar154 * fVar181 + fVar331 * fVar263;
      auVar206._20_4_ =
           fVar351 * fVar304 + fVar236 * fVar285 + fVar157 * fVar194 + fVar337 * fVar215;
      auVar206._24_4_ =
           fVar352 * fVar305 + fVar238 * fVar287 + fVar158 * fVar195 + fVar338 * fVar217;
      auVar206._28_4_ = fVar198 + fVar340 + fVar283 + 0.0;
      auVar308._0_4_ = fVar339 * fVar219 + fVar317 * fVar292 + fVar253 * fVar159 + fVar306 * fVar289
      ;
      auVar308._4_4_ = fVar341 * fVar221 + fVar321 * fVar224 + fVar260 * fVar160 + fVar312 * fVar291
      ;
      auVar308._8_4_ = fVar342 * fVar223 + fVar322 * fVar199 + fVar261 * fVar161 + fVar313 * fVar293
      ;
      auVar308._12_4_ =
           fVar344 * fVar162 + auVar204._12_4_ * fVar151 + fVar262 * fVar241 +
           auVar205._12_4_ * fVar302;
      auVar308._16_4_ =
           fVar339 * fVar264 + fVar317 * fVar154 + fVar253 * fVar263 + fVar306 * fVar303;
      auVar308._20_4_ =
           fVar341 * fVar285 + fVar321 * fVar157 + fVar260 * fVar215 + fVar312 * fVar304;
      auVar308._24_4_ =
           fVar342 * fVar287 + fVar322 * fVar158 + fVar261 * fVar217 + fVar313 * fVar305;
      auVar308._28_4_ = fVar340 + fVar262 + fVar283 + fVar198;
      auVar31 = vsubps_avx(auVar278,auVar295);
      auVar247 = vsubps_avx(auVar206,auVar325);
      fVar182 = auVar31._0_4_;
      fVar196 = auVar31._4_4_;
      auVar297._4_4_ = auVar325._4_4_ * fVar196;
      auVar297._0_4_ = auVar325._0_4_ * fVar182;
      fVar200 = auVar31._8_4_;
      auVar297._8_4_ = auVar325._8_4_ * fVar200;
      fVar214 = auVar31._12_4_;
      auVar297._12_4_ = auVar325._12_4_ * fVar214;
      fVar225 = auVar31._16_4_;
      auVar297._16_4_ = auVar325._16_4_ * fVar225;
      fVar237 = auVar31._20_4_;
      auVar297._20_4_ = auVar325._20_4_ * fVar237;
      fVar242 = auVar31._24_4_;
      auVar297._24_4_ = auVar325._24_4_ * fVar242;
      auVar297._28_4_ = fVar198;
      fVar198 = auVar247._0_4_;
      fVar318 = auVar247._4_4_;
      auVar176._4_4_ = auVar295._4_4_ * fVar318;
      auVar176._0_4_ = auVar295._0_4_ * fVar198;
      fVar213 = auVar247._8_4_;
      auVar176._8_4_ = auVar295._8_4_ * fVar213;
      fVar216 = auVar247._12_4_;
      auVar176._12_4_ = auVar295._12_4_ * fVar216;
      fVar235 = auVar247._16_4_;
      auVar176._16_4_ = auVar295._16_4_ * fVar235;
      fVar239 = auVar247._20_4_;
      auVar176._20_4_ = auVar295._20_4_ * fVar239;
      fVar250 = auVar247._24_4_;
      auVar176._24_4_ = auVar295._24_4_ * fVar250;
      auVar176._28_4_ = auVar206._28_4_;
      auVar176 = vsubps_avx(auVar297,auVar176);
      auVar297 = vmaxps_avx(auVar171,auVar308);
      auVar39._4_4_ = auVar297._4_4_ * auVar297._4_4_ * (fVar196 * fVar196 + fVar318 * fVar318);
      auVar39._0_4_ = auVar297._0_4_ * auVar297._0_4_ * (fVar182 * fVar182 + fVar198 * fVar198);
      auVar39._8_4_ = auVar297._8_4_ * auVar297._8_4_ * (fVar200 * fVar200 + fVar213 * fVar213);
      auVar39._12_4_ = auVar297._12_4_ * auVar297._12_4_ * (fVar214 * fVar214 + fVar216 * fVar216);
      auVar39._16_4_ = auVar297._16_4_ * auVar297._16_4_ * (fVar225 * fVar225 + fVar235 * fVar235);
      auVar39._20_4_ = auVar297._20_4_ * auVar297._20_4_ * (fVar237 * fVar237 + fVar239 * fVar239);
      auVar39._24_4_ = auVar297._24_4_ * auVar297._24_4_ * (fVar242 * fVar242 + fVar250 * fVar250);
      auVar39._28_4_ = fVar240 + auVar206._28_4_;
      auVar21._4_4_ = auVar176._4_4_ * auVar176._4_4_;
      auVar21._0_4_ = auVar176._0_4_ * auVar176._0_4_;
      auVar21._8_4_ = auVar176._8_4_ * auVar176._8_4_;
      auVar21._12_4_ = auVar176._12_4_ * auVar176._12_4_;
      auVar21._16_4_ = auVar176._16_4_ * auVar176._16_4_;
      auVar21._20_4_ = auVar176._20_4_ * auVar176._20_4_;
      auVar21._24_4_ = auVar176._24_4_ * auVar176._24_4_;
      auVar21._28_4_ = auVar176._28_4_;
      auVar297 = vcmpps_avx(auVar21,auVar39,2);
      auVar193 = ZEXT3264(auVar297);
      local_4a0 = (float)(int)uVar16;
      fStack_49c = 0.0;
      fStack_498 = 0.0;
      fStack_494 = 0.0;
      auVar204 = vshufps_avx(ZEXT416((uint)local_4a0),ZEXT416((uint)local_4a0),0);
      auVar207._16_16_ = auVar204;
      auVar207._0_16_ = auVar204;
      auVar176 = vcmpps_avx(_DAT_01faff40,auVar207,1);
      auVar212 = ZEXT3264(auVar176);
      auVar111._8_4_ = auVar203._8_4_;
      auVar111._0_8_ = auVar203._0_8_;
      auVar111._12_4_ = auVar203._12_4_;
      auVar204 = vpermilps_avx(auVar111,0xaa);
      register0x00001490 = auVar204;
      _local_380 = auVar204;
      auVar205 = vpermilps_avx(auVar270,0xaa);
      register0x00001550 = auVar205;
      _local_320 = auVar205;
      auVar22 = vpermilps_avx(auVar277,0xaa);
      register0x00001590 = auVar22;
      _local_a0 = auVar22;
      auVar23 = vpermilps_avx(auVar167,0xaa);
      register0x00001510 = auVar23;
      _local_720 = auVar23;
      auVar39 = auVar176 & auVar297;
      uVar128 = *(uint *)(ray + k * 4 + 0x30);
      auVar234 = ZEXT464(uVar128);
      auVar140 = ZEXT416((uint)(auVar140._0_4_ * 4.7683716e-07));
      local_760._0_16_ = auVar140;
      fVar182 = fVar331;
      fVar198 = fVar337;
      fVar196 = fVar338;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar39 >> 0x7f,0) == '\0') &&
            (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar39 >> 0xbf,0) == '\0') &&
          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar39[0x1f])
      {
        bVar130 = false;
        auVar297 = local_560;
        auVar176 = local_540;
      }
      else {
        auVar297 = vandps_avx(auVar297,auVar176);
        fVar253 = auVar204._0_4_;
        fVar260 = auVar204._4_4_;
        fVar261 = auVar204._8_4_;
        fVar262 = auVar204._12_4_;
        fVar321 = auVar205._0_4_;
        fVar322 = auVar205._4_4_;
        fVar339 = auVar205._8_4_;
        fVar341 = auVar205._12_4_;
        fVar342 = auVar22._0_4_;
        fVar344 = auVar22._4_4_;
        fVar345 = auVar22._8_4_;
        fVar346 = auVar22._12_4_;
        fVar306 = auVar23._0_4_;
        fVar312 = auVar23._4_4_;
        fVar313 = auVar23._8_4_;
        fVar317 = auVar23._12_4_;
        fVar318 = auVar176._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar20 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar20 + 0x4a0);
        local_3a0._0_4_ =
             fVar253 * fVar289 + fVar321 * fVar219 + fVar342 * fVar292 + fVar306 * fVar159;
        local_3a0._4_4_ =
             fVar260 * fVar291 + fVar322 * fVar221 + fVar344 * fVar224 + fVar312 * fVar160;
        fStack_398 = fVar261 * fVar293 + fVar339 * fVar223 + fVar345 * fVar199 + fVar313 * fVar161;
        fStack_394 = fVar262 * fVar302 + fVar341 * fVar162 + fVar346 * fVar151 + fVar317 * fVar241;
        fStack_390 = fVar253 * fVar303 + fVar321 * fVar264 + fVar342 * fVar154 + fVar306 * fVar263;
        fStack_38c = fVar260 * fVar304 + fVar322 * fVar285 + fVar344 * fVar157 + fVar312 * fVar215;
        fStack_388 = fVar261 * fVar305 + fVar339 * fVar287 + fVar345 * fVar158 + fVar313 * fVar217;
        fStack_384 = auVar297._28_4_ + fVar318;
        local_600._0_4_ = auVar119._0_4_;
        local_600._4_4_ = auVar119._4_4_;
        fStack_5f8 = auVar119._8_4_;
        fStack_5f4 = auVar119._12_4_;
        auStack_5f0._0_4_ = auVar119._16_4_;
        auStack_5f0._4_4_ = auVar119._20_4_;
        fStack_5e8 = auVar119._24_4_;
        local_5c0._0_4_ = auVar118._0_4_;
        local_5c0._4_4_ = auVar118._4_4_;
        fStack_5b8 = auVar118._8_4_;
        fStack_5b4 = auVar118._12_4_;
        fStack_5b0 = auVar118._16_4_;
        fStack_5ac = auVar118._20_4_;
        fStack_5a8 = auVar118._24_4_;
        local_660 = fVar253 * fVar220 +
                    fVar321 * (float)local_600._0_4_ +
                    fVar342 * fVar251 + fVar306 * (float)local_5c0._0_4_;
        fStack_65c = fVar260 * fVar315 +
                     fVar322 * (float)local_600._4_4_ +
                     fVar344 * fVar252 + fVar312 * (float)local_5c0._4_4_;
        fStack_658 = fVar261 * fVar286 +
                     fVar339 * fStack_5f8 + fVar345 * fVar323 + fVar313 * fStack_5b8;
        fStack_654 = fVar262 * fVar288 +
                     fVar341 * fStack_5f4 + fVar346 * fVar273 + fVar317 * fStack_5b4;
        fStack_650 = fVar253 * fVar222 +
                     fVar321 * (float)auStack_5f0._0_4_ + fVar342 * fVar218 + fVar306 * fStack_5b0;
        fStack_64c = fVar260 * fVar316 +
                     fVar322 * (float)auStack_5f0._4_4_ + fVar344 * fVar314 + fVar312 * fStack_5ac;
        fStack_648 = fVar261 * fVar290 +
                     fVar339 * fStack_5e8 + fVar345 * fVar281 + fVar313 * fStack_5a8;
        fStack_644 = fStack_384 + fVar318 + auVar297._28_4_ + auVar176._28_4_;
        fVar318 = *(float *)(catmullrom_basis0 + lVar20 + 0x1210);
        fVar200 = *(float *)(catmullrom_basis0 + lVar20 + 0x1214);
        fVar213 = *(float *)(catmullrom_basis0 + lVar20 + 0x1218);
        fVar214 = *(float *)(catmullrom_basis0 + lVar20 + 0x121c);
        fVar216 = *(float *)(catmullrom_basis0 + lVar20 + 0x1220);
        fVar225 = *(float *)(catmullrom_basis0 + lVar20 + 0x1224);
        fVar235 = *(float *)(catmullrom_basis0 + lVar20 + 0x1228);
        fVar237 = *(float *)(catmullrom_basis0 + lVar20 + 0x1694);
        fVar239 = *(float *)(catmullrom_basis0 + lVar20 + 0x1698);
        fVar242 = *(float *)(catmullrom_basis0 + lVar20 + 0x169c);
        fVar250 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a0);
        fVar251 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a4);
        fVar252 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a8);
        fVar323 = *(float *)(catmullrom_basis0 + lVar20 + 0x16ac);
        fVar273 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b18);
        fVar218 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b1c);
        fVar314 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b20);
        fVar281 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b24);
        fVar283 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b28);
        fVar220 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b2c);
        fVar315 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b30);
        fVar286 = *(float *)(catmullrom_basis0 + lVar20 + 0x1f9c);
        fVar288 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa0);
        fVar222 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa4);
        fVar316 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa8);
        fVar290 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fac);
        fVar292 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fb0);
        fVar224 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fb4);
        fVar151 = *(float *)(catmullrom_basis1 + lVar20 + 0x4a0) + 0.0;
        fVar199 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar20 + 0x1fb8);
        fVar154 = *(float *)(catmullrom_basis0 + lVar20 + 0x16b0) + fVar199;
        local_4e0 = fVar136 * fVar318 + fVar272 * fVar237 + fVar163 * fVar273 + fVar135 * fVar286;
        fStack_4dc = fVar150 * fVar200 + fVar280 * fVar239 + fVar178 * fVar218 + fVar149 * fVar288;
        fStack_4d8 = fVar153 * fVar213 + fVar282 * fVar242 + fVar179 * fVar314 + fVar152 * fVar222;
        fStack_4d4 = fVar156 * fVar214 + fVar284 * fVar250 + fVar180 * fVar281 + fVar155 * fVar316;
        fStack_4d0 = fVar136 * fVar216 + fVar272 * fVar251 + fVar163 * fVar283 + fVar135 * fVar290;
        fStack_4cc = fVar150 * fVar225 + fVar280 * fVar252 + fVar178 * fVar220 + fVar149 * fVar292;
        fStack_4c8 = fVar153 * fVar235 + fVar282 * fVar323 + fVar179 * fVar315 + fVar152 * fVar224;
        fStack_4c4 = *(float *)(catmullrom_basis0 + lVar20 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar20 + 0x1fb8) + fVar151;
        auVar172._0_4_ =
             fVar181 * fVar273 + fVar331 * fVar286 + fVar226 * fVar237 + fVar318 * fVar347;
        auVar172._4_4_ =
             fVar194 * fVar218 + fVar337 * fVar288 + fVar236 * fVar239 + fVar200 * fVar351;
        auVar172._8_4_ =
             fVar195 * fVar314 + fVar338 * fVar222 + fVar238 * fVar242 + fVar213 * fVar352;
        auVar172._12_4_ =
             fVar197 * fVar281 + fVar340 * fVar316 + fVar240 * fVar250 + fVar214 * fVar353;
        auVar172._16_4_ =
             fVar181 * fVar283 + fVar331 * fVar290 + fVar226 * fVar251 + fVar216 * fVar347;
        auVar172._20_4_ =
             fVar194 * fVar220 + fVar337 * fVar292 + fVar236 * fVar252 + fVar225 * fVar351;
        auVar172._24_4_ =
             fVar195 * fVar315 + fVar338 * fVar224 + fVar238 * fVar323 + fVar235 * fVar352;
        auVar172._28_4_ = *(float *)(catmullrom_basis1 + lVar20 + 0xda8) + 0.0 + fVar151 + fVar199;
        auVar348._0_4_ =
             fVar321 * fVar237 + fVar342 * fVar273 + fVar306 * fVar286 + fVar253 * fVar318;
        auVar348._4_4_ =
             fVar322 * fVar239 + fVar344 * fVar218 + fVar312 * fVar288 + fVar260 * fVar200;
        auVar348._8_4_ =
             fVar339 * fVar242 + fVar345 * fVar314 + fVar313 * fVar222 + fVar261 * fVar213;
        auVar348._12_4_ =
             fVar341 * fVar250 + fVar346 * fVar281 + fVar317 * fVar316 + fVar262 * fVar214;
        auVar348._16_4_ =
             fVar321 * fVar251 + fVar342 * fVar283 + fVar306 * fVar290 + fVar253 * fVar216;
        auVar348._20_4_ =
             fVar322 * fVar252 + fVar344 * fVar220 + fVar312 * fVar292 + fVar260 * fVar225;
        auVar348._24_4_ =
             fVar339 * fVar323 + fVar345 * fVar315 + fVar313 * fVar224 + fVar261 * fVar235;
        auVar348._28_4_ = fVar154 + *(float *)(catmullrom_basis0 + lVar20 + 0x122c);
        fVar318 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b18);
        fVar200 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b1c);
        fVar213 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b20);
        fVar214 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b24);
        fVar216 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b28);
        fVar225 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b2c);
        fVar235 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b30);
        fVar237 = *(float *)(catmullrom_basis1 + lVar20 + 0x1f9c);
        fVar239 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa0);
        fVar242 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa4);
        fVar250 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa8);
        fVar251 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fac);
        fVar252 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fb0);
        fVar323 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fb4);
        fVar273 = *(float *)(catmullrom_basis1 + lVar20 + 0x1694);
        fVar218 = *(float *)(catmullrom_basis1 + lVar20 + 0x1698);
        fVar314 = *(float *)(catmullrom_basis1 + lVar20 + 0x169c);
        fVar281 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a0);
        fVar283 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a4);
        fVar220 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a8);
        fVar315 = *(float *)(catmullrom_basis1 + lVar20 + 0x16ac);
        fVar286 = *(float *)(catmullrom_basis1 + lVar20 + 0x1210);
        fVar288 = *(float *)(catmullrom_basis1 + lVar20 + 0x1214);
        fVar222 = *(float *)(catmullrom_basis1 + lVar20 + 0x1218);
        fVar316 = *(float *)(catmullrom_basis1 + lVar20 + 0x121c);
        fVar290 = *(float *)(catmullrom_basis1 + lVar20 + 0x1220);
        fVar292 = *(float *)(catmullrom_basis1 + lVar20 + 0x1224);
        fVar224 = *(float *)(catmullrom_basis1 + lVar20 + 0x1228);
        auVar256._0_4_ =
             fVar136 * fVar286 + fVar272 * fVar273 + fVar163 * fVar318 + fVar135 * fVar237;
        auVar256._4_4_ =
             fVar150 * fVar288 + fVar280 * fVar218 + fVar178 * fVar200 + fVar149 * fVar239;
        auVar256._8_4_ =
             fVar153 * fVar222 + fVar282 * fVar314 + fVar179 * fVar213 + fVar152 * fVar242;
        auVar256._12_4_ =
             fVar156 * fVar316 + fVar284 * fVar281 + fVar180 * fVar214 + fVar155 * fVar250;
        auVar256._16_4_ =
             fVar136 * fVar290 + fVar272 * fVar283 + fVar163 * fVar216 + fVar135 * fVar251;
        auVar256._20_4_ =
             fVar150 * fVar292 + fVar280 * fVar220 + fVar178 * fVar225 + fVar149 * fVar252;
        auVar256._24_4_ =
             fVar153 * fVar224 + fVar282 * fVar315 + fVar179 * fVar235 + fVar152 * fVar323;
        auVar256._28_4_ = fVar262 + fVar262 + fVar154 + fVar155;
        auVar296._0_4_ =
             fVar286 * fVar347 + fVar226 * fVar273 + fVar181 * fVar318 + fVar331 * fVar237;
        auVar296._4_4_ =
             fVar288 * fVar351 + fVar236 * fVar218 + fVar194 * fVar200 + fVar337 * fVar239;
        auVar296._8_4_ =
             fVar222 * fVar352 + fVar238 * fVar314 + fVar195 * fVar213 + fVar338 * fVar242;
        auVar296._12_4_ =
             fVar316 * fVar353 + fVar240 * fVar281 + fVar197 * fVar214 + fVar340 * fVar250;
        auVar296._16_4_ =
             fVar290 * fVar347 + fVar226 * fVar283 + fVar181 * fVar216 + fVar331 * fVar251;
        auVar296._20_4_ =
             fVar292 * fVar351 + fVar236 * fVar220 + fVar194 * fVar225 + fVar337 * fVar252;
        auVar296._24_4_ =
             fVar224 * fVar352 + fVar238 * fVar315 + fVar195 * fVar235 + fVar338 * fVar323;
        auVar296._28_4_ = fVar262 + fVar262 + fVar262 + fVar154;
        auVar191._0_4_ =
             fVar253 * fVar286 + fVar321 * fVar273 + fVar342 * fVar318 + fVar237 * fVar306;
        auVar191._4_4_ =
             fVar260 * fVar288 + fVar322 * fVar218 + fVar344 * fVar200 + fVar239 * fVar312;
        auVar191._8_4_ =
             fVar261 * fVar222 + fVar339 * fVar314 + fVar345 * fVar213 + fVar242 * fVar313;
        auVar191._12_4_ =
             fVar262 * fVar316 + fVar341 * fVar281 + fVar346 * fVar214 + fVar250 * fVar317;
        auVar191._16_4_ =
             fVar253 * fVar290 + fVar321 * fVar283 + fVar342 * fVar216 + fVar251 * fVar306;
        auVar191._20_4_ =
             fVar260 * fVar292 + fVar322 * fVar220 + fVar344 * fVar225 + fVar252 * fVar312;
        auVar191._24_4_ =
             fVar261 * fVar224 + fVar339 * fVar315 + fVar345 * fVar235 + fVar323 * fVar313;
        auVar191._28_4_ =
             *(float *)(catmullrom_basis1 + lVar20 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x1fb8);
        auVar230._8_4_ = 0x7fffffff;
        auVar230._0_8_ = 0x7fffffff7fffffff;
        auVar230._12_4_ = 0x7fffffff;
        auVar230._16_4_ = 0x7fffffff;
        auVar230._20_4_ = 0x7fffffff;
        auVar230._24_4_ = 0x7fffffff;
        auVar230._28_4_ = 0x7fffffff;
        auVar115._4_4_ = fStack_4dc;
        auVar115._0_4_ = local_4e0;
        auVar115._8_4_ = fStack_4d8;
        auVar115._12_4_ = fStack_4d4;
        auVar115._16_4_ = fStack_4d0;
        auVar115._20_4_ = fStack_4cc;
        auVar115._24_4_ = fStack_4c8;
        auVar115._28_4_ = fStack_4c4;
        auVar176 = vandps_avx(auVar115,auVar230);
        auVar39 = vandps_avx(auVar172,auVar230);
        auVar39 = vmaxps_avx(auVar176,auVar39);
        auVar176 = vandps_avx(auVar348,auVar230);
        auVar176 = vmaxps_avx(auVar39,auVar176);
        auVar140 = vpermilps_avx(auVar140,0);
        auVar244._16_16_ = auVar140;
        auVar244._0_16_ = auVar140;
        auVar176 = vcmpps_avx(auVar176,auVar244,1);
        auVar21 = vblendvps_avx(auVar115,auVar31,auVar176);
        auVar207 = vblendvps_avx(auVar172,auVar247,auVar176);
        auVar176 = vandps_avx(auVar256,auVar230);
        auVar39 = vandps_avx(auVar296,auVar230);
        auVar36 = vmaxps_avx(auVar176,auVar39);
        auVar176 = vandps_avx(auVar191,auVar230);
        auVar176 = vmaxps_avx(auVar36,auVar176);
        auVar36 = vcmpps_avx(auVar176,auVar244,1);
        auVar176 = vblendvps_avx(auVar256,auVar31,auVar36);
        auVar31 = vblendvps_avx(auVar296,auVar247,auVar36);
        fVar151 = auVar21._0_4_;
        fVar154 = auVar21._4_4_;
        fVar157 = auVar21._8_4_;
        fVar158 = auVar21._12_4_;
        fVar159 = auVar21._16_4_;
        fVar160 = auVar21._20_4_;
        fVar161 = auVar21._24_4_;
        fVar162 = -auVar21._28_4_;
        fVar241 = auVar176._0_4_;
        fVar263 = auVar176._4_4_;
        fVar215 = auVar176._8_4_;
        fVar217 = auVar176._12_4_;
        fVar219 = auVar176._16_4_;
        fVar221 = auVar176._20_4_;
        fVar223 = auVar176._24_4_;
        fVar318 = auVar207._0_4_;
        fVar216 = auVar207._4_4_;
        fVar239 = auVar207._8_4_;
        fVar252 = auVar207._12_4_;
        fVar314 = auVar207._16_4_;
        fVar315 = auVar207._20_4_;
        fVar316 = auVar207._24_4_;
        auVar143._0_4_ = fVar318 * fVar318 + fVar151 * fVar151;
        auVar143._4_4_ = fVar216 * fVar216 + fVar154 * fVar154;
        auVar143._8_4_ = fVar239 * fVar239 + fVar157 * fVar157;
        auVar143._12_4_ = fVar252 * fVar252 + fVar158 * fVar158;
        auVar143._16_4_ = fVar314 * fVar314 + fVar159 * fVar159;
        auVar143._20_4_ = fVar315 * fVar315 + fVar160 * fVar160;
        auVar143._24_4_ = fVar316 * fVar316 + fVar161 * fVar161;
        auVar143._28_4_ = auVar296._28_4_ + auVar21._28_4_;
        auVar247 = vrsqrtps_avx(auVar143);
        fVar200 = auVar247._0_4_;
        fVar213 = auVar247._4_4_;
        auVar36._4_4_ = fVar213 * 1.5;
        auVar36._0_4_ = fVar200 * 1.5;
        fVar214 = auVar247._8_4_;
        auVar36._8_4_ = fVar214 * 1.5;
        fVar225 = auVar247._12_4_;
        auVar36._12_4_ = fVar225 * 1.5;
        fVar235 = auVar247._16_4_;
        auVar36._16_4_ = fVar235 * 1.5;
        fVar237 = auVar247._20_4_;
        auVar36._20_4_ = fVar237 * 1.5;
        fVar242 = auVar247._24_4_;
        fVar199 = auVar39._28_4_;
        auVar36._24_4_ = fVar242 * 1.5;
        auVar36._28_4_ = fVar199;
        auVar247._4_4_ = fVar213 * fVar213 * fVar213 * auVar143._4_4_ * 0.5;
        auVar247._0_4_ = fVar200 * fVar200 * fVar200 * auVar143._0_4_ * 0.5;
        auVar247._8_4_ = fVar214 * fVar214 * fVar214 * auVar143._8_4_ * 0.5;
        auVar247._12_4_ = fVar225 * fVar225 * fVar225 * auVar143._12_4_ * 0.5;
        auVar247._16_4_ = fVar235 * fVar235 * fVar235 * auVar143._16_4_ * 0.5;
        auVar247._20_4_ = fVar237 * fVar237 * fVar237 * auVar143._20_4_ * 0.5;
        auVar247._24_4_ = fVar242 * fVar242 * fVar242 * auVar143._24_4_ * 0.5;
        auVar247._28_4_ = auVar143._28_4_;
        auVar247 = vsubps_avx(auVar36,auVar247);
        fVar200 = auVar247._0_4_;
        fVar225 = auVar247._4_4_;
        fVar242 = auVar247._8_4_;
        fVar323 = auVar247._12_4_;
        fVar281 = auVar247._16_4_;
        fVar286 = auVar247._20_4_;
        fVar290 = auVar247._24_4_;
        fVar213 = auVar31._0_4_;
        fVar235 = auVar31._4_4_;
        fVar250 = auVar31._8_4_;
        fVar273 = auVar31._12_4_;
        fVar283 = auVar31._16_4_;
        fVar288 = auVar31._20_4_;
        fVar292 = auVar31._24_4_;
        auVar144._0_4_ = fVar213 * fVar213 + fVar241 * fVar241;
        auVar144._4_4_ = fVar235 * fVar235 + fVar263 * fVar263;
        auVar144._8_4_ = fVar250 * fVar250 + fVar215 * fVar215;
        auVar144._12_4_ = fVar273 * fVar273 + fVar217 * fVar217;
        auVar144._16_4_ = fVar283 * fVar283 + fVar219 * fVar219;
        auVar144._20_4_ = fVar288 * fVar288 + fVar221 * fVar221;
        auVar144._24_4_ = fVar292 * fVar292 + fVar223 * fVar223;
        auVar144._28_4_ = auVar176._28_4_ + auVar247._28_4_;
        auVar176 = vrsqrtps_avx(auVar144);
        fVar214 = auVar176._0_4_;
        fVar237 = auVar176._4_4_;
        auVar37._4_4_ = fVar237 * 1.5;
        auVar37._0_4_ = fVar214 * 1.5;
        fVar251 = auVar176._8_4_;
        auVar37._8_4_ = fVar251 * 1.5;
        fVar218 = auVar176._12_4_;
        auVar37._12_4_ = fVar218 * 1.5;
        fVar220 = auVar176._16_4_;
        auVar37._16_4_ = fVar220 * 1.5;
        fVar222 = auVar176._20_4_;
        auVar37._20_4_ = fVar222 * 1.5;
        fVar224 = auVar176._24_4_;
        auVar37._24_4_ = fVar224 * 1.5;
        auVar37._28_4_ = fVar199;
        auVar38._4_4_ = fVar237 * fVar237 * fVar237 * auVar144._4_4_ * 0.5;
        auVar38._0_4_ = fVar214 * fVar214 * fVar214 * auVar144._0_4_ * 0.5;
        auVar38._8_4_ = fVar251 * fVar251 * fVar251 * auVar144._8_4_ * 0.5;
        auVar38._12_4_ = fVar218 * fVar218 * fVar218 * auVar144._12_4_ * 0.5;
        auVar38._16_4_ = fVar220 * fVar220 * fVar220 * auVar144._16_4_ * 0.5;
        auVar38._20_4_ = fVar222 * fVar222 * fVar222 * auVar144._20_4_ * 0.5;
        auVar38._24_4_ = fVar224 * fVar224 * fVar224 * auVar144._24_4_ * 0.5;
        auVar38._28_4_ = auVar144._28_4_;
        auVar176 = vsubps_avx(auVar37,auVar38);
        fVar214 = auVar176._0_4_;
        fVar237 = auVar176._4_4_;
        fVar251 = auVar176._8_4_;
        fVar218 = auVar176._12_4_;
        fVar220 = auVar176._16_4_;
        fVar222 = auVar176._20_4_;
        fVar224 = auVar176._24_4_;
        fVar318 = auVar171._0_4_ * fVar318 * fVar200;
        fVar216 = auVar171._4_4_ * fVar216 * fVar225;
        auVar32._4_4_ = fVar216;
        auVar32._0_4_ = fVar318;
        fVar239 = auVar171._8_4_ * fVar239 * fVar242;
        auVar32._8_4_ = fVar239;
        fVar252 = auVar171._12_4_ * fVar252 * fVar323;
        auVar32._12_4_ = fVar252;
        fVar314 = auVar171._16_4_ * fVar314 * fVar281;
        auVar32._16_4_ = fVar314;
        fVar315 = auVar171._20_4_ * fVar315 * fVar286;
        auVar32._20_4_ = fVar315;
        fVar316 = auVar171._24_4_ * fVar316 * fVar290;
        auVar32._24_4_ = fVar316;
        auVar32._28_4_ = fVar199;
        local_5e0._4_4_ = fVar216 + auVar295._4_4_;
        local_5e0._0_4_ = fVar318 + auVar295._0_4_;
        fStack_5d8 = fVar239 + auVar295._8_4_;
        fStack_5d4 = fVar252 + auVar295._12_4_;
        fStack_5d0 = fVar314 + auVar295._16_4_;
        fStack_5cc = fVar315 + auVar295._20_4_;
        fStack_5c8 = fVar316 + auVar295._24_4_;
        fStack_5c4 = fVar199 + auVar295._28_4_;
        fVar318 = auVar171._0_4_ * fVar200 * -fVar151;
        fVar216 = auVar171._4_4_ * fVar225 * -fVar154;
        auVar33._4_4_ = fVar216;
        auVar33._0_4_ = fVar318;
        fVar239 = auVar171._8_4_ * fVar242 * -fVar157;
        auVar33._8_4_ = fVar239;
        fVar252 = auVar171._12_4_ * fVar323 * -fVar158;
        auVar33._12_4_ = fVar252;
        fVar314 = auVar171._16_4_ * fVar281 * -fVar159;
        auVar33._16_4_ = fVar314;
        fVar315 = auVar171._20_4_ * fVar286 * -fVar160;
        auVar33._20_4_ = fVar315;
        fVar316 = auVar171._24_4_ * fVar290 * -fVar161;
        auVar33._24_4_ = fVar316;
        auVar33._28_4_ = fVar162;
        local_600._4_4_ = auVar325._4_4_ + fVar216;
        local_600._0_4_ = auVar325._0_4_ + fVar318;
        fStack_5f8 = auVar325._8_4_ + fVar239;
        fStack_5f4 = auVar325._12_4_ + fVar252;
        auStack_5f0._0_4_ = auVar325._16_4_ + fVar314;
        auStack_5f0._4_4_ = auVar325._20_4_ + fVar315;
        fStack_5e8 = auVar325._24_4_ + fVar316;
        fStack_5e4 = auVar325._28_4_ + fVar162;
        fVar318 = fVar200 * 0.0 * auVar171._0_4_;
        fVar200 = fVar225 * 0.0 * auVar171._4_4_;
        auVar34._4_4_ = fVar200;
        auVar34._0_4_ = fVar318;
        fVar216 = fVar242 * 0.0 * auVar171._8_4_;
        auVar34._8_4_ = fVar216;
        fVar225 = fVar323 * 0.0 * auVar171._12_4_;
        auVar34._12_4_ = fVar225;
        fVar239 = fVar281 * 0.0 * auVar171._16_4_;
        auVar34._16_4_ = fVar239;
        fVar242 = fVar286 * 0.0 * auVar171._20_4_;
        auVar34._20_4_ = fVar242;
        fVar252 = fVar290 * 0.0 * auVar171._24_4_;
        auVar34._24_4_ = fVar252;
        auVar34._28_4_ = fVar341;
        auVar113._4_4_ = fStack_65c;
        auVar113._0_4_ = local_660;
        auVar113._8_4_ = fStack_658;
        auVar113._12_4_ = fStack_654;
        auVar113._16_4_ = fStack_650;
        auVar113._20_4_ = fStack_64c;
        auVar113._24_4_ = fStack_648;
        auVar113._28_4_ = fStack_644;
        auVar257._0_4_ = fVar318 + local_660;
        auVar257._4_4_ = fVar200 + fStack_65c;
        auVar257._8_4_ = fVar216 + fStack_658;
        auVar257._12_4_ = fVar225 + fStack_654;
        auVar257._16_4_ = fVar239 + fStack_650;
        auVar257._20_4_ = fVar242 + fStack_64c;
        auVar257._24_4_ = fVar252 + fStack_648;
        auVar257._28_4_ = fVar341 + fStack_644;
        fVar318 = auVar308._0_4_ * fVar213 * fVar214;
        fVar200 = auVar308._4_4_ * fVar235 * fVar237;
        auVar35._4_4_ = fVar200;
        auVar35._0_4_ = fVar318;
        fVar213 = auVar308._8_4_ * fVar250 * fVar251;
        auVar35._8_4_ = fVar213;
        fVar216 = auVar308._12_4_ * fVar273 * fVar218;
        auVar35._12_4_ = fVar216;
        fVar225 = auVar308._16_4_ * fVar283 * fVar220;
        auVar35._16_4_ = fVar225;
        fVar235 = auVar308._20_4_ * fVar288 * fVar222;
        auVar35._20_4_ = fVar235;
        fVar239 = auVar308._24_4_ * fVar292 * fVar224;
        auVar35._24_4_ = fVar239;
        auVar35._28_4_ = auVar31._28_4_;
        auVar295 = vsubps_avx(auVar295,auVar32);
        auVar309._0_4_ = auVar278._0_4_ + fVar318;
        auVar309._4_4_ = auVar278._4_4_ + fVar200;
        auVar309._8_4_ = auVar278._8_4_ + fVar213;
        auVar309._12_4_ = auVar278._12_4_ + fVar216;
        auVar309._16_4_ = auVar278._16_4_ + fVar225;
        auVar309._20_4_ = auVar278._20_4_ + fVar235;
        auVar309._24_4_ = auVar278._24_4_ + fVar239;
        auVar309._28_4_ = auVar278._28_4_ + auVar31._28_4_;
        fVar318 = auVar308._0_4_ * fVar214 * -fVar241;
        fVar200 = auVar308._4_4_ * fVar237 * -fVar263;
        auVar31._4_4_ = fVar200;
        auVar31._0_4_ = fVar318;
        fVar213 = auVar308._8_4_ * fVar251 * -fVar215;
        auVar31._8_4_ = fVar213;
        fVar216 = auVar308._12_4_ * fVar218 * -fVar217;
        auVar31._12_4_ = fVar216;
        fVar225 = auVar308._16_4_ * fVar220 * -fVar219;
        auVar31._16_4_ = fVar225;
        fVar235 = auVar308._20_4_ * fVar222 * -fVar221;
        auVar31._20_4_ = fVar235;
        fVar239 = auVar308._24_4_ * fVar224 * -fVar223;
        auVar31._24_4_ = fVar239;
        auVar31._28_4_ = fVar346;
        auVar36 = vsubps_avx(auVar325,auVar33);
        auVar320._0_4_ = fVar318 + auVar206._0_4_;
        auVar320._4_4_ = fVar200 + auVar206._4_4_;
        auVar320._8_4_ = fVar213 + auVar206._8_4_;
        auVar320._12_4_ = fVar216 + auVar206._12_4_;
        auVar320._16_4_ = fVar225 + auVar206._16_4_;
        auVar320._20_4_ = fVar235 + auVar206._20_4_;
        auVar320._24_4_ = fVar239 + auVar206._24_4_;
        auVar320._28_4_ = fVar346 + auVar206._28_4_;
        fVar318 = auVar308._0_4_ * fVar214 * 0.0;
        fVar200 = auVar308._4_4_ * fVar237 * 0.0;
        auVar40._4_4_ = fVar200;
        auVar40._0_4_ = fVar318;
        fVar213 = auVar308._8_4_ * fVar251 * 0.0;
        auVar40._8_4_ = fVar213;
        fVar214 = auVar308._12_4_ * fVar218 * 0.0;
        auVar40._12_4_ = fVar214;
        fVar216 = auVar308._16_4_ * fVar220 * 0.0;
        auVar40._16_4_ = fVar216;
        fVar225 = auVar308._20_4_ * fVar222 * 0.0;
        auVar40._20_4_ = fVar225;
        fVar235 = auVar308._24_4_ * fVar224 * 0.0;
        auVar40._24_4_ = fVar235;
        auVar40._28_4_ = fVar162;
        auVar38 = vsubps_avx(auVar113,auVar34);
        auVar349._0_4_ = (float)local_3a0._0_4_ + fVar318;
        auVar349._4_4_ = (float)local_3a0._4_4_ + fVar200;
        auVar349._8_4_ = fStack_398 + fVar213;
        auVar349._12_4_ = fStack_394 + fVar214;
        auVar349._16_4_ = fStack_390 + fVar216;
        auVar349._20_4_ = fStack_38c + fVar225;
        auVar349._24_4_ = fStack_388 + fVar235;
        auVar349._28_4_ = fStack_384 + fVar162;
        auVar176 = vsubps_avx(auVar278,auVar35);
        auVar31 = vsubps_avx(auVar206,auVar31);
        auVar247 = vsubps_avx(_local_3a0,auVar40);
        auVar39 = vsubps_avx(auVar320,auVar36);
        auVar21 = vsubps_avx(auVar349,auVar38);
        auVar41._4_4_ = auVar38._4_4_ * auVar39._4_4_;
        auVar41._0_4_ = auVar38._0_4_ * auVar39._0_4_;
        auVar41._8_4_ = auVar38._8_4_ * auVar39._8_4_;
        auVar41._12_4_ = auVar38._12_4_ * auVar39._12_4_;
        auVar41._16_4_ = auVar38._16_4_ * auVar39._16_4_;
        auVar41._20_4_ = auVar38._20_4_ * auVar39._20_4_;
        auVar41._24_4_ = auVar38._24_4_ * auVar39._24_4_;
        auVar41._28_4_ = fVar346;
        auVar42._4_4_ = auVar36._4_4_ * auVar21._4_4_;
        auVar42._0_4_ = auVar36._0_4_ * auVar21._0_4_;
        auVar42._8_4_ = auVar36._8_4_ * auVar21._8_4_;
        auVar42._12_4_ = auVar36._12_4_ * auVar21._12_4_;
        auVar42._16_4_ = auVar36._16_4_ * auVar21._16_4_;
        auVar42._20_4_ = auVar36._20_4_ * auVar21._20_4_;
        auVar42._24_4_ = auVar36._24_4_ * auVar21._24_4_;
        auVar42._28_4_ = fStack_384;
        auVar207 = vsubps_avx(auVar42,auVar41);
        auVar43._4_4_ = auVar295._4_4_ * auVar21._4_4_;
        auVar43._0_4_ = auVar295._0_4_ * auVar21._0_4_;
        auVar43._8_4_ = auVar295._8_4_ * auVar21._8_4_;
        auVar43._12_4_ = auVar295._12_4_ * auVar21._12_4_;
        auVar43._16_4_ = auVar295._16_4_ * auVar21._16_4_;
        auVar43._20_4_ = auVar295._20_4_ * auVar21._20_4_;
        auVar43._24_4_ = auVar295._24_4_ * auVar21._24_4_;
        auVar43._28_4_ = auVar21._28_4_;
        auVar37 = vsubps_avx(auVar309,auVar295);
        auVar44._4_4_ = auVar38._4_4_ * auVar37._4_4_;
        auVar44._0_4_ = auVar38._0_4_ * auVar37._0_4_;
        auVar44._8_4_ = auVar38._8_4_ * auVar37._8_4_;
        auVar44._12_4_ = auVar38._12_4_ * auVar37._12_4_;
        auVar44._16_4_ = auVar38._16_4_ * auVar37._16_4_;
        auVar44._20_4_ = auVar38._20_4_ * auVar37._20_4_;
        auVar44._24_4_ = auVar38._24_4_ * auVar37._24_4_;
        auVar44._28_4_ = auVar206._28_4_;
        auVar32 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar37._4_4_ * auVar36._4_4_;
        auVar45._0_4_ = auVar37._0_4_ * auVar36._0_4_;
        auVar45._8_4_ = auVar37._8_4_ * auVar36._8_4_;
        auVar45._12_4_ = auVar37._12_4_ * auVar36._12_4_;
        auVar45._16_4_ = auVar37._16_4_ * auVar36._16_4_;
        auVar45._20_4_ = auVar37._20_4_ * auVar36._20_4_;
        auVar45._24_4_ = auVar37._24_4_ * auVar36._24_4_;
        auVar45._28_4_ = auVar21._28_4_;
        auVar46._4_4_ = auVar295._4_4_ * auVar39._4_4_;
        auVar46._0_4_ = auVar295._0_4_ * auVar39._0_4_;
        auVar46._8_4_ = auVar295._8_4_ * auVar39._8_4_;
        auVar46._12_4_ = auVar295._12_4_ * auVar39._12_4_;
        auVar46._16_4_ = auVar295._16_4_ * auVar39._16_4_;
        auVar46._20_4_ = auVar295._20_4_ * auVar39._20_4_;
        auVar46._24_4_ = auVar295._24_4_ * auVar39._24_4_;
        auVar46._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar46,auVar45);
        auVar145._0_4_ = auVar207._0_4_ * 0.0 + auVar39._0_4_ + auVar32._0_4_ * 0.0;
        auVar145._4_4_ = auVar207._4_4_ * 0.0 + auVar39._4_4_ + auVar32._4_4_ * 0.0;
        auVar145._8_4_ = auVar207._8_4_ * 0.0 + auVar39._8_4_ + auVar32._8_4_ * 0.0;
        auVar145._12_4_ = auVar207._12_4_ * 0.0 + auVar39._12_4_ + auVar32._12_4_ * 0.0;
        auVar145._16_4_ = auVar207._16_4_ * 0.0 + auVar39._16_4_ + auVar32._16_4_ * 0.0;
        auVar145._20_4_ = auVar207._20_4_ * 0.0 + auVar39._20_4_ + auVar32._20_4_ * 0.0;
        auVar145._24_4_ = auVar207._24_4_ * 0.0 + auVar39._24_4_ + auVar32._24_4_ * 0.0;
        auVar145._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar32._28_4_;
        auVar37 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,2);
        auVar193 = ZEXT3264(auVar37);
        auVar176 = vblendvps_avx(auVar176,_local_5e0,auVar37);
        auVar31 = vblendvps_avx(auVar31,_local_600,auVar37);
        auVar247 = vblendvps_avx(auVar247,auVar257,auVar37);
        auVar39 = vblendvps_avx(auVar295,auVar309,auVar37);
        auVar21 = vblendvps_avx(auVar36,auVar320,auVar37);
        auVar207 = vblendvps_avx(auVar38,auVar349,auVar37);
        auVar295 = vblendvps_avx(auVar309,auVar295,auVar37);
        auVar36 = vblendvps_avx(auVar320,auVar36,auVar37);
        auVar140 = vpackssdw_avx(auVar297._0_16_,auVar297._16_16_);
        auVar297 = vblendvps_avx(auVar349,auVar38,auVar37);
        auVar295 = vsubps_avx(auVar295,auVar176);
        auVar38 = vsubps_avx(auVar36,auVar31);
        auVar32 = vsubps_avx(auVar297,auVar247);
        auVar297 = vsubps_avx(auVar31,auVar21);
        fVar318 = auVar38._0_4_;
        fVar161 = auVar247._0_4_;
        fVar225 = auVar38._4_4_;
        fVar241 = auVar247._4_4_;
        auVar47._4_4_ = fVar241 * fVar225;
        auVar47._0_4_ = fVar161 * fVar318;
        fVar250 = auVar38._8_4_;
        fVar263 = auVar247._8_4_;
        auVar47._8_4_ = fVar263 * fVar250;
        fVar218 = auVar38._12_4_;
        fVar215 = auVar247._12_4_;
        auVar47._12_4_ = fVar215 * fVar218;
        fVar315 = auVar38._16_4_;
        fVar217 = auVar247._16_4_;
        auVar47._16_4_ = fVar217 * fVar315;
        fVar290 = auVar38._20_4_;
        fVar219 = auVar247._20_4_;
        auVar47._20_4_ = fVar219 * fVar290;
        fVar154 = auVar38._24_4_;
        fVar221 = auVar247._24_4_;
        auVar47._24_4_ = fVar221 * fVar154;
        auVar47._28_4_ = auVar36._28_4_;
        fVar200 = auVar31._0_4_;
        fVar293 = auVar32._0_4_;
        fVar235 = auVar31._4_4_;
        fVar302 = auVar32._4_4_;
        auVar48._4_4_ = fVar302 * fVar235;
        auVar48._0_4_ = fVar293 * fVar200;
        fVar251 = auVar31._8_4_;
        fVar303 = auVar32._8_4_;
        auVar48._8_4_ = fVar303 * fVar251;
        fVar314 = auVar31._12_4_;
        fVar304 = auVar32._12_4_;
        auVar48._12_4_ = fVar304 * fVar314;
        fVar286 = auVar31._16_4_;
        fVar305 = auVar32._16_4_;
        auVar48._16_4_ = fVar305 * fVar286;
        fVar292 = auVar31._20_4_;
        fVar135 = auVar32._20_4_;
        auVar48._20_4_ = fVar135 * fVar292;
        fVar157 = auVar31._24_4_;
        fVar136 = auVar32._24_4_;
        auVar48._24_4_ = fVar136 * fVar157;
        auVar48._28_4_ = auVar320._28_4_;
        auVar36 = vsubps_avx(auVar48,auVar47);
        fVar213 = auVar176._0_4_;
        fVar237 = auVar176._4_4_;
        auVar49._4_4_ = fVar302 * fVar237;
        auVar49._0_4_ = fVar293 * fVar213;
        fVar252 = auVar176._8_4_;
        auVar49._8_4_ = fVar303 * fVar252;
        fVar281 = auVar176._12_4_;
        auVar49._12_4_ = fVar304 * fVar281;
        fVar288 = auVar176._16_4_;
        auVar49._16_4_ = fVar305 * fVar288;
        fVar224 = auVar176._20_4_;
        auVar49._20_4_ = fVar135 * fVar224;
        fVar158 = auVar176._24_4_;
        auVar49._24_4_ = fVar136 * fVar158;
        auVar49._28_4_ = auVar320._28_4_;
        fVar214 = auVar295._0_4_;
        auVar343._0_4_ = fVar161 * fVar214;
        fVar239 = auVar295._4_4_;
        auVar343._4_4_ = fVar241 * fVar239;
        fVar323 = auVar295._8_4_;
        auVar343._8_4_ = fVar263 * fVar323;
        fVar283 = auVar295._12_4_;
        auVar343._12_4_ = fVar215 * fVar283;
        fVar222 = auVar295._16_4_;
        auVar343._16_4_ = fVar217 * fVar222;
        fVar199 = auVar295._20_4_;
        auVar343._20_4_ = fVar219 * fVar199;
        fVar159 = auVar295._24_4_;
        auVar343._24_4_ = fVar221 * fVar159;
        auVar343._28_4_ = 0;
        auVar33 = vsubps_avx(auVar343,auVar49);
        auVar50._4_4_ = fVar235 * fVar239;
        auVar50._0_4_ = fVar200 * fVar214;
        auVar50._8_4_ = fVar251 * fVar323;
        auVar50._12_4_ = fVar314 * fVar283;
        auVar50._16_4_ = fVar286 * fVar222;
        auVar50._20_4_ = fVar292 * fVar199;
        auVar50._24_4_ = fVar157 * fVar159;
        auVar50._28_4_ = auVar320._28_4_;
        auVar51._4_4_ = fVar237 * fVar225;
        auVar51._0_4_ = fVar213 * fVar318;
        auVar51._8_4_ = fVar252 * fVar250;
        auVar51._12_4_ = fVar281 * fVar218;
        auVar51._16_4_ = fVar288 * fVar315;
        auVar51._20_4_ = fVar224 * fVar290;
        auVar51._24_4_ = fVar158 * fVar154;
        auVar51._28_4_ = auVar349._28_4_;
        auVar34 = vsubps_avx(auVar51,auVar50);
        auVar35 = vsubps_avx(auVar247,auVar207);
        fVar216 = auVar34._28_4_ + auVar33._28_4_;
        auVar173._0_4_ = auVar34._0_4_ + auVar33._0_4_ * 0.0 + auVar36._0_4_ * 0.0;
        auVar173._4_4_ = auVar34._4_4_ + auVar33._4_4_ * 0.0 + auVar36._4_4_ * 0.0;
        auVar173._8_4_ = auVar34._8_4_ + auVar33._8_4_ * 0.0 + auVar36._8_4_ * 0.0;
        auVar173._12_4_ = auVar34._12_4_ + auVar33._12_4_ * 0.0 + auVar36._12_4_ * 0.0;
        auVar173._16_4_ = auVar34._16_4_ + auVar33._16_4_ * 0.0 + auVar36._16_4_ * 0.0;
        auVar173._20_4_ = auVar34._20_4_ + auVar33._20_4_ * 0.0 + auVar36._20_4_ * 0.0;
        auVar173._24_4_ = auVar34._24_4_ + auVar33._24_4_ * 0.0 + auVar36._24_4_ * 0.0;
        auVar173._28_4_ = fVar216 + auVar36._28_4_;
        fVar223 = auVar297._0_4_;
        fVar162 = auVar297._4_4_;
        auVar52._4_4_ = fVar162 * auVar207._4_4_;
        auVar52._0_4_ = fVar223 * auVar207._0_4_;
        fVar264 = auVar297._8_4_;
        auVar52._8_4_ = fVar264 * auVar207._8_4_;
        fVar285 = auVar297._12_4_;
        auVar52._12_4_ = fVar285 * auVar207._12_4_;
        fVar287 = auVar297._16_4_;
        auVar52._16_4_ = fVar287 * auVar207._16_4_;
        fVar289 = auVar297._20_4_;
        auVar52._20_4_ = fVar289 * auVar207._20_4_;
        fVar291 = auVar297._24_4_;
        auVar52._24_4_ = fVar291 * auVar207._24_4_;
        auVar52._28_4_ = fVar216;
        fVar216 = auVar35._0_4_;
        fVar242 = auVar35._4_4_;
        auVar53._4_4_ = auVar21._4_4_ * fVar242;
        auVar53._0_4_ = auVar21._0_4_ * fVar216;
        fVar273 = auVar35._8_4_;
        auVar53._8_4_ = auVar21._8_4_ * fVar273;
        fVar220 = auVar35._12_4_;
        auVar53._12_4_ = auVar21._12_4_ * fVar220;
        fVar316 = auVar35._16_4_;
        auVar53._16_4_ = auVar21._16_4_ * fVar316;
        fVar151 = auVar35._20_4_;
        auVar53._20_4_ = auVar21._20_4_ * fVar151;
        fVar160 = auVar35._24_4_;
        auVar53._24_4_ = auVar21._24_4_ * fVar160;
        auVar53._28_4_ = auVar34._28_4_;
        auVar297 = vsubps_avx(auVar53,auVar52);
        auVar33 = vsubps_avx(auVar176,auVar39);
        fVar149 = auVar33._0_4_;
        fVar150 = auVar33._4_4_;
        auVar54._4_4_ = fVar150 * auVar207._4_4_;
        auVar54._0_4_ = fVar149 * auVar207._0_4_;
        fVar152 = auVar33._8_4_;
        auVar54._8_4_ = fVar152 * auVar207._8_4_;
        fVar153 = auVar33._12_4_;
        auVar54._12_4_ = fVar153 * auVar207._12_4_;
        fVar155 = auVar33._16_4_;
        auVar54._16_4_ = fVar155 * auVar207._16_4_;
        fVar156 = auVar33._20_4_;
        auVar54._20_4_ = fVar156 * auVar207._20_4_;
        fVar163 = auVar33._24_4_;
        auVar54._24_4_ = fVar163 * auVar207._24_4_;
        auVar54._28_4_ = auVar207._28_4_;
        auVar55._4_4_ = auVar39._4_4_ * fVar242;
        auVar55._0_4_ = auVar39._0_4_ * fVar216;
        auVar55._8_4_ = auVar39._8_4_ * fVar273;
        auVar55._12_4_ = auVar39._12_4_ * fVar220;
        auVar55._16_4_ = auVar39._16_4_ * fVar316;
        auVar55._20_4_ = auVar39._20_4_ * fVar151;
        auVar55._24_4_ = auVar39._24_4_ * fVar160;
        auVar55._28_4_ = auVar36._28_4_;
        auVar36 = vsubps_avx(auVar54,auVar55);
        auVar56._4_4_ = auVar21._4_4_ * fVar150;
        auVar56._0_4_ = auVar21._0_4_ * fVar149;
        auVar56._8_4_ = auVar21._8_4_ * fVar152;
        auVar56._12_4_ = auVar21._12_4_ * fVar153;
        auVar56._16_4_ = auVar21._16_4_ * fVar155;
        auVar56._20_4_ = auVar21._20_4_ * fVar156;
        auVar56._24_4_ = auVar21._24_4_ * fVar163;
        auVar56._28_4_ = auVar207._28_4_;
        auVar57._4_4_ = auVar39._4_4_ * fVar162;
        auVar57._0_4_ = auVar39._0_4_ * fVar223;
        auVar57._8_4_ = auVar39._8_4_ * fVar264;
        auVar57._12_4_ = auVar39._12_4_ * fVar285;
        auVar57._16_4_ = auVar39._16_4_ * fVar287;
        auVar57._20_4_ = auVar39._20_4_ * fVar289;
        auVar57._24_4_ = auVar39._24_4_ * fVar291;
        auVar57._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar57,auVar56);
        auVar231._0_4_ = auVar297._0_4_ * 0.0 + auVar39._0_4_ + auVar36._0_4_ * 0.0;
        auVar231._4_4_ = auVar297._4_4_ * 0.0 + auVar39._4_4_ + auVar36._4_4_ * 0.0;
        auVar231._8_4_ = auVar297._8_4_ * 0.0 + auVar39._8_4_ + auVar36._8_4_ * 0.0;
        auVar231._12_4_ = auVar297._12_4_ * 0.0 + auVar39._12_4_ + auVar36._12_4_ * 0.0;
        auVar231._16_4_ = auVar297._16_4_ * 0.0 + auVar39._16_4_ + auVar36._16_4_ * 0.0;
        auVar231._20_4_ = auVar297._20_4_ * 0.0 + auVar39._20_4_ + auVar36._20_4_ * 0.0;
        auVar231._24_4_ = auVar297._24_4_ * 0.0 + auVar39._24_4_ + auVar36._24_4_ * 0.0;
        auVar231._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar36._28_4_;
        auVar234 = ZEXT3264(auVar231);
        auVar297 = vmaxps_avx(auVar173,auVar231);
        auVar297 = vcmpps_avx(auVar297,ZEXT832(0) << 0x20,2);
        auVar204 = vpackssdw_avx(auVar297._0_16_,auVar297._16_16_);
        auVar140 = vpand_avx(auVar140,auVar204);
        auVar204 = vpmovsxwd_avx(auVar140);
        auVar205 = vpunpckhwd_avx(auVar140,auVar140);
        auVar208._16_16_ = auVar205;
        auVar208._0_16_ = auVar204;
        if ((((((((auVar208 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar208 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar208 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar208 >> 0x7f,0) == '\0') &&
              (auVar208 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar205 >> 0x3f,0) == '\0') &&
            (auVar208 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar205[0xf]) {
LAB_00faba88:
          auVar177 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
          auVar212 = ZEXT3264(auVar208);
          auVar336 = ZEXT3264(local_540);
          auVar301 = ZEXT3264(local_560);
        }
        else {
          auVar58._4_4_ = fVar242 * fVar225;
          auVar58._0_4_ = fVar216 * fVar318;
          auVar58._8_4_ = fVar273 * fVar250;
          auVar58._12_4_ = fVar220 * fVar218;
          auVar58._16_4_ = fVar316 * fVar315;
          auVar58._20_4_ = fVar151 * fVar290;
          auVar58._24_4_ = fVar160 * fVar154;
          auVar58._28_4_ = auVar205._12_4_;
          auVar326._0_4_ = fVar223 * fVar293;
          auVar326._4_4_ = fVar162 * fVar302;
          auVar326._8_4_ = fVar264 * fVar303;
          auVar326._12_4_ = fVar285 * fVar304;
          auVar326._16_4_ = fVar287 * fVar305;
          auVar326._20_4_ = fVar289 * fVar135;
          auVar326._24_4_ = fVar291 * fVar136;
          auVar326._28_4_ = 0;
          auVar297 = vsubps_avx(auVar326,auVar58);
          auVar59._4_4_ = fVar150 * fVar302;
          auVar59._0_4_ = fVar149 * fVar293;
          auVar59._8_4_ = fVar152 * fVar303;
          auVar59._12_4_ = fVar153 * fVar304;
          auVar59._16_4_ = fVar155 * fVar305;
          auVar59._20_4_ = fVar156 * fVar135;
          auVar59._24_4_ = fVar163 * fVar136;
          auVar59._28_4_ = auVar32._28_4_;
          auVar60._4_4_ = fVar242 * fVar239;
          auVar60._0_4_ = fVar216 * fVar214;
          auVar60._8_4_ = fVar273 * fVar323;
          auVar60._12_4_ = fVar220 * fVar283;
          auVar60._16_4_ = fVar316 * fVar222;
          auVar60._20_4_ = fVar151 * fVar199;
          auVar60._24_4_ = fVar160 * fVar159;
          auVar60._28_4_ = auVar35._28_4_;
          auVar21 = vsubps_avx(auVar60,auVar59);
          auVar61._4_4_ = fVar162 * fVar239;
          auVar61._0_4_ = fVar223 * fVar214;
          auVar61._8_4_ = fVar264 * fVar323;
          auVar61._12_4_ = fVar285 * fVar283;
          auVar61._16_4_ = fVar287 * fVar222;
          auVar61._20_4_ = fVar289 * fVar199;
          auVar61._24_4_ = fVar291 * fVar159;
          auVar61._28_4_ = auVar173._28_4_;
          auVar62._4_4_ = fVar150 * fVar225;
          auVar62._0_4_ = fVar149 * fVar318;
          auVar62._8_4_ = fVar152 * fVar250;
          auVar62._12_4_ = fVar153 * fVar218;
          auVar62._16_4_ = fVar155 * fVar315;
          auVar62._20_4_ = fVar156 * fVar290;
          auVar62._24_4_ = fVar163 * fVar154;
          auVar62._28_4_ = auVar38._28_4_;
          auVar207 = vsubps_avx(auVar62,auVar61);
          auVar271._0_4_ = auVar297._0_4_ * 0.0 + auVar207._0_4_ + auVar21._0_4_ * 0.0;
          auVar271._4_4_ = auVar297._4_4_ * 0.0 + auVar207._4_4_ + auVar21._4_4_ * 0.0;
          auVar271._8_4_ = auVar297._8_4_ * 0.0 + auVar207._8_4_ + auVar21._8_4_ * 0.0;
          auVar271._12_4_ = auVar297._12_4_ * 0.0 + auVar207._12_4_ + auVar21._12_4_ * 0.0;
          auVar271._16_4_ = auVar297._16_4_ * 0.0 + auVar207._16_4_ + auVar21._16_4_ * 0.0;
          auVar271._20_4_ = auVar297._20_4_ * 0.0 + auVar207._20_4_ + auVar21._20_4_ * 0.0;
          auVar271._24_4_ = auVar297._24_4_ * 0.0 + auVar207._24_4_ + auVar21._24_4_ * 0.0;
          auVar271._28_4_ = auVar38._28_4_ + auVar207._28_4_ + auVar173._28_4_;
          auVar39 = vrcpps_avx(auVar271);
          fVar318 = auVar39._0_4_;
          fVar214 = auVar39._4_4_;
          auVar63._4_4_ = auVar271._4_4_ * fVar214;
          auVar63._0_4_ = auVar271._0_4_ * fVar318;
          fVar216 = auVar39._8_4_;
          auVar63._8_4_ = auVar271._8_4_ * fVar216;
          fVar225 = auVar39._12_4_;
          auVar63._12_4_ = auVar271._12_4_ * fVar225;
          fVar239 = auVar39._16_4_;
          auVar63._16_4_ = auVar271._16_4_ * fVar239;
          fVar242 = auVar39._20_4_;
          auVar63._20_4_ = auVar271._20_4_ * fVar242;
          fVar250 = auVar39._24_4_;
          auVar63._24_4_ = auVar271._24_4_ * fVar250;
          auVar63._28_4_ = auVar35._28_4_;
          auVar327._8_4_ = 0x3f800000;
          auVar327._0_8_ = 0x3f8000003f800000;
          auVar327._12_4_ = 0x3f800000;
          auVar327._16_4_ = 0x3f800000;
          auVar327._20_4_ = 0x3f800000;
          auVar327._24_4_ = 0x3f800000;
          auVar327._28_4_ = 0x3f800000;
          auVar36 = vsubps_avx(auVar327,auVar63);
          fVar318 = auVar36._0_4_ * fVar318 + fVar318;
          fVar214 = auVar36._4_4_ * fVar214 + fVar214;
          fVar216 = auVar36._8_4_ * fVar216 + fVar216;
          fVar225 = auVar36._12_4_ * fVar225 + fVar225;
          fVar239 = auVar36._16_4_ * fVar239 + fVar239;
          fVar242 = auVar36._20_4_ * fVar242 + fVar242;
          fVar250 = auVar36._24_4_ * fVar250 + fVar250;
          auVar64._4_4_ =
               (auVar297._4_4_ * fVar237 + auVar21._4_4_ * fVar235 + auVar207._4_4_ * fVar241) *
               fVar214;
          auVar64._0_4_ =
               (auVar297._0_4_ * fVar213 + auVar21._0_4_ * fVar200 + auVar207._0_4_ * fVar161) *
               fVar318;
          auVar64._8_4_ =
               (auVar297._8_4_ * fVar252 + auVar21._8_4_ * fVar251 + auVar207._8_4_ * fVar263) *
               fVar216;
          auVar64._12_4_ =
               (auVar297._12_4_ * fVar281 + auVar21._12_4_ * fVar314 + auVar207._12_4_ * fVar215) *
               fVar225;
          auVar64._16_4_ =
               (auVar297._16_4_ * fVar288 + auVar21._16_4_ * fVar286 + auVar207._16_4_ * fVar217) *
               fVar239;
          auVar64._20_4_ =
               (auVar297._20_4_ * fVar224 + auVar21._20_4_ * fVar292 + auVar207._20_4_ * fVar219) *
               fVar242;
          auVar64._24_4_ =
               (auVar297._24_4_ * fVar158 + auVar21._24_4_ * fVar157 + auVar207._24_4_ * fVar221) *
               fVar250;
          auVar64._28_4_ = auVar176._28_4_ + auVar295._28_4_ + auVar247._28_4_;
          auVar204 = vpermilps_avx(ZEXT416(uVar128),0);
          auVar209._16_16_ = auVar204;
          auVar209._0_16_ = auVar204;
          auVar297 = vcmpps_avx(auVar209,auVar64,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar245._4_4_ = uVar12;
          auVar245._0_4_ = uVar12;
          auVar245._8_4_ = uVar12;
          auVar245._12_4_ = uVar12;
          auVar245._16_4_ = uVar12;
          auVar245._20_4_ = uVar12;
          auVar245._24_4_ = uVar12;
          auVar245._28_4_ = uVar12;
          auVar176 = vcmpps_avx(auVar64,auVar245,2);
          auVar297 = vandps_avx(auVar176,auVar297);
          auVar204 = vpackssdw_avx(auVar297._0_16_,auVar297._16_16_);
          auVar140 = vpand_avx(auVar140,auVar204);
          auVar204 = vpmovsxwd_avx(auVar140);
          auVar205 = vpshufd_avx(auVar140,0xee);
          auVar205 = vpmovsxwd_avx(auVar205);
          auVar208._16_16_ = auVar205;
          auVar208._0_16_ = auVar204;
          if ((((((((auVar208 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar208 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar208 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar208 >> 0x7f,0) == '\0') &&
                (auVar208 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar205 >> 0x3f,0) == '\0') &&
              (auVar208 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar205[0xf]) goto LAB_00faba88;
          auVar297 = vcmpps_avx(ZEXT832(0) << 0x20,auVar271,4);
          auVar204 = vpackssdw_avx(auVar297._0_16_,auVar297._16_16_);
          auVar140 = vpand_avx(auVar140,auVar204);
          auVar204 = vpmovsxwd_avx(auVar140);
          auVar140 = vpunpckhwd_avx(auVar140,auVar140);
          auVar212 = ZEXT1664(auVar140);
          auVar258._16_16_ = auVar140;
          auVar258._0_16_ = auVar204;
          auVar177 = ZEXT3264(CONCAT824(uStack_4e8,
                                        CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
          auVar336 = ZEXT3264(local_540);
          auVar301 = ZEXT3264(local_560);
          if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar258 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar258 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar258 >> 0x7f,0) != '\0') ||
                (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar140 >> 0x3f,0) != '\0') ||
              (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar140[0xf] < '\0') {
            auVar210._0_4_ = auVar173._0_4_ * fVar318;
            auVar210._4_4_ = auVar173._4_4_ * fVar214;
            auVar210._8_4_ = auVar173._8_4_ * fVar216;
            auVar210._12_4_ = auVar173._12_4_ * fVar225;
            auVar210._16_4_ = auVar173._16_4_ * fVar239;
            auVar210._20_4_ = auVar173._20_4_ * fVar242;
            auVar210._24_4_ = auVar173._24_4_ * fVar250;
            auVar210._28_4_ = 0;
            auVar65._4_4_ = auVar231._4_4_ * fVar214;
            auVar65._0_4_ = auVar231._0_4_ * fVar318;
            auVar65._8_4_ = auVar231._8_4_ * fVar216;
            auVar65._12_4_ = auVar231._12_4_ * fVar225;
            auVar65._16_4_ = auVar231._16_4_ * fVar239;
            auVar65._20_4_ = auVar231._20_4_ * fVar242;
            auVar65._24_4_ = auVar231._24_4_ * fVar250;
            auVar65._28_4_ = auVar36._28_4_ + auVar39._28_4_;
            auVar246._8_4_ = 0x3f800000;
            auVar246._0_8_ = 0x3f8000003f800000;
            auVar246._12_4_ = 0x3f800000;
            auVar246._16_4_ = 0x3f800000;
            auVar246._20_4_ = 0x3f800000;
            auVar246._24_4_ = 0x3f800000;
            auVar246._28_4_ = 0x3f800000;
            auVar297 = vsubps_avx(auVar246,auVar210);
            auVar234 = ZEXT3264(auVar297);
            auVar297 = vblendvps_avx(auVar297,auVar210,auVar37);
            auVar336 = ZEXT3264(auVar297);
            auVar297 = vsubps_avx(auVar246,auVar65);
            auVar212 = ZEXT3264(auVar297);
            _local_3c0 = vblendvps_avx(auVar297,auVar65,auVar37);
            auVar177 = ZEXT3264(auVar258);
            auVar301 = ZEXT3264(auVar64);
          }
        }
        auVar176 = auVar336._0_32_;
        auVar297 = auVar301._0_32_;
        auVar247 = auVar177._0_32_;
        if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar247 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar247 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar247 >> 0x7f,0) == '\0') &&
              (auVar177 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar247 >> 0xbf,0) == '\0') &&
            (auVar177 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar177[0x1f]) {
          bVar130 = false;
        }
        else {
          auVar39 = vsubps_avx(auVar308,auVar171);
          fVar200 = auVar171._0_4_ + auVar336._0_4_ * auVar39._0_4_;
          fVar213 = auVar171._4_4_ + auVar336._4_4_ * auVar39._4_4_;
          fVar214 = auVar171._8_4_ + auVar336._8_4_ * auVar39._8_4_;
          fVar216 = auVar171._12_4_ + auVar336._12_4_ * auVar39._12_4_;
          fVar225 = auVar171._16_4_ + auVar336._16_4_ * auVar39._16_4_;
          fVar235 = auVar171._20_4_ + auVar336._20_4_ * auVar39._20_4_;
          fVar237 = auVar171._24_4_ + auVar336._24_4_ * auVar39._24_4_;
          fVar239 = auVar39._28_4_ + 0.0;
          fVar318 = *(float *)((long)local_6d8->ray_space + k * 4 + -0x10);
          auVar66._4_4_ = (fVar213 + fVar213) * fVar318;
          auVar66._0_4_ = (fVar200 + fVar200) * fVar318;
          auVar66._8_4_ = (fVar214 + fVar214) * fVar318;
          auVar66._12_4_ = (fVar216 + fVar216) * fVar318;
          auVar66._16_4_ = (fVar225 + fVar225) * fVar318;
          auVar66._20_4_ = (fVar235 + fVar235) * fVar318;
          auVar66._24_4_ = (fVar237 + fVar237) * fVar318;
          auVar66._28_4_ = fVar239 + fVar239;
          auVar39 = vcmpps_avx(auVar297,auVar66,6);
          auVar21 = auVar247 & auVar39;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0x7f,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0xbf,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar21[0x1f] < '\0') {
            local_220 = vandps_avx(auVar39,auVar247);
            local_2c0 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            fStack_2bc = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            fStack_2b8 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            fStack_2b4 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            fStack_2b0 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            fStack_2ac = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            fStack_2a8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            fStack_2a4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            local_280 = 0;
            uStack_268 = uStack_6e8;
            uStack_258 = uStack_608;
            uStack_248 = uStack_618;
            auVar193 = ZEXT1664(_local_630);
            local_3c0._4_4_ = fStack_2bc;
            local_3c0._0_4_ = local_2c0;
            uStack_3b8._0_4_ = fStack_2b8;
            uStack_3b8._4_4_ = fStack_2b4;
            uStack_3b0._0_4_ = fStack_2b0;
            uStack_3b0._4_4_ = fStack_2ac;
            auVar121 = _local_3c0;
            uStack_3a8._0_4_ = fStack_2a8;
            uStack_3a8._4_4_ = fStack_2a4;
            auVar247 = _local_3c0;
            _local_3c0 = auVar247;
            if ((pGVar132->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar130 = true, pGVar132->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar188._0_4_ = 1.0 / local_4a0;
                auVar188._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar140 = vshufps_avx(auVar188,auVar188,0);
                auVar193 = ZEXT3264(CONCAT1616(auVar140,auVar140));
                local_200[0] = auVar140._0_4_ * (auVar336._0_4_ + 0.0);
                local_200[1] = auVar140._4_4_ * (auVar336._4_4_ + 1.0);
                local_200[2] = auVar140._8_4_ * (auVar336._8_4_ + 2.0);
                local_200[3] = auVar140._12_4_ * (auVar336._12_4_ + 3.0);
                fStack_1f0 = auVar140._0_4_ * (auVar336._16_4_ + 4.0);
                fStack_1ec = auVar140._4_4_ * (auVar336._20_4_ + 5.0);
                fStack_1e8 = auVar140._8_4_ * (auVar336._24_4_ + 6.0);
                fStack_1e4 = auVar336._28_4_ + 7.0;
                uStack_3b0 = auVar121._16_8_;
                uStack_3a8 = auVar247._24_8_;
                local_1e0 = local_3c0;
                uStack_1d8 = uStack_3b8;
                uStack_1d0 = uStack_3b0;
                uStack_1c8 = uStack_3a8;
                local_1c0 = auVar297;
                iVar125 = vmovmskps_avx(local_220);
                uVar133 = CONCAT44((int)((ulong)lVar131 >> 0x20),iVar125);
                uVar126 = 0;
                if (uVar133 != 0) {
                  for (; (uVar133 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                  }
                }
                if (iVar125 == 0) goto LAB_00faaa5d;
                local_6a0 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
                auStack_690 = auVar308._16_16_;
                _local_740 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
                _auStack_730 = auVar31._16_16_;
                _auStack_570 = auVar325._16_16_;
                _local_580 = *local_6e0;
                _auStack_59c = auVar206._4_28_;
                local_5a0 = (undefined1  [4])*(undefined4 *)(ray + k * 4 + 0x80);
                _local_5c0 = auVar278;
                local_560 = auVar297;
                local_540 = auVar176;
                local_2e0 = auVar176;
                local_2a0 = auVar297;
                local_27c = uVar16;
                local_270 = local_6f0;
                local_260 = local_610;
                local_250 = local_620;
                local_240 = _local_630;
                do {
                  local_440 = local_200[uVar126];
                  local_430 = *(undefined4 *)((long)&local_1e0 + uVar126 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar126 * 4);
                  fVar200 = 1.0 - local_440;
                  fVar213 = local_440 * (fVar200 + fVar200) - fVar200 * fVar200;
                  auVar234 = ZEXT464((uint)fVar213);
                  fVar318 = local_440 * 3.0;
                  auVar140 = ZEXT416((uint)((fVar200 * -2.0 * local_440 + local_440 * local_440) *
                                           0.5));
                  auVar140 = vshufps_avx(auVar140,auVar140,0);
                  auVar204 = ZEXT416((uint)(((fVar200 + fVar200) * (fVar318 + 2.0) +
                                            fVar200 * fVar200 * -3.0) * 0.5));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar205 = ZEXT416((uint)(((local_440 + local_440) * (fVar318 + -5.0) +
                                            local_440 * fVar318) * 0.5));
                  auVar205 = vshufps_avx(auVar205,auVar205,0);
                  local_6d0.context = context->user;
                  auVar22 = vshufps_avx(ZEXT416((uint)(fVar213 * 0.5)),
                                        ZEXT416((uint)(fVar213 * 0.5)),0);
                  auVar189._0_4_ =
                       auVar22._0_4_ * (float)local_6f0._0_4_ +
                       auVar205._0_4_ * (float)local_610._0_4_ +
                       auVar140._0_4_ * (float)local_630._0_4_ +
                       auVar204._0_4_ * (float)local_620._0_4_;
                  auVar189._4_4_ =
                       auVar22._4_4_ * (float)local_6f0._4_4_ +
                       auVar205._4_4_ * (float)local_610._4_4_ +
                       auVar140._4_4_ * (float)local_630._4_4_ +
                       auVar204._4_4_ * (float)local_620._4_4_;
                  auVar189._8_4_ =
                       auVar22._8_4_ * (float)uStack_6e8 +
                       auVar205._8_4_ * (float)uStack_608 +
                       auVar140._8_4_ * fStack_628 + auVar204._8_4_ * (float)uStack_618;
                  auVar189._12_4_ =
                       auVar22._12_4_ * uStack_6e8._4_4_ +
                       auVar205._12_4_ * uStack_608._4_4_ +
                       auVar140._12_4_ * fStack_624 + auVar204._12_4_ * uStack_618._4_4_;
                  local_470 = (RTCHitN  [16])vshufps_avx(auVar189,auVar189,0);
                  local_460 = vshufps_avx(auVar189,auVar189,0x55);
                  auVar212 = ZEXT1664(local_460);
                  local_450 = vshufps_avx(auVar189,auVar189,0xaa);
                  auVar193 = ZEXT1664(local_450);
                  local_420 = local_740;
                  uStack_418 = uStack_738;
                  local_410 = local_6a0._0_8_;
                  uStack_408 = local_6a0._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_3fc = (local_6d0.context)->instID[0];
                  local_400 = uStack_3fc;
                  uStack_3f8 = uStack_3fc;
                  uStack_3f4 = uStack_3fc;
                  uStack_3f0 = (local_6d0.context)->instPrimID[0];
                  uStack_3ec = uStack_3f0;
                  uStack_3e8 = uStack_3f0;
                  uStack_3e4 = uStack_3f0;
                  local_7a0 = _local_580;
                  local_6d0.valid = (int *)local_7a0;
                  local_6d0.geometryUserPtr = pGVar132->userPtr;
                  local_6d0.hit = local_470;
                  local_6d0.N = 4;
                  local_6d0.ray = (RTCRayN *)ray;
                  fStack_43c = local_440;
                  fStack_438 = local_440;
                  fStack_434 = local_440;
                  uStack_42c = local_430;
                  uStack_428 = local_430;
                  uStack_424 = local_430;
                  if (pGVar132->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar193 = ZEXT1664(local_450);
                    auVar212 = ZEXT1664(local_460);
                    auVar234 = ZEXT464((uint)fVar213);
                    (*pGVar132->occlusionFilterN)(&local_6d0);
                    auVar301 = ZEXT3264(local_560);
                    auVar336 = ZEXT3264(local_540);
                    fVar331 = (float)local_780._0_4_;
                    fVar337 = (float)local_780._4_4_;
                    fVar338 = fStack_778;
                    fVar340 = fStack_774;
                    fVar182 = fStack_770;
                    fVar198 = fStack_76c;
                    fVar196 = fStack_768;
                  }
                  if (local_7a0 == (undefined1  [16])0x0) {
                    auVar140 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar140 = auVar140 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar132->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar212 = ZEXT1664(auVar212._0_16_);
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      (*p_Var19)(&local_6d0);
                      auVar301 = ZEXT3264(local_560);
                      auVar336 = ZEXT3264(local_540);
                      fVar331 = (float)local_780._0_4_;
                      fVar337 = (float)local_780._4_4_;
                      fVar338 = fStack_778;
                      fVar340 = fStack_774;
                      fVar182 = fStack_770;
                      fVar198 = fStack_76c;
                      fVar196 = fStack_768;
                    }
                    auVar204 = vpcmpeqd_avx(local_7a0,_DAT_01f7aa10);
                    auVar140 = auVar204 ^ _DAT_01f7ae20;
                    auVar190._8_4_ = 0xff800000;
                    auVar190._0_8_ = 0xff800000ff800000;
                    auVar190._12_4_ = 0xff800000;
                    auVar193 = ZEXT1664(auVar190);
                    auVar204 = vblendvps_avx(auVar190,*(undefined1 (*) [16])(local_6d0.ray + 0x80),
                                             auVar204);
                    *(undefined1 (*) [16])(local_6d0.ray + 0x80) = auVar204;
                  }
                  auVar176 = auVar336._0_32_;
                  auVar297 = auVar301._0_32_;
                  auVar170._8_8_ = 0x100000001;
                  auVar170._0_8_ = 0x100000001;
                  if ((auVar170 & auVar140) != (undefined1  [16])0x0) {
                    bVar130 = true;
                    break;
                  }
                  *(undefined1 (*) [4])(ray + k * 4 + 0x80) = local_5a0;
                  uVar133 = uVar133 ^ 1L << (uVar126 & 0x3f);
                  uVar126 = 0;
                  if (uVar133 != 0) {
                    for (; (uVar133 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                    }
                  }
                  bVar130 = false;
                } while (uVar133 != 0);
              }
              goto LAB_00faab39;
            }
          }
LAB_00faaa5d:
          bVar130 = false;
        }
      }
LAB_00faab39:
      local_560 = auVar297;
      local_540 = auVar176;
      if (8 < (int)uVar16) {
        _local_600 = vpshufd_avx(ZEXT416(uVar16),0);
        auVar140 = vshufps_avx(local_760._0_16_,local_760._0_16_,0);
        register0x00001210 = auVar140;
        _local_3a0 = auVar140;
        auVar140 = vpermilps_avx(ZEXT416(uVar128),0);
        local_c0._16_16_ = auVar140;
        local_c0._0_16_ = auVar140;
        auVar142._0_4_ = 1.0 / local_4a0;
        auVar142._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar140 = vshufps_avx(auVar142,auVar142,0);
        register0x00001210 = auVar140;
        _local_e0 = auVar140;
        local_300 = vshufps_avx(ZEXT416((uint)local_788),ZEXT416((uint)local_788),0);
        local_640 = vshufps_avx(ZEXT416((uint)local_640._0_4_),ZEXT416((uint)local_640._0_4_),0);
        lVar134 = 8;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar134 * 4 + lVar20);
          fVar318 = *(float *)*pauVar9;
          fVar200 = *(float *)(*pauVar9 + 4);
          fVar213 = *(float *)(*pauVar9 + 8);
          fVar214 = *(float *)(*pauVar9 + 0xc);
          fVar216 = *(float *)(*pauVar9 + 0x10);
          fVar225 = *(float *)(*pauVar9 + 0x14);
          fVar235 = *(float *)(*pauVar9 + 0x18);
          auVar120 = *pauVar9;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21b37f0 + lVar134 * 4);
          fVar237 = *(float *)*pauVar11;
          fVar239 = *(float *)(*pauVar11 + 4);
          fVar242 = *(float *)(*pauVar11 + 8);
          fVar250 = *(float *)(*pauVar11 + 0xc);
          fVar251 = *(float *)(*pauVar11 + 0x10);
          fVar252 = *(float *)(*pauVar11 + 0x14);
          fVar323 = *(float *)(*pauVar11 + 0x18);
          auVar119 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21b3c74 + lVar134 * 4);
          fVar273 = *(float *)*pauVar11;
          fVar218 = *(float *)(*pauVar11 + 4);
          fVar314 = *(float *)(*pauVar11 + 8);
          fVar281 = *(float *)(*pauVar11 + 0xc);
          fVar283 = *(float *)(*pauVar11 + 0x10);
          fVar220 = *(float *)(*pauVar11 + 0x14);
          fVar315 = *(float *)(*pauVar11 + 0x18);
          auVar118 = *pauVar11;
          pfVar1 = (float *)(lVar20 + 0x21b40f8 + lVar134 * 4);
          fVar286 = *pfVar1;
          fVar288 = pfVar1[1];
          fVar222 = pfVar1[2];
          fVar316 = pfVar1[3];
          fVar290 = pfVar1[4];
          fVar292 = pfVar1[5];
          fVar224 = pfVar1[6];
          fVar151 = auVar212._28_4_;
          fVar199 = fVar151 + auVar193._28_4_;
          fVar161 = fVar151 + fVar151 + fStack_4a4;
          fVar241 = fVar151 + fVar199;
          auVar211._0_4_ =
               (float)local_360._0_4_ * fVar318 +
               (float)local_340._0_4_ * fVar237 +
               (float)local_680._0_4_ * fVar273 + (float)local_4c0._0_4_ * fVar286;
          auVar211._4_4_ =
               (float)local_360._4_4_ * fVar200 +
               (float)local_340._4_4_ * fVar239 +
               (float)local_680._4_4_ * fVar218 + (float)local_4c0._4_4_ * fVar288;
          auVar211._8_4_ =
               fStack_358 * fVar213 +
               fStack_338 * fVar242 + fStack_678 * fVar314 + fStack_4b8 * fVar222;
          auVar211._12_4_ =
               fStack_354 * fVar214 +
               fStack_334 * fVar250 + fStack_674 * fVar281 + fStack_4b4 * fVar316;
          auVar211._16_4_ =
               fStack_350 * fVar216 +
               fStack_330 * fVar251 + fStack_670 * fVar283 + fStack_4b0 * fVar290;
          auVar211._20_4_ =
               fStack_34c * fVar225 +
               fStack_32c * fVar252 + fStack_66c * fVar220 + fStack_4ac * fVar292;
          auVar211._24_4_ =
               fStack_348 * fVar235 +
               fStack_328 * fVar323 + fStack_668 * fVar315 + fStack_4a8 * fVar224;
          auVar211._28_4_ = fVar199 + fVar161;
          auVar212 = ZEXT3264(auVar211);
          local_760._0_4_ =
               fVar347 * fVar318 +
               (float)local_100._0_4_ * fVar237 + fVar181 * fVar273 + fVar331 * fVar286;
          local_760._4_4_ =
               fVar351 * fVar200 +
               (float)local_100._4_4_ * fVar239 + fVar194 * fVar218 + fVar337 * fVar288;
          local_760._8_4_ =
               fVar352 * fVar213 + fStack_f8 * fVar242 + fVar195 * fVar314 + fVar338 * fVar222;
          local_760._12_4_ =
               fVar353 * fVar214 + fStack_f4 * fVar250 + fVar197 * fVar281 + fVar340 * fVar316;
          local_760._16_4_ =
               fVar347 * fVar216 + fStack_f0 * fVar251 + fVar181 * fVar283 + fVar182 * fVar290;
          local_760._20_4_ =
               fVar351 * fVar225 + fStack_ec * fVar252 + fVar194 * fVar220 + fVar198 * fVar292;
          local_760._24_4_ =
               fVar352 * fVar235 + fStack_e8 * fVar323 + fVar195 * fVar315 + fVar196 * fVar224;
          local_760._28_4_ = fVar161 + fVar151 + fVar151 + auVar234._28_4_;
          fVar199 = fVar318 * (float)local_160._0_4_ +
                    fVar237 * (float)local_140._0_4_ +
                    (float)local_80._0_4_ * fVar273 + fVar286 * (float)local_120._0_4_;
          fVar151 = fVar200 * (float)local_160._4_4_ +
                    fVar239 * (float)local_140._4_4_ +
                    (float)local_80._4_4_ * fVar218 + fVar288 * (float)local_120._4_4_;
          fVar154 = fVar213 * fStack_158 +
                    fVar242 * fStack_138 + fStack_78 * fVar314 + fVar222 * fStack_118;
          fVar157 = fVar214 * fStack_154 +
                    fVar250 * fStack_134 + fStack_74 * fVar281 + fVar316 * fStack_114;
          fVar158 = fVar216 * fStack_150 +
                    fVar251 * fStack_130 + fStack_70 * fVar283 + fVar290 * fStack_110;
          fVar159 = fVar225 * fStack_14c +
                    fVar252 * fStack_12c + fStack_6c * fVar220 + fVar292 * fStack_10c;
          fVar160 = fVar235 * fStack_148 +
                    fVar323 * fStack_128 + fStack_68 * fVar315 + fVar224 * fStack_108;
          fVar161 = fVar161 + fVar241;
          auVar121 = *(undefined1 (*) [24])(catmullrom_basis1 + lVar134 * 4 + lVar20);
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21b5c10 + lVar134 * 4);
          fVar318 = *(float *)*pauVar11;
          fVar200 = *(float *)(*pauVar11 + 4);
          fVar213 = *(float *)(*pauVar11 + 8);
          fVar214 = *(float *)(*pauVar11 + 0xc);
          fVar216 = *(float *)(*pauVar11 + 0x10);
          fVar225 = *(float *)(*pauVar11 + 0x14);
          fVar235 = *(float *)(*pauVar11 + 0x18);
          auVar123 = *pauVar11;
          pfVar1 = (float *)(lVar20 + 0x21b6094 + lVar134 * 4);
          fVar237 = *pfVar1;
          fVar239 = pfVar1[1];
          fVar242 = pfVar1[2];
          fVar250 = pfVar1[3];
          fVar251 = pfVar1[4];
          fVar252 = pfVar1[5];
          fVar323 = pfVar1[6];
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21b6518 + lVar134 * 4);
          fVar273 = *(float *)*pauVar11;
          fVar218 = *(float *)(*pauVar11 + 4);
          fVar314 = *(float *)(*pauVar11 + 8);
          fVar281 = *(float *)(*pauVar11 + 0xc);
          fVar283 = *(float *)(*pauVar11 + 0x10);
          fVar220 = *(float *)(*pauVar11 + 0x14);
          fVar315 = *(float *)(*pauVar11 + 0x18);
          auVar122 = *pauVar11;
          fVar263 = fStack_4a4 + *(float *)pauVar11[1];
          fVar241 = fStack_4a4 + fStack_4a4 + fVar241;
          local_7e0._0_4_ = auVar121._0_4_;
          local_7e0._4_4_ = auVar121._4_4_;
          fStack_7d8 = auVar121._8_4_;
          fStack_7d4 = auVar121._12_4_;
          fStack_7d0 = auVar121._16_4_;
          fStack_7cc = auVar121._20_4_;
          fStack_7c8 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(catmullrom_basis1 + lVar134 * 4 + lVar20))[1];
          auVar333._0_4_ =
               (float)local_360._0_4_ * (float)local_7e0 +
               (float)local_340._0_4_ * fVar318 +
               (float)local_680._0_4_ * fVar237 + (float)local_4c0._0_4_ * fVar273;
          auVar333._4_4_ =
               (float)local_360._4_4_ * local_7e0._4_4_ +
               (float)local_340._4_4_ * fVar200 +
               (float)local_680._4_4_ * fVar239 + (float)local_4c0._4_4_ * fVar218;
          auVar333._8_4_ =
               fStack_358 * fStack_7d8 +
               fStack_338 * fVar213 + fStack_678 * fVar242 + fStack_4b8 * fVar314;
          auVar333._12_4_ =
               fStack_354 * fStack_7d4 +
               fStack_334 * fVar214 + fStack_674 * fVar250 + fStack_4b4 * fVar281;
          auVar333._16_4_ =
               fStack_350 * fStack_7d0 +
               fStack_330 * fVar216 + fStack_670 * fVar251 + fStack_4b0 * fVar283;
          auVar333._20_4_ =
               fStack_34c * fStack_7cc +
               fStack_32c * fVar225 + fStack_66c * fVar252 + fStack_4ac * fVar220;
          auVar333._24_4_ =
               fStack_348 * fStack_7c8 +
               fStack_328 * fVar235 + fStack_668 * fVar323 + fStack_4a8 * fVar315;
          auVar333._28_4_ = fVar263 + fVar241;
          auVar248._0_4_ =
               fVar347 * (float)local_7e0 +
               (float)local_100._0_4_ * fVar318 + fVar181 * fVar237 + fVar331 * fVar273;
          auVar248._4_4_ =
               fVar351 * local_7e0._4_4_ +
               (float)local_100._4_4_ * fVar200 + fVar194 * fVar239 + fVar337 * fVar218;
          auVar248._8_4_ =
               fVar352 * fStack_7d8 + fStack_f8 * fVar213 + fVar195 * fVar242 + fVar338 * fVar314;
          auVar248._12_4_ =
               fVar353 * fStack_7d4 + fStack_f4 * fVar214 + fVar197 * fVar250 + fVar340 * fVar281;
          auVar248._16_4_ =
               fVar347 * fStack_7d0 + fStack_f0 * fVar216 + fVar181 * fVar251 + fVar182 * fVar283;
          auVar248._20_4_ =
               fVar351 * fStack_7cc + fStack_ec * fVar225 + fVar194 * fVar252 + fVar198 * fVar220;
          auVar248._24_4_ =
               fVar352 * fStack_7c8 + fStack_e8 * fVar235 + fVar195 * fVar323 + fVar196 * fVar315;
          auVar248._28_4_ = fVar241 + fStack_4a4 + fStack_4a4 + *(float *)pauVar9[1];
          auVar298._0_4_ =
               fVar318 * (float)local_140._0_4_ +
               (float)local_80._0_4_ * fVar237 + fVar273 * (float)local_120._0_4_ +
               (float)local_7e0 * (float)local_160._0_4_;
          auVar298._4_4_ =
               fVar200 * (float)local_140._4_4_ +
               (float)local_80._4_4_ * fVar239 + fVar218 * (float)local_120._4_4_ +
               local_7e0._4_4_ * (float)local_160._4_4_;
          auVar298._8_4_ =
               fVar213 * fStack_138 + fStack_78 * fVar242 + fVar314 * fStack_118 +
               fStack_7d8 * fStack_158;
          auVar298._12_4_ =
               fVar214 * fStack_134 + fStack_74 * fVar250 + fVar281 * fStack_114 +
               fStack_7d4 * fStack_154;
          auVar298._16_4_ =
               fVar216 * fStack_130 + fStack_70 * fVar251 + fVar283 * fStack_110 +
               fStack_7d0 * fStack_150;
          auVar298._20_4_ =
               fVar225 * fStack_12c + fStack_6c * fVar252 + fVar220 * fStack_10c +
               fStack_7cc * fStack_14c;
          auVar298._24_4_ =
               fVar235 * fStack_128 + fStack_68 * fVar323 + fVar315 * fStack_108 +
               fStack_7c8 * fStack_148;
          auVar298._28_4_ = fStack_4a4 + fVar263 + fVar241;
          auVar176 = vsubps_avx(auVar333,auVar211);
          auVar31 = vsubps_avx(auVar248,local_760);
          fVar182 = auVar176._0_4_;
          fVar198 = auVar176._4_4_;
          auVar67._4_4_ = fVar198 * local_760._4_4_;
          auVar67._0_4_ = fVar182 * local_760._0_4_;
          fVar196 = auVar176._8_4_;
          auVar67._8_4_ = fVar196 * local_760._8_4_;
          fVar318 = auVar176._12_4_;
          auVar67._12_4_ = fVar318 * local_760._12_4_;
          fVar200 = auVar176._16_4_;
          auVar67._16_4_ = fVar200 * local_760._16_4_;
          fVar213 = auVar176._20_4_;
          auVar67._20_4_ = fVar213 * local_760._20_4_;
          fVar214 = auVar176._24_4_;
          auVar67._24_4_ = fVar214 * local_760._24_4_;
          auVar67._28_4_ = fVar241;
          fVar216 = auVar31._0_4_;
          fVar225 = auVar31._4_4_;
          auVar68._4_4_ = fVar225 * auVar211._4_4_;
          auVar68._0_4_ = fVar216 * auVar211._0_4_;
          fVar235 = auVar31._8_4_;
          auVar68._8_4_ = fVar235 * auVar211._8_4_;
          fVar273 = auVar31._12_4_;
          auVar68._12_4_ = fVar273 * auVar211._12_4_;
          fVar218 = auVar31._16_4_;
          auVar68._16_4_ = fVar218 * auVar211._16_4_;
          fVar314 = auVar31._20_4_;
          auVar68._20_4_ = fVar314 * auVar211._20_4_;
          fVar281 = auVar31._24_4_;
          auVar68._24_4_ = fVar281 * auVar211._24_4_;
          auVar68._28_4_ = auVar248._28_4_;
          auVar247 = vsubps_avx(auVar67,auVar68);
          auVar112._4_4_ = fVar151;
          auVar112._0_4_ = fVar199;
          auVar112._8_4_ = fVar154;
          auVar112._12_4_ = fVar157;
          auVar112._16_4_ = fVar158;
          auVar112._20_4_ = fVar159;
          auVar112._24_4_ = fVar160;
          auVar112._28_4_ = fVar161;
          auVar297 = vmaxps_avx(auVar112,auVar298);
          auVar69._4_4_ = auVar297._4_4_ * auVar297._4_4_ * (fVar198 * fVar198 + fVar225 * fVar225);
          auVar69._0_4_ = auVar297._0_4_ * auVar297._0_4_ * (fVar182 * fVar182 + fVar216 * fVar216);
          auVar69._8_4_ = auVar297._8_4_ * auVar297._8_4_ * (fVar196 * fVar196 + fVar235 * fVar235);
          auVar69._12_4_ =
               auVar297._12_4_ * auVar297._12_4_ * (fVar318 * fVar318 + fVar273 * fVar273);
          auVar69._16_4_ =
               auVar297._16_4_ * auVar297._16_4_ * (fVar200 * fVar200 + fVar218 * fVar218);
          auVar69._20_4_ =
               auVar297._20_4_ * auVar297._20_4_ * (fVar213 * fVar213 + fVar314 * fVar314);
          auVar69._24_4_ =
               auVar297._24_4_ * auVar297._24_4_ * (fVar214 * fVar214 + fVar281 * fVar281);
          auVar69._28_4_ = fVar263 + auVar248._28_4_;
          auVar70._4_4_ = auVar247._4_4_ * auVar247._4_4_;
          auVar70._0_4_ = auVar247._0_4_ * auVar247._0_4_;
          auVar70._8_4_ = auVar247._8_4_ * auVar247._8_4_;
          auVar70._12_4_ = auVar247._12_4_ * auVar247._12_4_;
          auVar70._16_4_ = auVar247._16_4_ * auVar247._16_4_;
          auVar70._20_4_ = auVar247._20_4_ * auVar247._20_4_;
          auVar70._24_4_ = auVar247._24_4_ * auVar247._24_4_;
          auVar70._28_4_ = auVar247._28_4_;
          auVar234 = ZEXT3264(auVar70);
          auVar297 = vcmpps_avx(auVar70,auVar69,2);
          local_280 = (uint)lVar134;
          auVar204 = vpshufd_avx(ZEXT416(local_280),0);
          auVar140 = vpor_avx(auVar204,_DAT_01f7fcf0);
          auVar204 = vpor_avx(auVar204,_DAT_01fafea0);
          auVar140 = vpcmpgtd_avx(_local_600,auVar140);
          auVar204 = vpcmpgtd_avx(_local_600,auVar204);
          auVar192._16_16_ = auVar204;
          auVar192._0_16_ = auVar140;
          auVar193 = ZEXT3264(auVar192);
          auVar247 = auVar192 & auVar297;
          fVar331 = (float)local_780._0_4_;
          fVar337 = (float)local_780._4_4_;
          fVar338 = fStack_778;
          fVar340 = fStack_774;
          fVar182 = fStack_770;
          fVar198 = fStack_76c;
          fVar196 = fStack_768;
          if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar247 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar247 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar247 >> 0x7f,0) != '\0') ||
                (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar247 >> 0xbf,0) != '\0') ||
              (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar247[0x1f] < '\0') {
            local_5c0._0_4_ = auVar123._0_4_;
            local_5c0._4_4_ = auVar123._4_4_;
            fStack_5b8 = auVar123._8_4_;
            fStack_5b4 = auVar123._12_4_;
            fStack_5b0 = auVar123._16_4_;
            fStack_5ac = auVar123._20_4_;
            fStack_5a8 = auVar123._24_4_;
            local_5e0._0_4_ = auVar122._0_4_;
            local_5e0._4_4_ = auVar122._4_4_;
            fStack_5d8 = auVar122._8_4_;
            fStack_5d4 = auVar122._12_4_;
            fStack_5d0 = auVar122._16_4_;
            fStack_5cc = auVar122._20_4_;
            fStack_5c8 = auVar122._24_4_;
            local_5e0._0_4_ =
                 (float)local_7e0 * (float)local_380._0_4_ +
                 (float)local_320._0_4_ * (float)local_5c0._0_4_ +
                 (float)local_a0._0_4_ * fVar237 + (float)local_720._0_4_ * (float)local_5e0._0_4_;
            local_5e0._4_4_ =
                 local_7e0._4_4_ * (float)local_380._4_4_ +
                 (float)local_320._4_4_ * (float)local_5c0._4_4_ +
                 (float)local_a0._4_4_ * fVar239 + (float)local_720._4_4_ * (float)local_5e0._4_4_;
            fStack_5d8 = fStack_7d8 * fStack_378 +
                         fStack_318 * fStack_5b8 + fStack_98 * fVar242 + fStack_718 * fStack_5d8;
            fStack_5d4 = fStack_7d4 * fStack_374 +
                         fStack_314 * fStack_5b4 + fStack_94 * fVar250 + fStack_714 * fStack_5d4;
            fStack_5d0 = fStack_7d0 * fStack_370 +
                         fStack_310 * fStack_5b0 + fStack_90 * fVar251 + fStack_710 * fStack_5d0;
            fStack_5cc = fStack_7cc * fStack_36c +
                         fStack_30c * fStack_5ac + fStack_8c * fVar252 + fStack_70c * fStack_5cc;
            fStack_5c8 = fStack_7c8 * fStack_368 +
                         fStack_308 * fStack_5a8 + fStack_88 * fVar323 + fStack_708 * fStack_5c8;
            fStack_5c4 = auVar298._28_4_ + pfVar1[7] + auVar297._28_4_ + 0.0;
            local_580._0_4_ = auVar119._0_4_;
            local_580._4_4_ = auVar119._4_4_;
            fStack_578 = auVar119._8_4_;
            fStack_574 = auVar119._12_4_;
            auStack_570._0_4_ = auVar119._16_4_;
            auStack_570._4_4_ = auVar119._20_4_;
            fStack_568 = auVar119._24_4_;
            local_5a0 = auVar118._0_4_;
            auStack_59c._0_4_ = auVar118._4_4_;
            auStack_59c._4_4_ = auVar118._8_4_;
            fStack_594 = auVar118._12_4_;
            fStack_590 = auVar118._16_4_;
            fStack_58c = auVar118._20_4_;
            fStack_588 = auVar118._24_4_;
            pfVar1 = (float *)(lVar20 + 0x21b4e84 + lVar134 * 4);
            fVar318 = *pfVar1;
            fVar200 = pfVar1[1];
            fVar213 = pfVar1[2];
            fVar214 = pfVar1[3];
            fVar216 = pfVar1[4];
            fVar225 = pfVar1[5];
            fVar235 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21b5308 + lVar134 * 4);
            fVar237 = *pfVar2;
            fVar239 = pfVar2[1];
            fVar242 = pfVar2[2];
            fVar250 = pfVar2[3];
            fVar251 = pfVar2[4];
            fVar252 = pfVar2[5];
            fVar323 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x21b4a00 + lVar134 * 4);
            fVar273 = *pfVar3;
            fVar218 = pfVar3[1];
            fVar314 = pfVar3[2];
            fVar281 = pfVar3[3];
            fVar283 = pfVar3[4];
            fVar220 = pfVar3[5];
            fVar315 = pfVar3[6];
            fVar162 = pfVar1[7] + pfVar2[7];
            fStack_484 = pfVar2[7] + fVar197 + 0.0;
            fVar264 = fVar197 + auVar333._28_4_ + fVar197 + 0.0;
            pfVar1 = (float *)(lVar20 + 0x21b457c + lVar134 * 4);
            fVar241 = *pfVar1;
            fVar263 = pfVar1[1];
            fVar215 = pfVar1[2];
            fVar217 = pfVar1[3];
            fVar219 = pfVar1[4];
            fVar221 = pfVar1[5];
            fVar223 = pfVar1[6];
            local_4e0 = (float)local_360._0_4_ * fVar241 +
                        (float)local_340._0_4_ * fVar273 +
                        fVar318 * (float)local_680._0_4_ + (float)local_4c0._0_4_ * fVar237;
            fStack_4dc = (float)local_360._4_4_ * fVar263 +
                         (float)local_340._4_4_ * fVar218 +
                         fVar200 * (float)local_680._4_4_ + (float)local_4c0._4_4_ * fVar239;
            fStack_4d8 = fStack_358 * fVar215 +
                         fStack_338 * fVar314 + fVar213 * fStack_678 + fStack_4b8 * fVar242;
            fStack_4d4 = fStack_354 * fVar217 +
                         fStack_334 * fVar281 + fVar214 * fStack_674 + fStack_4b4 * fVar250;
            fStack_4d0 = fStack_350 * fVar219 +
                         fStack_330 * fVar283 + fVar216 * fStack_670 + fStack_4b0 * fVar251;
            fStack_4cc = fStack_34c * fVar221 +
                         fStack_32c * fVar220 + fVar225 * fStack_66c + fStack_4ac * fVar252;
            fStack_4c8 = fStack_348 * fVar223 +
                         fStack_328 * fVar315 + fVar235 * fStack_668 + fStack_4a8 * fVar323;
            fStack_4c4 = fVar162 + fStack_484;
            local_4a0 = fVar241 * fVar347 +
                        fVar318 * fVar181 + (float)local_780._0_4_ * fVar237 +
                        (float)local_100._0_4_ * fVar273;
            fStack_49c = fVar263 * fVar351 +
                         fVar200 * fVar194 + (float)local_780._4_4_ * fVar239 +
                         (float)local_100._4_4_ * fVar218;
            fStack_498 = fVar215 * fVar352 +
                         fVar213 * fVar195 + fStack_778 * fVar242 + fStack_f8 * fVar314;
            fStack_494 = fVar217 * fVar353 +
                         fVar214 * fVar197 + fStack_774 * fVar250 + fStack_f4 * fVar281;
            fStack_490 = fVar219 * fVar347 +
                         fVar216 * fVar181 + fStack_770 * fVar251 + fStack_f0 * fVar283;
            fStack_48c = fVar221 * fVar351 +
                         fVar225 * fVar194 + fStack_76c * fVar252 + fStack_ec * fVar220;
            fStack_488 = fVar223 * fVar352 +
                         fVar235 * fVar195 + fStack_768 * fVar323 + fStack_e8 * fVar315;
            fStack_484 = fStack_484 + fVar264;
            auVar334._0_4_ =
                 fVar273 * (float)local_320._0_4_ +
                 (float)local_a0._0_4_ * fVar318 + (float)local_720._0_4_ * fVar237 +
                 fVar241 * (float)local_380._0_4_;
            auVar334._4_4_ =
                 fVar218 * (float)local_320._4_4_ +
                 (float)local_a0._4_4_ * fVar200 + (float)local_720._4_4_ * fVar239 +
                 fVar263 * (float)local_380._4_4_;
            auVar334._8_4_ =
                 fVar314 * fStack_318 + fStack_98 * fVar213 + fStack_718 * fVar242 +
                 fVar215 * fStack_378;
            auVar334._12_4_ =
                 fVar281 * fStack_314 + fStack_94 * fVar214 + fStack_714 * fVar250 +
                 fVar217 * fStack_374;
            auVar334._16_4_ =
                 fVar283 * fStack_310 + fStack_90 * fVar216 + fStack_710 * fVar251 +
                 fVar219 * fStack_370;
            auVar334._20_4_ =
                 fVar220 * fStack_30c + fStack_8c * fVar225 + fStack_70c * fVar252 +
                 fVar221 * fStack_36c;
            auVar334._24_4_ =
                 fVar315 * fStack_308 + fStack_88 * fVar235 + fStack_708 * fVar323 +
                 fVar223 * fStack_368;
            auVar334._28_4_ = pfVar3[7] + fVar162 + fVar264;
            pfVar1 = (float *)(lVar20 + 0x21b72a4 + lVar134 * 4);
            fVar318 = *pfVar1;
            fVar200 = pfVar1[1];
            fVar213 = pfVar1[2];
            fVar214 = pfVar1[3];
            fVar216 = pfVar1[4];
            fVar225 = pfVar1[5];
            fVar235 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21b7728 + lVar134 * 4);
            fVar237 = *pfVar2;
            fVar239 = pfVar2[1];
            fVar242 = pfVar2[2];
            fVar250 = pfVar2[3];
            fVar251 = pfVar2[4];
            fVar252 = pfVar2[5];
            fVar323 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x21b6e20 + lVar134 * 4);
            fVar273 = *pfVar3;
            fVar218 = pfVar3[1];
            fVar314 = pfVar3[2];
            fVar281 = pfVar3[3];
            fVar283 = pfVar3[4];
            fVar220 = pfVar3[5];
            fVar315 = pfVar3[6];
            pfVar4 = (float *)(lVar20 + 0x21b699c + lVar134 * 4);
            fVar241 = *pfVar4;
            fVar263 = pfVar4[1];
            fVar215 = pfVar4[2];
            fVar217 = pfVar4[3];
            fVar219 = pfVar4[4];
            fVar221 = pfVar4[5];
            fVar223 = pfVar4[6];
            auVar299._0_4_ =
                 fVar241 * (float)local_360._0_4_ +
                 (float)local_340._0_4_ * fVar273 +
                 fVar318 * (float)local_680._0_4_ + (float)local_4c0._0_4_ * fVar237;
            auVar299._4_4_ =
                 fVar263 * (float)local_360._4_4_ +
                 (float)local_340._4_4_ * fVar218 +
                 fVar200 * (float)local_680._4_4_ + (float)local_4c0._4_4_ * fVar239;
            auVar299._8_4_ =
                 fVar215 * fStack_358 +
                 fStack_338 * fVar314 + fVar213 * fStack_678 + fStack_4b8 * fVar242;
            auVar299._12_4_ =
                 fVar217 * fStack_354 +
                 fStack_334 * fVar281 + fVar214 * fStack_674 + fStack_4b4 * fVar250;
            auVar299._16_4_ =
                 fVar219 * fStack_350 +
                 fStack_330 * fVar283 + fVar216 * fStack_670 + fStack_4b0 * fVar251;
            auVar299._20_4_ =
                 fVar221 * fStack_34c +
                 fStack_32c * fVar220 + fVar225 * fStack_66c + fStack_4ac * fVar252;
            auVar299._24_4_ =
                 fVar223 * fStack_348 +
                 fStack_328 * fVar315 + fVar235 * fStack_668 + fStack_4a8 * fVar323;
            auVar299._28_4_ = fStack_344 + fStack_344 + fStack_4a4 + fStack_484;
            auVar328._0_4_ =
                 fVar241 * fVar347 +
                 fVar273 * (float)local_100._0_4_ +
                 fVar318 * fVar181 + fVar237 * (float)local_780._0_4_;
            auVar328._4_4_ =
                 fVar263 * fVar351 +
                 fVar218 * (float)local_100._4_4_ +
                 fVar200 * fVar194 + fVar239 * (float)local_780._4_4_;
            auVar328._8_4_ =
                 fVar215 * fVar352 + fVar314 * fStack_f8 + fVar213 * fVar195 + fVar242 * fStack_778;
            auVar328._12_4_ =
                 fVar217 * fVar353 + fVar281 * fStack_f4 + fVar214 * fVar197 + fVar250 * fStack_774;
            auVar328._16_4_ =
                 fVar219 * fVar347 + fVar283 * fStack_f0 + fVar216 * fVar181 + fVar251 * fStack_770;
            auVar328._20_4_ =
                 fVar221 * fVar351 + fVar220 * fStack_ec + fVar225 * fVar194 + fVar252 * fStack_76c;
            auVar328._24_4_ =
                 fVar223 * fVar352 + fVar315 * fStack_e8 + fVar235 * fVar195 + fVar323 * fStack_768;
            auVar328._28_4_ = fStack_344 + fStack_344 + fStack_e4 + fStack_484;
            auVar249._8_4_ = 0x7fffffff;
            auVar249._0_8_ = 0x7fffffff7fffffff;
            auVar249._12_4_ = 0x7fffffff;
            auVar249._16_4_ = 0x7fffffff;
            auVar249._20_4_ = 0x7fffffff;
            auVar249._24_4_ = 0x7fffffff;
            auVar249._28_4_ = 0x7fffffff;
            auVar116._4_4_ = fStack_4dc;
            auVar116._0_4_ = local_4e0;
            auVar116._8_4_ = fStack_4d8;
            auVar116._12_4_ = fStack_4d4;
            auVar116._16_4_ = fStack_4d0;
            auVar116._20_4_ = fStack_4cc;
            auVar116._24_4_ = fStack_4c8;
            auVar116._28_4_ = fStack_4c4;
            auVar247 = vandps_avx(auVar116,auVar249);
            auVar117._4_4_ = fStack_49c;
            auVar117._0_4_ = local_4a0;
            auVar117._8_4_ = fStack_498;
            auVar117._12_4_ = fStack_494;
            auVar117._16_4_ = fStack_490;
            auVar117._20_4_ = fStack_48c;
            auVar117._24_4_ = fStack_488;
            auVar117._28_4_ = fStack_484;
            auVar39 = vandps_avx(auVar117,auVar249);
            auVar39 = vmaxps_avx(auVar247,auVar39);
            auVar247 = vandps_avx(auVar334,auVar249);
            auVar39 = vmaxps_avx(auVar39,auVar247);
            auVar39 = vcmpps_avx(auVar39,_local_3a0,1);
            auVar21 = vblendvps_avx(auVar116,auVar176,auVar39);
            auVar146._0_4_ =
                 fVar241 * (float)local_380._0_4_ +
                 fVar273 * (float)local_320._0_4_ +
                 fVar237 * (float)local_720._0_4_ + (float)local_a0._0_4_ * fVar318;
            auVar146._4_4_ =
                 fVar263 * (float)local_380._4_4_ +
                 fVar218 * (float)local_320._4_4_ +
                 fVar239 * (float)local_720._4_4_ + (float)local_a0._4_4_ * fVar200;
            auVar146._8_4_ =
                 fVar215 * fStack_378 +
                 fVar314 * fStack_318 + fVar242 * fStack_718 + fStack_98 * fVar213;
            auVar146._12_4_ =
                 fVar217 * fStack_374 +
                 fVar281 * fStack_314 + fVar250 * fStack_714 + fStack_94 * fVar214;
            auVar146._16_4_ =
                 fVar219 * fStack_370 +
                 fVar283 * fStack_310 + fVar251 * fStack_710 + fStack_90 * fVar216;
            auVar146._20_4_ =
                 fVar221 * fStack_36c +
                 fVar220 * fStack_30c + fVar252 * fStack_70c + fStack_8c * fVar225;
            auVar146._24_4_ =
                 fVar223 * fStack_368 +
                 fVar315 * fStack_308 + fVar323 * fStack_708 + fStack_88 * fVar235;
            auVar146._28_4_ = auVar247._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar171 = vblendvps_avx(auVar117,auVar31,auVar39);
            auVar247 = vandps_avx(auVar299,auVar249);
            auVar39 = vandps_avx(auVar328,auVar249);
            auVar39 = vmaxps_avx(auVar247,auVar39);
            auVar247 = vandps_avx(auVar146,auVar249);
            auVar247 = vmaxps_avx(auVar39,auVar247);
            local_740._0_4_ = auVar120._0_4_;
            local_740._4_4_ = auVar120._4_4_;
            uStack_738._0_4_ = auVar120._8_4_;
            uStack_738._4_4_ = auVar120._12_4_;
            auStack_730._0_4_ = auVar120._16_4_;
            auStack_730._4_4_ = auVar120._20_4_;
            fStack_728 = auVar120._24_4_;
            auVar247 = vcmpps_avx(auVar247,_local_3a0,1);
            auVar176 = vblendvps_avx(auVar299,auVar176,auVar247);
            auVar147._0_4_ =
                 (float)local_380._0_4_ * (float)local_740._0_4_ +
                 (float)local_320._0_4_ * (float)local_580._0_4_ +
                 (float)local_a0._0_4_ * (float)local_5a0 + (float)local_720._0_4_ * fVar286;
            auVar147._4_4_ =
                 (float)local_380._4_4_ * (float)local_740._4_4_ +
                 (float)local_320._4_4_ * (float)local_580._4_4_ +
                 (float)local_a0._4_4_ * (float)auStack_59c._0_4_ + (float)local_720._4_4_ * fVar288
            ;
            auVar147._8_4_ =
                 fStack_378 * (float)uStack_738 +
                 fStack_318 * fStack_578 +
                 fStack_98 * (float)auStack_59c._4_4_ + fStack_718 * fVar222;
            auVar147._12_4_ =
                 fStack_374 * uStack_738._4_4_ +
                 fStack_314 * fStack_574 + fStack_94 * fStack_594 + fStack_714 * fVar316;
            auVar147._16_4_ =
                 fStack_370 * (float)auStack_730._0_4_ +
                 fStack_310 * (float)auStack_570._0_4_ +
                 fStack_90 * fStack_590 + fStack_710 * fVar290;
            auVar147._20_4_ =
                 fStack_36c * (float)auStack_730._4_4_ +
                 fStack_30c * (float)auStack_570._4_4_ +
                 fStack_8c * fStack_58c + fStack_70c * fVar292;
            auVar147._24_4_ =
                 fStack_368 * fStack_728 +
                 fStack_308 * fStack_568 + fStack_88 * fStack_588 + fStack_708 * fVar224;
            auVar147._28_4_ = auVar39._28_4_ + fStack_5c4 + auVar297._28_4_ + 0.0;
            auVar247 = vblendvps_avx(auVar328,auVar31,auVar247);
            fVar162 = auVar21._0_4_;
            fVar264 = auVar21._4_4_;
            fVar285 = auVar21._8_4_;
            fVar287 = auVar21._12_4_;
            fVar289 = auVar21._16_4_;
            fVar291 = auVar21._20_4_;
            fVar293 = auVar21._24_4_;
            fVar302 = auVar21._28_4_;
            fVar273 = auVar176._0_4_;
            fVar314 = auVar176._4_4_;
            fVar283 = auVar176._8_4_;
            fVar315 = auVar176._12_4_;
            fVar288 = auVar176._16_4_;
            fVar316 = auVar176._20_4_;
            fVar292 = auVar176._24_4_;
            fVar318 = auVar171._0_4_;
            fVar213 = auVar171._4_4_;
            fVar216 = auVar171._8_4_;
            fVar235 = auVar171._12_4_;
            fVar239 = auVar171._16_4_;
            fVar250 = auVar171._20_4_;
            fVar252 = auVar171._24_4_;
            auVar310._0_4_ = fVar318 * fVar318 + fVar162 * fVar162;
            auVar310._4_4_ = fVar213 * fVar213 + fVar264 * fVar264;
            auVar310._8_4_ = fVar216 * fVar216 + fVar285 * fVar285;
            auVar310._12_4_ = fVar235 * fVar235 + fVar287 * fVar287;
            auVar310._16_4_ = fVar239 * fVar239 + fVar289 * fVar289;
            auVar310._20_4_ = fVar250 * fVar250 + fVar291 * fVar291;
            auVar310._24_4_ = fVar252 * fVar252 + fVar293 * fVar293;
            auVar310._28_4_ = fStack_324 + auVar31._28_4_;
            auVar31 = vrsqrtps_avx(auVar310);
            fVar200 = auVar31._0_4_;
            fVar214 = auVar31._4_4_;
            auVar71._4_4_ = fVar214 * 1.5;
            auVar71._0_4_ = fVar200 * 1.5;
            fVar225 = auVar31._8_4_;
            auVar71._8_4_ = fVar225 * 1.5;
            fVar237 = auVar31._12_4_;
            auVar71._12_4_ = fVar237 * 1.5;
            fVar242 = auVar31._16_4_;
            auVar71._16_4_ = fVar242 * 1.5;
            fVar251 = auVar31._20_4_;
            auVar71._20_4_ = fVar251 * 1.5;
            fVar323 = auVar31._24_4_;
            auVar71._24_4_ = fVar323 * 1.5;
            auVar71._28_4_ = auVar328._28_4_;
            auVar72._4_4_ = fVar214 * fVar214 * fVar214 * auVar310._4_4_ * 0.5;
            auVar72._0_4_ = fVar200 * fVar200 * fVar200 * auVar310._0_4_ * 0.5;
            auVar72._8_4_ = fVar225 * fVar225 * fVar225 * auVar310._8_4_ * 0.5;
            auVar72._12_4_ = fVar237 * fVar237 * fVar237 * auVar310._12_4_ * 0.5;
            auVar72._16_4_ = fVar242 * fVar242 * fVar242 * auVar310._16_4_ * 0.5;
            auVar72._20_4_ = fVar251 * fVar251 * fVar251 * auVar310._20_4_ * 0.5;
            auVar72._24_4_ = fVar323 * fVar323 * fVar323 * auVar310._24_4_ * 0.5;
            auVar72._28_4_ = auVar310._28_4_;
            auVar39 = vsubps_avx(auVar71,auVar72);
            fVar241 = auVar39._0_4_;
            fVar263 = auVar39._4_4_;
            fVar215 = auVar39._8_4_;
            fVar217 = auVar39._12_4_;
            fVar219 = auVar39._16_4_;
            fVar221 = auVar39._20_4_;
            fVar223 = auVar39._24_4_;
            fVar200 = auVar247._0_4_;
            fVar214 = auVar247._4_4_;
            fVar225 = auVar247._8_4_;
            fVar237 = auVar247._12_4_;
            fVar242 = auVar247._16_4_;
            fVar251 = auVar247._20_4_;
            fVar323 = auVar247._24_4_;
            auVar279._0_4_ = fVar200 * fVar200 + fVar273 * fVar273;
            auVar279._4_4_ = fVar214 * fVar214 + fVar314 * fVar314;
            auVar279._8_4_ = fVar225 * fVar225 + fVar283 * fVar283;
            auVar279._12_4_ = fVar237 * fVar237 + fVar315 * fVar315;
            auVar279._16_4_ = fVar242 * fVar242 + fVar288 * fVar288;
            auVar279._20_4_ = fVar251 * fVar251 + fVar316 * fVar316;
            auVar279._24_4_ = fVar323 * fVar323 + fVar292 * fVar292;
            auVar279._28_4_ = auVar31._28_4_ + auVar176._28_4_;
            auVar176 = vrsqrtps_avx(auVar279);
            fVar218 = auVar176._0_4_;
            fVar281 = auVar176._4_4_;
            auVar73._4_4_ = fVar281 * 1.5;
            auVar73._0_4_ = fVar218 * 1.5;
            fVar220 = auVar176._8_4_;
            auVar73._8_4_ = fVar220 * 1.5;
            fVar286 = auVar176._12_4_;
            auVar73._12_4_ = fVar286 * 1.5;
            fVar222 = auVar176._16_4_;
            auVar73._16_4_ = fVar222 * 1.5;
            fVar290 = auVar176._20_4_;
            auVar73._20_4_ = fVar290 * 1.5;
            fVar224 = auVar176._24_4_;
            auVar73._24_4_ = fVar224 * 1.5;
            auVar73._28_4_ = auVar328._28_4_;
            auVar74._4_4_ = fVar281 * fVar281 * fVar281 * auVar279._4_4_ * 0.5;
            auVar74._0_4_ = fVar218 * fVar218 * fVar218 * auVar279._0_4_ * 0.5;
            auVar74._8_4_ = fVar220 * fVar220 * fVar220 * auVar279._8_4_ * 0.5;
            auVar74._12_4_ = fVar286 * fVar286 * fVar286 * auVar279._12_4_ * 0.5;
            auVar74._16_4_ = fVar222 * fVar222 * fVar222 * auVar279._16_4_ * 0.5;
            auVar74._20_4_ = fVar290 * fVar290 * fVar290 * auVar279._20_4_ * 0.5;
            auVar74._24_4_ = fVar224 * fVar224 * fVar224 * auVar279._24_4_ * 0.5;
            auVar74._28_4_ = auVar279._28_4_;
            auVar31 = vsubps_avx(auVar73,auVar74);
            fVar218 = auVar31._0_4_;
            fVar281 = auVar31._4_4_;
            fVar220 = auVar31._8_4_;
            fVar286 = auVar31._12_4_;
            fVar222 = auVar31._16_4_;
            fVar290 = auVar31._20_4_;
            fVar224 = auVar31._24_4_;
            fVar318 = fVar199 * fVar241 * fVar318;
            fVar213 = fVar151 * fVar263 * fVar213;
            auVar75._4_4_ = fVar213;
            auVar75._0_4_ = fVar318;
            fVar216 = fVar154 * fVar215 * fVar216;
            auVar75._8_4_ = fVar216;
            fVar235 = fVar157 * fVar217 * fVar235;
            auVar75._12_4_ = fVar235;
            fVar239 = fVar158 * fVar219 * fVar239;
            auVar75._16_4_ = fVar239;
            fVar250 = fVar159 * fVar221 * fVar250;
            auVar75._20_4_ = fVar250;
            fVar252 = fVar160 * fVar223 * fVar252;
            auVar75._24_4_ = fVar252;
            auVar75._28_4_ = auVar176._28_4_;
            local_740._4_4_ = fVar213 + auVar211._4_4_;
            local_740._0_4_ = fVar318 + auVar211._0_4_;
            uStack_738._0_4_ = fVar216 + auVar211._8_4_;
            uStack_738._4_4_ = fVar235 + auVar211._12_4_;
            auStack_730._0_4_ = fVar239 + auVar211._16_4_;
            auStack_730._4_4_ = fVar250 + auVar211._20_4_;
            fStack_728 = fVar252 + auVar211._24_4_;
            fStack_724 = auVar176._28_4_ + auVar211._28_4_;
            local_660 = fVar199 * fVar241 * -fVar162;
            fStack_65c = fVar151 * fVar263 * -fVar264;
            auVar76._4_4_ = fStack_65c;
            auVar76._0_4_ = local_660;
            fStack_658 = fVar154 * fVar215 * -fVar285;
            auVar76._8_4_ = fStack_658;
            fStack_654 = fVar157 * fVar217 * -fVar287;
            auVar76._12_4_ = fStack_654;
            fStack_650 = fVar158 * fVar219 * -fVar289;
            auVar76._16_4_ = fStack_650;
            fStack_64c = fVar159 * fVar221 * -fVar291;
            auVar76._20_4_ = fStack_64c;
            fStack_648 = fVar160 * fVar223 * -fVar293;
            auVar76._24_4_ = fStack_648;
            auVar76._28_4_ = -fVar302;
            local_660 = local_760._0_4_ + local_660;
            fStack_65c = local_760._4_4_ + fStack_65c;
            fStack_658 = local_760._8_4_ + fStack_658;
            fStack_654 = local_760._12_4_ + fStack_654;
            fStack_650 = local_760._16_4_ + fStack_650;
            fStack_64c = local_760._20_4_ + fStack_64c;
            fStack_648 = local_760._24_4_ + fStack_648;
            fStack_644 = local_760._28_4_ + -fVar302;
            fVar318 = fVar241 * 0.0 * fVar199;
            fVar213 = fVar263 * 0.0 * fVar151;
            auVar77._4_4_ = fVar213;
            auVar77._0_4_ = fVar318;
            fVar216 = fVar215 * 0.0 * fVar154;
            auVar77._8_4_ = fVar216;
            fVar235 = fVar217 * 0.0 * fVar157;
            auVar77._12_4_ = fVar235;
            fVar239 = fVar219 * 0.0 * fVar158;
            auVar77._16_4_ = fVar239;
            fVar250 = fVar221 * 0.0 * fVar159;
            auVar77._20_4_ = fVar250;
            fVar252 = fVar223 * 0.0 * fVar160;
            auVar77._24_4_ = fVar252;
            auVar77._28_4_ = fVar302;
            auVar206 = vsubps_avx(auVar211,auVar75);
            auVar350._0_4_ = fVar318 + auVar147._0_4_;
            auVar350._4_4_ = fVar213 + auVar147._4_4_;
            auVar350._8_4_ = fVar216 + auVar147._8_4_;
            auVar350._12_4_ = fVar235 + auVar147._12_4_;
            auVar350._16_4_ = fVar239 + auVar147._16_4_;
            auVar350._20_4_ = fVar250 + auVar147._20_4_;
            auVar350._24_4_ = fVar252 + auVar147._24_4_;
            auVar350._28_4_ = fVar302 + auVar147._28_4_;
            fVar318 = auVar298._0_4_ * fVar218 * fVar200;
            fVar200 = auVar298._4_4_ * fVar281 * fVar214;
            auVar78._4_4_ = fVar200;
            auVar78._0_4_ = fVar318;
            fVar213 = auVar298._8_4_ * fVar220 * fVar225;
            auVar78._8_4_ = fVar213;
            fVar214 = auVar298._12_4_ * fVar286 * fVar237;
            auVar78._12_4_ = fVar214;
            fVar216 = auVar298._16_4_ * fVar222 * fVar242;
            auVar78._16_4_ = fVar216;
            fVar225 = auVar298._20_4_ * fVar290 * fVar251;
            auVar78._20_4_ = fVar225;
            fVar235 = auVar298._24_4_ * fVar224 * fVar323;
            auVar78._24_4_ = fVar235;
            auVar78._28_4_ = fVar161;
            auVar308 = vsubps_avx(local_760,auVar76);
            auVar335._0_4_ = auVar333._0_4_ + fVar318;
            auVar335._4_4_ = auVar333._4_4_ + fVar200;
            auVar335._8_4_ = auVar333._8_4_ + fVar213;
            auVar335._12_4_ = auVar333._12_4_ + fVar214;
            auVar335._16_4_ = auVar333._16_4_ + fVar216;
            auVar335._20_4_ = auVar333._20_4_ + fVar225;
            auVar335._24_4_ = auVar333._24_4_ + fVar235;
            auVar335._28_4_ = auVar333._28_4_ + fVar161;
            fVar318 = fVar218 * -fVar273 * auVar298._0_4_;
            fVar200 = fVar281 * -fVar314 * auVar298._4_4_;
            auVar79._4_4_ = fVar200;
            auVar79._0_4_ = fVar318;
            fVar213 = fVar220 * -fVar283 * auVar298._8_4_;
            auVar79._8_4_ = fVar213;
            fVar214 = fVar286 * -fVar315 * auVar298._12_4_;
            auVar79._12_4_ = fVar214;
            fVar216 = fVar222 * -fVar288 * auVar298._16_4_;
            auVar79._16_4_ = fVar216;
            fVar225 = fVar290 * -fVar316 * auVar298._20_4_;
            auVar79._20_4_ = fVar225;
            fVar235 = fVar224 * -fVar292 * auVar298._24_4_;
            auVar79._24_4_ = fVar235;
            auVar79._28_4_ = auVar211._28_4_;
            auVar325 = vsubps_avx(auVar147,auVar77);
            auVar232._0_4_ = auVar248._0_4_ + fVar318;
            auVar232._4_4_ = auVar248._4_4_ + fVar200;
            auVar232._8_4_ = auVar248._8_4_ + fVar213;
            auVar232._12_4_ = auVar248._12_4_ + fVar214;
            auVar232._16_4_ = auVar248._16_4_ + fVar216;
            auVar232._20_4_ = auVar248._20_4_ + fVar225;
            auVar232._24_4_ = auVar248._24_4_ + fVar235;
            auVar232._28_4_ = auVar248._28_4_ + auVar211._28_4_;
            fVar318 = fVar218 * 0.0 * auVar298._0_4_;
            fVar200 = fVar281 * 0.0 * auVar298._4_4_;
            auVar80._4_4_ = fVar200;
            auVar80._0_4_ = fVar318;
            fVar213 = fVar220 * 0.0 * auVar298._8_4_;
            auVar80._8_4_ = fVar213;
            fVar214 = fVar286 * 0.0 * auVar298._12_4_;
            auVar80._12_4_ = fVar214;
            fVar216 = fVar222 * 0.0 * auVar298._16_4_;
            auVar80._16_4_ = fVar216;
            fVar225 = fVar290 * 0.0 * auVar298._20_4_;
            auVar80._20_4_ = fVar225;
            fVar235 = fVar224 * 0.0 * auVar298._24_4_;
            auVar80._24_4_ = fVar235;
            auVar80._28_4_ = auVar147._28_4_;
            auVar176 = vsubps_avx(auVar333,auVar78);
            auVar300._0_4_ = (float)local_5e0._0_4_ + fVar318;
            auVar300._4_4_ = (float)local_5e0._4_4_ + fVar200;
            auVar300._8_4_ = fStack_5d8 + fVar213;
            auVar300._12_4_ = fStack_5d4 + fVar214;
            auVar300._16_4_ = fStack_5d0 + fVar216;
            auVar300._20_4_ = fStack_5cc + fVar225;
            auVar300._24_4_ = fStack_5c8 + fVar235;
            auVar300._28_4_ = fStack_5c4 + auVar147._28_4_;
            auVar247 = vsubps_avx(auVar248,auVar79);
            auVar39 = vsubps_avx(_local_5e0,auVar80);
            auVar21 = vsubps_avx(auVar232,auVar308);
            auVar171 = vsubps_avx(auVar300,auVar325);
            auVar81._4_4_ = auVar325._4_4_ * auVar21._4_4_;
            auVar81._0_4_ = auVar325._0_4_ * auVar21._0_4_;
            auVar81._8_4_ = auVar325._8_4_ * auVar21._8_4_;
            auVar81._12_4_ = auVar325._12_4_ * auVar21._12_4_;
            auVar81._16_4_ = auVar325._16_4_ * auVar21._16_4_;
            auVar81._20_4_ = auVar325._20_4_ * auVar21._20_4_;
            auVar81._24_4_ = auVar325._24_4_ * auVar21._24_4_;
            auVar81._28_4_ = auVar328._28_4_;
            auVar82._4_4_ = auVar308._4_4_ * auVar171._4_4_;
            auVar82._0_4_ = auVar308._0_4_ * auVar171._0_4_;
            auVar82._8_4_ = auVar308._8_4_ * auVar171._8_4_;
            auVar82._12_4_ = auVar308._12_4_ * auVar171._12_4_;
            auVar82._16_4_ = auVar308._16_4_ * auVar171._16_4_;
            auVar82._20_4_ = auVar308._20_4_ * auVar171._20_4_;
            auVar82._24_4_ = auVar308._24_4_ * auVar171._24_4_;
            auVar82._28_4_ = auVar248._28_4_;
            auVar207 = vsubps_avx(auVar82,auVar81);
            auVar83._4_4_ = auVar206._4_4_ * auVar171._4_4_;
            auVar83._0_4_ = auVar206._0_4_ * auVar171._0_4_;
            auVar83._8_4_ = auVar206._8_4_ * auVar171._8_4_;
            auVar83._12_4_ = auVar206._12_4_ * auVar171._12_4_;
            auVar83._16_4_ = auVar206._16_4_ * auVar171._16_4_;
            auVar83._20_4_ = auVar206._20_4_ * auVar171._20_4_;
            auVar83._24_4_ = auVar206._24_4_ * auVar171._24_4_;
            auVar83._28_4_ = auVar171._28_4_;
            auVar171 = vsubps_avx(auVar335,auVar206);
            auVar84._4_4_ = auVar325._4_4_ * auVar171._4_4_;
            auVar84._0_4_ = auVar325._0_4_ * auVar171._0_4_;
            auVar84._8_4_ = auVar325._8_4_ * auVar171._8_4_;
            auVar84._12_4_ = auVar325._12_4_ * auVar171._12_4_;
            auVar84._16_4_ = auVar325._16_4_ * auVar171._16_4_;
            auVar84._20_4_ = auVar325._20_4_ * auVar171._20_4_;
            auVar84._24_4_ = auVar325._24_4_ * auVar171._24_4_;
            auVar84._28_4_ = auVar31._28_4_;
            auVar278 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar308._4_4_ * auVar171._4_4_;
            auVar85._0_4_ = auVar308._0_4_ * auVar171._0_4_;
            auVar85._8_4_ = auVar308._8_4_ * auVar171._8_4_;
            auVar85._12_4_ = auVar308._12_4_ * auVar171._12_4_;
            auVar85._16_4_ = auVar308._16_4_ * auVar171._16_4_;
            auVar85._20_4_ = auVar308._20_4_ * auVar171._20_4_;
            auVar85._24_4_ = auVar308._24_4_ * auVar171._24_4_;
            auVar85._28_4_ = auVar31._28_4_;
            auVar86._4_4_ = auVar206._4_4_ * auVar21._4_4_;
            auVar86._0_4_ = auVar206._0_4_ * auVar21._0_4_;
            auVar86._8_4_ = auVar206._8_4_ * auVar21._8_4_;
            auVar86._12_4_ = auVar206._12_4_ * auVar21._12_4_;
            auVar86._16_4_ = auVar206._16_4_ * auVar21._16_4_;
            auVar86._20_4_ = auVar206._20_4_ * auVar21._20_4_;
            auVar86._24_4_ = auVar206._24_4_ * auVar21._24_4_;
            auVar86._28_4_ = auVar21._28_4_;
            auVar31 = vsubps_avx(auVar86,auVar85);
            auVar174._0_4_ = auVar207._0_4_ * 0.0 + auVar31._0_4_ + auVar278._0_4_ * 0.0;
            auVar174._4_4_ = auVar207._4_4_ * 0.0 + auVar31._4_4_ + auVar278._4_4_ * 0.0;
            auVar174._8_4_ = auVar207._8_4_ * 0.0 + auVar31._8_4_ + auVar278._8_4_ * 0.0;
            auVar174._12_4_ = auVar207._12_4_ * 0.0 + auVar31._12_4_ + auVar278._12_4_ * 0.0;
            auVar174._16_4_ = auVar207._16_4_ * 0.0 + auVar31._16_4_ + auVar278._16_4_ * 0.0;
            auVar174._20_4_ = auVar207._20_4_ * 0.0 + auVar31._20_4_ + auVar278._20_4_ * 0.0;
            auVar174._24_4_ = auVar207._24_4_ * 0.0 + auVar31._24_4_ + auVar278._24_4_ * 0.0;
            auVar174._28_4_ = auVar207._28_4_ + auVar31._28_4_ + auVar278._28_4_;
            auVar295 = vcmpps_avx(auVar174,ZEXT832(0) << 0x20,2);
            auVar193 = ZEXT3264(auVar295);
            auVar176 = vblendvps_avx(auVar176,_local_740,auVar295);
            auVar212 = ZEXT3264(auVar176);
            auVar114._4_4_ = fStack_65c;
            auVar114._0_4_ = local_660;
            auVar114._8_4_ = fStack_658;
            auVar114._12_4_ = fStack_654;
            auVar114._16_4_ = fStack_650;
            auVar114._20_4_ = fStack_64c;
            auVar114._24_4_ = fStack_648;
            auVar114._28_4_ = fStack_644;
            auVar31 = vblendvps_avx(auVar247,auVar114,auVar295);
            auVar247 = vblendvps_avx(auVar39,auVar350,auVar295);
            auVar39 = vblendvps_avx(auVar206,auVar335,auVar295);
            auVar21 = vblendvps_avx(auVar308,auVar232,auVar295);
            auVar171 = vblendvps_avx(auVar325,auVar300,auVar295);
            auVar206 = vblendvps_avx(auVar335,auVar206,auVar295);
            auVar207 = vblendvps_avx(auVar232,auVar308,auVar295);
            auVar278 = vblendvps_avx(auVar300,auVar325,auVar295);
            local_760 = vandps_avx(auVar192,auVar297);
            auVar206 = vsubps_avx(auVar206,auVar176);
            auVar36 = vsubps_avx(auVar207,auVar31);
            auVar278 = vsubps_avx(auVar278,auVar247);
            auVar37 = vsubps_avx(auVar31,auVar21);
            fVar318 = auVar36._0_4_;
            fVar150 = auVar247._0_4_;
            fVar237 = auVar36._4_4_;
            fVar152 = auVar247._4_4_;
            auVar87._4_4_ = fVar152 * fVar237;
            auVar87._0_4_ = fVar150 * fVar318;
            fVar273 = auVar36._8_4_;
            fVar153 = auVar247._8_4_;
            auVar87._8_4_ = fVar153 * fVar273;
            fVar286 = auVar36._12_4_;
            fVar155 = auVar247._12_4_;
            auVar87._12_4_ = fVar155 * fVar286;
            fVar241 = auVar36._16_4_;
            fVar156 = auVar247._16_4_;
            auVar87._16_4_ = fVar156 * fVar241;
            fVar162 = auVar36._20_4_;
            fVar163 = auVar247._20_4_;
            auVar87._20_4_ = fVar163 * fVar162;
            fVar302 = auVar36._24_4_;
            fVar178 = auVar247._24_4_;
            auVar87._24_4_ = fVar178 * fVar302;
            auVar87._28_4_ = auVar207._28_4_;
            fVar200 = auVar31._0_4_;
            fVar179 = auVar278._0_4_;
            fVar239 = auVar31._4_4_;
            fVar180 = auVar278._4_4_;
            auVar88._4_4_ = fVar180 * fVar239;
            auVar88._0_4_ = fVar179 * fVar200;
            fVar218 = auVar31._8_4_;
            fVar226 = auVar278._8_4_;
            auVar88._8_4_ = fVar226 * fVar218;
            fVar288 = auVar31._12_4_;
            fVar236 = auVar278._12_4_;
            auVar88._12_4_ = fVar236 * fVar288;
            fVar263 = auVar31._16_4_;
            fVar238 = auVar278._16_4_;
            auVar88._16_4_ = fVar238 * fVar263;
            fVar264 = auVar31._20_4_;
            fVar240 = auVar278._20_4_;
            auVar88._20_4_ = fVar240 * fVar264;
            fVar303 = auVar31._24_4_;
            fVar253 = auVar278._24_4_;
            uVar12 = auVar308._28_4_;
            auVar88._24_4_ = fVar253 * fVar303;
            auVar88._28_4_ = uVar12;
            auVar207 = vsubps_avx(auVar88,auVar87);
            fVar213 = auVar176._0_4_;
            fVar242 = auVar176._4_4_;
            auVar89._4_4_ = fVar180 * fVar242;
            auVar89._0_4_ = fVar179 * fVar213;
            fVar314 = auVar176._8_4_;
            auVar89._8_4_ = fVar226 * fVar314;
            fVar222 = auVar176._12_4_;
            auVar89._12_4_ = fVar236 * fVar222;
            fVar215 = auVar176._16_4_;
            auVar89._16_4_ = fVar238 * fVar215;
            fVar285 = auVar176._20_4_;
            auVar89._20_4_ = fVar240 * fVar285;
            fVar304 = auVar176._24_4_;
            auVar89._24_4_ = fVar253 * fVar304;
            auVar89._28_4_ = uVar12;
            fVar214 = auVar206._0_4_;
            fVar250 = auVar206._4_4_;
            auVar90._4_4_ = fVar152 * fVar250;
            auVar90._0_4_ = fVar150 * fVar214;
            fVar281 = auVar206._8_4_;
            auVar90._8_4_ = fVar153 * fVar281;
            fVar316 = auVar206._12_4_;
            auVar90._12_4_ = fVar155 * fVar316;
            fVar217 = auVar206._16_4_;
            auVar90._16_4_ = fVar156 * fVar217;
            fVar287 = auVar206._20_4_;
            auVar90._20_4_ = fVar163 * fVar287;
            fVar305 = auVar206._24_4_;
            auVar90._24_4_ = fVar178 * fVar305;
            auVar90._28_4_ = auVar335._28_4_;
            auVar308 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = fVar239 * fVar250;
            auVar91._0_4_ = fVar200 * fVar214;
            auVar91._8_4_ = fVar218 * fVar281;
            auVar91._12_4_ = fVar288 * fVar316;
            auVar91._16_4_ = fVar263 * fVar217;
            auVar91._20_4_ = fVar264 * fVar287;
            auVar91._24_4_ = fVar303 * fVar305;
            auVar91._28_4_ = uVar12;
            auVar92._4_4_ = fVar242 * fVar237;
            auVar92._0_4_ = fVar213 * fVar318;
            auVar92._8_4_ = fVar314 * fVar273;
            auVar92._12_4_ = fVar222 * fVar286;
            auVar92._16_4_ = fVar215 * fVar241;
            auVar92._20_4_ = fVar285 * fVar162;
            auVar92._24_4_ = fVar304 * fVar302;
            auVar92._28_4_ = auVar325._28_4_;
            auVar325 = vsubps_avx(auVar92,auVar91);
            auVar38 = vsubps_avx(auVar247,auVar171);
            fVar225 = auVar325._28_4_ + auVar308._28_4_;
            auVar311._0_4_ = auVar325._0_4_ + auVar308._0_4_ * 0.0 + auVar207._0_4_ * 0.0;
            auVar311._4_4_ = auVar325._4_4_ + auVar308._4_4_ * 0.0 + auVar207._4_4_ * 0.0;
            auVar311._8_4_ = auVar325._8_4_ + auVar308._8_4_ * 0.0 + auVar207._8_4_ * 0.0;
            auVar311._12_4_ = auVar325._12_4_ + auVar308._12_4_ * 0.0 + auVar207._12_4_ * 0.0;
            auVar311._16_4_ = auVar325._16_4_ + auVar308._16_4_ * 0.0 + auVar207._16_4_ * 0.0;
            auVar311._20_4_ = auVar325._20_4_ + auVar308._20_4_ * 0.0 + auVar207._20_4_ * 0.0;
            auVar311._24_4_ = auVar325._24_4_ + auVar308._24_4_ * 0.0 + auVar207._24_4_ * 0.0;
            auVar311._28_4_ = fVar225 + auVar207._28_4_;
            fVar216 = auVar37._0_4_;
            fVar251 = auVar37._4_4_;
            auVar93._4_4_ = auVar171._4_4_ * fVar251;
            auVar93._0_4_ = auVar171._0_4_ * fVar216;
            fVar283 = auVar37._8_4_;
            auVar93._8_4_ = auVar171._8_4_ * fVar283;
            fVar290 = auVar37._12_4_;
            auVar93._12_4_ = auVar171._12_4_ * fVar290;
            fVar219 = auVar37._16_4_;
            auVar93._16_4_ = auVar171._16_4_ * fVar219;
            fVar289 = auVar37._20_4_;
            auVar93._20_4_ = auVar171._20_4_ * fVar289;
            fVar135 = auVar37._24_4_;
            auVar93._24_4_ = auVar171._24_4_ * fVar135;
            auVar93._28_4_ = fVar225;
            fVar225 = auVar38._0_4_;
            fVar252 = auVar38._4_4_;
            auVar94._4_4_ = auVar21._4_4_ * fVar252;
            auVar94._0_4_ = auVar21._0_4_ * fVar225;
            fVar220 = auVar38._8_4_;
            auVar94._8_4_ = auVar21._8_4_ * fVar220;
            fVar292 = auVar38._12_4_;
            auVar94._12_4_ = auVar21._12_4_ * fVar292;
            fVar221 = auVar38._16_4_;
            auVar94._16_4_ = auVar21._16_4_ * fVar221;
            fVar291 = auVar38._20_4_;
            auVar94._20_4_ = auVar21._20_4_ * fVar291;
            fVar136 = auVar38._24_4_;
            auVar94._24_4_ = auVar21._24_4_ * fVar136;
            auVar94._28_4_ = auVar325._28_4_;
            auVar308 = vsubps_avx(auVar94,auVar93);
            auVar325 = vsubps_avx(auVar176,auVar39);
            fVar235 = auVar325._0_4_;
            fVar323 = auVar325._4_4_;
            auVar95._4_4_ = auVar171._4_4_ * fVar323;
            auVar95._0_4_ = auVar171._0_4_ * fVar235;
            fVar315 = auVar325._8_4_;
            auVar95._8_4_ = auVar171._8_4_ * fVar315;
            fVar224 = auVar325._12_4_;
            auVar95._12_4_ = auVar171._12_4_ * fVar224;
            fVar223 = auVar325._16_4_;
            auVar95._16_4_ = auVar171._16_4_ * fVar223;
            fVar293 = auVar325._20_4_;
            auVar95._20_4_ = auVar171._20_4_ * fVar293;
            fVar149 = auVar325._24_4_;
            auVar95._24_4_ = auVar171._24_4_ * fVar149;
            auVar95._28_4_ = auVar171._28_4_;
            auVar96._4_4_ = fVar252 * auVar39._4_4_;
            auVar96._0_4_ = fVar225 * auVar39._0_4_;
            auVar96._8_4_ = fVar220 * auVar39._8_4_;
            auVar96._12_4_ = fVar292 * auVar39._12_4_;
            auVar96._16_4_ = fVar221 * auVar39._16_4_;
            auVar96._20_4_ = fVar291 * auVar39._20_4_;
            auVar96._24_4_ = fVar136 * auVar39._24_4_;
            auVar96._28_4_ = auVar207._28_4_;
            auVar171 = vsubps_avx(auVar95,auVar96);
            auVar97._4_4_ = auVar21._4_4_ * fVar323;
            auVar97._0_4_ = auVar21._0_4_ * fVar235;
            auVar97._8_4_ = auVar21._8_4_ * fVar315;
            auVar97._12_4_ = auVar21._12_4_ * fVar224;
            auVar97._16_4_ = auVar21._16_4_ * fVar223;
            auVar97._20_4_ = auVar21._20_4_ * fVar293;
            auVar97._24_4_ = auVar21._24_4_ * fVar149;
            auVar97._28_4_ = auVar21._28_4_;
            auVar98._4_4_ = fVar251 * auVar39._4_4_;
            auVar98._0_4_ = fVar216 * auVar39._0_4_;
            auVar98._8_4_ = fVar283 * auVar39._8_4_;
            auVar98._12_4_ = fVar290 * auVar39._12_4_;
            auVar98._16_4_ = fVar219 * auVar39._16_4_;
            auVar98._20_4_ = fVar289 * auVar39._20_4_;
            auVar98._24_4_ = fVar135 * auVar39._24_4_;
            auVar98._28_4_ = auVar39._28_4_;
            auVar39 = vsubps_avx(auVar98,auVar97);
            auVar148._0_4_ = auVar308._0_4_ * 0.0 + auVar39._0_4_ + auVar171._0_4_ * 0.0;
            auVar148._4_4_ = auVar308._4_4_ * 0.0 + auVar39._4_4_ + auVar171._4_4_ * 0.0;
            auVar148._8_4_ = auVar308._8_4_ * 0.0 + auVar39._8_4_ + auVar171._8_4_ * 0.0;
            auVar148._12_4_ = auVar308._12_4_ * 0.0 + auVar39._12_4_ + auVar171._12_4_ * 0.0;
            auVar148._16_4_ = auVar308._16_4_ * 0.0 + auVar39._16_4_ + auVar171._16_4_ * 0.0;
            auVar148._20_4_ = auVar308._20_4_ * 0.0 + auVar39._20_4_ + auVar171._20_4_ * 0.0;
            auVar148._24_4_ = auVar308._24_4_ * 0.0 + auVar39._24_4_ + auVar171._24_4_ * 0.0;
            auVar148._28_4_ = auVar171._28_4_ + auVar39._28_4_ + auVar171._28_4_;
            auVar39 = vmaxps_avx(auVar311,auVar148);
            auVar39 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,2);
            auVar234 = ZEXT3264(local_760);
            auVar21 = local_760 & auVar39;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0x7f,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0xbf,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar21[0x1f]) {
LAB_00faba13:
              auVar177 = ZEXT3264(CONCAT824(uStack_4e8,
                                            CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
              auVar330._4_4_ = fVar151;
              auVar330._0_4_ = fVar199;
              auVar330._8_4_ = fVar154;
              auVar330._12_4_ = fVar157;
              auVar330._16_4_ = fVar158;
              auVar330._20_4_ = fVar159;
              auVar330._24_4_ = fVar160;
              auVar330._28_4_ = fVar161;
            }
            else {
              auVar21 = vandps_avx(auVar39,local_760);
              auVar99._4_4_ = fVar252 * fVar237;
              auVar99._0_4_ = fVar225 * fVar318;
              auVar99._8_4_ = fVar220 * fVar273;
              auVar99._12_4_ = fVar292 * fVar286;
              auVar99._16_4_ = fVar221 * fVar241;
              auVar99._20_4_ = fVar291 * fVar162;
              auVar99._24_4_ = fVar136 * fVar302;
              auVar99._28_4_ = local_760._28_4_;
              auVar100._4_4_ = fVar251 * fVar180;
              auVar100._0_4_ = fVar216 * fVar179;
              auVar100._8_4_ = fVar283 * fVar226;
              auVar100._12_4_ = fVar290 * fVar236;
              auVar100._16_4_ = fVar219 * fVar238;
              auVar100._20_4_ = fVar289 * fVar240;
              auVar100._24_4_ = fVar135 * fVar253;
              auVar100._28_4_ = auVar39._28_4_;
              auVar171 = vsubps_avx(auVar100,auVar99);
              auVar101._4_4_ = fVar323 * fVar180;
              auVar101._0_4_ = fVar235 * fVar179;
              auVar101._8_4_ = fVar315 * fVar226;
              auVar101._12_4_ = fVar224 * fVar236;
              auVar101._16_4_ = fVar223 * fVar238;
              auVar101._20_4_ = fVar293 * fVar240;
              auVar101._24_4_ = fVar149 * fVar253;
              auVar101._28_4_ = auVar278._28_4_;
              auVar102._4_4_ = fVar252 * fVar250;
              auVar102._0_4_ = fVar225 * fVar214;
              auVar102._8_4_ = fVar220 * fVar281;
              auVar102._12_4_ = fVar292 * fVar316;
              auVar102._16_4_ = fVar221 * fVar217;
              auVar102._20_4_ = fVar291 * fVar287;
              auVar102._24_4_ = fVar136 * fVar305;
              auVar102._28_4_ = auVar38._28_4_;
              auVar207 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar251 * fVar250;
              auVar103._0_4_ = fVar216 * fVar214;
              auVar103._8_4_ = fVar283 * fVar281;
              auVar103._12_4_ = fVar290 * fVar316;
              auVar103._16_4_ = fVar219 * fVar217;
              auVar103._20_4_ = fVar289 * fVar287;
              auVar103._24_4_ = fVar135 * fVar305;
              auVar103._28_4_ = auVar206._28_4_;
              auVar104._4_4_ = fVar323 * fVar237;
              auVar104._0_4_ = fVar235 * fVar318;
              auVar104._8_4_ = fVar315 * fVar273;
              auVar104._12_4_ = fVar224 * fVar286;
              auVar104._16_4_ = fVar223 * fVar241;
              auVar104._20_4_ = fVar293 * fVar162;
              auVar104._24_4_ = fVar149 * fVar302;
              auVar104._28_4_ = auVar36._28_4_;
              auVar278 = vsubps_avx(auVar104,auVar103);
              auVar175._0_4_ = auVar171._0_4_ * 0.0 + auVar278._0_4_ + auVar207._0_4_ * 0.0;
              auVar175._4_4_ = auVar171._4_4_ * 0.0 + auVar278._4_4_ + auVar207._4_4_ * 0.0;
              auVar175._8_4_ = auVar171._8_4_ * 0.0 + auVar278._8_4_ + auVar207._8_4_ * 0.0;
              auVar175._12_4_ = auVar171._12_4_ * 0.0 + auVar278._12_4_ + auVar207._12_4_ * 0.0;
              auVar175._16_4_ = auVar171._16_4_ * 0.0 + auVar278._16_4_ + auVar207._16_4_ * 0.0;
              auVar175._20_4_ = auVar171._20_4_ * 0.0 + auVar278._20_4_ + auVar207._20_4_ * 0.0;
              auVar175._24_4_ = auVar171._24_4_ * 0.0 + auVar278._24_4_ + auVar207._24_4_ * 0.0;
              auVar175._28_4_ = auVar36._28_4_ + auVar278._28_4_ + auVar206._28_4_;
              auVar39 = vrcpps_avx(auVar175);
              fVar318 = auVar39._0_4_;
              fVar214 = auVar39._4_4_;
              auVar105._4_4_ = auVar175._4_4_ * fVar214;
              auVar105._0_4_ = auVar175._0_4_ * fVar318;
              fVar216 = auVar39._8_4_;
              auVar105._8_4_ = auVar175._8_4_ * fVar216;
              fVar225 = auVar39._12_4_;
              auVar105._12_4_ = auVar175._12_4_ * fVar225;
              fVar235 = auVar39._16_4_;
              auVar105._16_4_ = auVar175._16_4_ * fVar235;
              fVar237 = auVar39._20_4_;
              auVar105._20_4_ = auVar175._20_4_ * fVar237;
              fVar250 = auVar39._24_4_;
              auVar105._24_4_ = auVar175._24_4_ * fVar250;
              auVar105._28_4_ = auVar38._28_4_;
              auVar329._8_4_ = 0x3f800000;
              auVar329._0_8_ = 0x3f8000003f800000;
              auVar329._12_4_ = 0x3f800000;
              auVar329._16_4_ = 0x3f800000;
              auVar329._20_4_ = 0x3f800000;
              auVar329._24_4_ = 0x3f800000;
              auVar329._28_4_ = 0x3f800000;
              auVar39 = vsubps_avx(auVar329,auVar105);
              fVar318 = auVar39._0_4_ * fVar318 + fVar318;
              fVar214 = auVar39._4_4_ * fVar214 + fVar214;
              fVar216 = auVar39._8_4_ * fVar216 + fVar216;
              fVar225 = auVar39._12_4_ * fVar225 + fVar225;
              fVar235 = auVar39._16_4_ * fVar235 + fVar235;
              fVar237 = auVar39._20_4_ * fVar237 + fVar237;
              fVar250 = auVar39._24_4_ * fVar250 + fVar250;
              auVar106._4_4_ =
                   (fVar242 * auVar171._4_4_ + auVar207._4_4_ * fVar239 + auVar278._4_4_ * fVar152)
                   * fVar214;
              auVar106._0_4_ =
                   (fVar213 * auVar171._0_4_ + auVar207._0_4_ * fVar200 + auVar278._0_4_ * fVar150)
                   * fVar318;
              auVar106._8_4_ =
                   (fVar314 * auVar171._8_4_ + auVar207._8_4_ * fVar218 + auVar278._8_4_ * fVar153)
                   * fVar216;
              auVar106._12_4_ =
                   (fVar222 * auVar171._12_4_ +
                   auVar207._12_4_ * fVar288 + auVar278._12_4_ * fVar155) * fVar225;
              auVar106._16_4_ =
                   (fVar215 * auVar171._16_4_ +
                   auVar207._16_4_ * fVar263 + auVar278._16_4_ * fVar156) * fVar235;
              auVar106._20_4_ =
                   (fVar285 * auVar171._20_4_ +
                   auVar207._20_4_ * fVar264 + auVar278._20_4_ * fVar163) * fVar237;
              auVar106._24_4_ =
                   (fVar304 * auVar171._24_4_ +
                   auVar207._24_4_ * fVar303 + auVar278._24_4_ * fVar178) * fVar250;
              auVar106._28_4_ = auVar176._28_4_ + auVar31._28_4_ + auVar247._28_4_;
              auVar212 = ZEXT3264(auVar106);
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar233._4_4_ = uVar12;
              auVar233._0_4_ = uVar12;
              auVar233._8_4_ = uVar12;
              auVar233._12_4_ = uVar12;
              auVar233._16_4_ = uVar12;
              auVar233._20_4_ = uVar12;
              auVar233._24_4_ = uVar12;
              auVar233._28_4_ = uVar12;
              auVar176 = vcmpps_avx(local_c0,auVar106,2);
              auVar31 = vcmpps_avx(auVar106,auVar233,2);
              auVar234 = ZEXT3264(auVar31);
              auVar176 = vandps_avx(auVar176,auVar31);
              auVar247 = auVar21 & auVar176;
              if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar247 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar247 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar247 >> 0x7f,0) == '\0') &&
                    (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar247 >> 0xbf,0) == '\0') &&
                  (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar247[0x1f]) goto LAB_00faba13;
              auVar176 = vandps_avx(auVar21,auVar176);
              auVar247 = vcmpps_avx(ZEXT832(0) << 0x20,auVar175,4);
              auVar39 = auVar176 & auVar247;
              auVar177 = ZEXT3264(CONCAT824(uStack_4e8,
                                            CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
              auVar330._4_4_ = fVar151;
              auVar330._0_4_ = fVar199;
              auVar330._8_4_ = fVar154;
              auVar330._12_4_ = fVar157;
              auVar330._16_4_ = fVar158;
              auVar330._20_4_ = fVar159;
              auVar330._24_4_ = fVar160;
              auVar330._28_4_ = fVar161;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar176 = vandps_avx(auVar247,auVar176);
                auVar177 = ZEXT3264(auVar176);
                auVar107._4_4_ = fVar214 * auVar311._4_4_;
                auVar107._0_4_ = fVar318 * auVar311._0_4_;
                auVar107._8_4_ = fVar216 * auVar311._8_4_;
                auVar107._12_4_ = fVar225 * auVar311._12_4_;
                auVar107._16_4_ = fVar235 * auVar311._16_4_;
                auVar107._20_4_ = fVar237 * auVar311._20_4_;
                auVar107._24_4_ = fVar250 * auVar311._24_4_;
                auVar107._28_4_ = auVar31._28_4_;
                auVar108._4_4_ = auVar148._4_4_ * fVar214;
                auVar108._0_4_ = auVar148._0_4_ * fVar318;
                auVar108._8_4_ = auVar148._8_4_ * fVar216;
                auVar108._12_4_ = auVar148._12_4_ * fVar225;
                auVar108._16_4_ = auVar148._16_4_ * fVar235;
                auVar108._20_4_ = auVar148._20_4_ * fVar237;
                auVar108._24_4_ = auVar148._24_4_ * fVar250;
                auVar108._28_4_ = auVar148._28_4_;
                auVar259._8_4_ = 0x3f800000;
                auVar259._0_8_ = 0x3f8000003f800000;
                auVar259._12_4_ = 0x3f800000;
                auVar259._16_4_ = 0x3f800000;
                auVar259._20_4_ = 0x3f800000;
                auVar259._24_4_ = 0x3f800000;
                auVar259._28_4_ = 0x3f800000;
                auVar176 = vsubps_avx(auVar259,auVar107);
                local_180 = vblendvps_avx(auVar176,auVar107,auVar295);
                auVar176 = vsubps_avx(auVar259,auVar108);
                auVar234 = ZEXT3264(auVar176);
                _local_3e0 = vblendvps_avx(auVar176,auVar108,auVar295);
                local_1a0 = auVar106;
              }
            }
            auVar176 = auVar177._0_32_;
            if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar176 >> 0x7f,0) != '\0') ||
                  (auVar177 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar176 >> 0xbf,0) != '\0') ||
                (auVar177 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar177[0x1f] < '\0') {
              auVar31 = vsubps_avx(auVar298,auVar330);
              auVar212 = ZEXT3264(local_180);
              fVar200 = auVar330._0_4_ + auVar31._0_4_ * local_180._0_4_;
              fVar213 = auVar330._4_4_ + auVar31._4_4_ * local_180._4_4_;
              fVar214 = auVar330._8_4_ + auVar31._8_4_ * local_180._8_4_;
              fVar216 = auVar330._12_4_ + auVar31._12_4_ * local_180._12_4_;
              fVar225 = auVar330._16_4_ + auVar31._16_4_ * local_180._16_4_;
              fVar235 = auVar330._20_4_ + auVar31._20_4_ * local_180._20_4_;
              fVar237 = auVar330._24_4_ + auVar31._24_4_ * local_180._24_4_;
              fVar239 = auVar330._28_4_ + auVar31._28_4_;
              fVar318 = *(float *)((long)local_6d8->ray_space + k * 4 + -0x10);
              auVar193 = ZEXT3264(CONCAT428(fVar318,CONCAT424(fVar318,CONCAT420(fVar318,CONCAT416(
                                                  fVar318,CONCAT412(fVar318,CONCAT48(fVar318,
                                                  CONCAT44(fVar318,fVar318))))))));
              auVar109._4_4_ = (fVar213 + fVar213) * fVar318;
              auVar109._0_4_ = (fVar200 + fVar200) * fVar318;
              auVar109._8_4_ = (fVar214 + fVar214) * fVar318;
              auVar109._12_4_ = (fVar216 + fVar216) * fVar318;
              auVar109._16_4_ = (fVar225 + fVar225) * fVar318;
              auVar109._20_4_ = (fVar235 + fVar235) * fVar318;
              auVar109._24_4_ = (fVar237 + fVar237) * fVar318;
              auVar109._28_4_ = fVar239 + fVar239;
              auVar234 = ZEXT3264(local_1a0);
              auVar31 = vcmpps_avx(local_1a0,auVar109,6);
              auVar247 = auVar176 & auVar31;
              if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar247 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar247 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar247 >> 0x7f,0) != '\0') ||
                    (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar247 >> 0xbf,0) != '\0') ||
                  (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar247[0x1f] < '\0') {
                local_220 = vandps_avx(auVar31,auVar176);
                local_2c0 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
                fStack_2bc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
                fStack_2b8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                fStack_2b4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                fStack_2b0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                fStack_2ac = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                fStack_2a8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                fStack_2a4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                local_2e0 = local_180;
                local_2a0 = local_1a0;
                local_270 = local_6f0;
                uStack_268 = uStack_6e8;
                local_260 = local_610;
                uStack_258 = uStack_608;
                local_250 = local_620;
                uStack_248 = uStack_618;
                auVar193 = ZEXT1664(_local_630);
                local_240 = _local_630;
                pGVar132 = (context->scene->geometries).items[local_788].ptr;
                local_3e0._4_4_ = fStack_2bc;
                local_3e0._0_4_ = local_2c0;
                uStack_3d8._0_4_ = fStack_2b8;
                uStack_3d8._4_4_ = fStack_2b4;
                uStack_3d0._0_4_ = fStack_2b0;
                uStack_3d0._4_4_ = fStack_2ac;
                auVar121 = _local_3e0;
                uStack_3c8._0_4_ = fStack_2a8;
                uStack_3c8._4_4_ = fStack_2a4;
                auVar176 = _local_3e0;
                if ((pGVar132->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar127 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar127 = context->args;
                  if ((pRVar127->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar127 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar127 >> 8),1),
                     pGVar132->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_760._0_8_ = pGVar132;
                    auVar168._0_4_ = (float)(int)local_280;
                    auVar168._4_8_ = SUB128(ZEXT812(0),4);
                    auVar168._12_4_ = 0;
                    fVar182 = local_180._0_4_ + 0.0;
                    fVar198 = local_180._4_4_ + 1.0;
                    fVar196 = local_180._8_4_ + 2.0;
                    fVar318 = local_180._12_4_ + 3.0;
                    fVar200 = local_180._16_4_ + 4.0;
                    fVar213 = local_180._20_4_ + 5.0;
                    fVar214 = local_180._24_4_ + 6.0;
                    auVar193 = ZEXT3264(CONCAT428((float)local_180._28_4_ + 7.0,
                                                  CONCAT424(fVar214,CONCAT420(fVar213,CONCAT416(
                                                  fVar200,CONCAT412(fVar318,CONCAT48(fVar196,
                                                  CONCAT44(fVar198,fVar182))))))));
                    auVar140 = vshufps_avx(auVar168,auVar168,0);
                    local_200[0] = (auVar140._0_4_ + fVar182) * (float)local_e0._0_4_;
                    local_200[1] = (auVar140._4_4_ + fVar198) * (float)local_e0._4_4_;
                    local_200[2] = (auVar140._8_4_ + fVar196) * fStack_d8;
                    local_200[3] = (auVar140._12_4_ + fVar318) * fStack_d4;
                    fStack_1f0 = (auVar140._0_4_ + fVar200) * fStack_d0;
                    fStack_1ec = (auVar140._4_4_ + fVar213) * fStack_cc;
                    fStack_1e8 = (auVar140._8_4_ + fVar214) * fStack_c8;
                    fStack_1e4 = auVar140._12_4_ + (float)local_180._28_4_ + 7.0;
                    uStack_3d0 = auVar121._16_8_;
                    uStack_3c8 = auVar176._24_8_;
                    local_1e0 = local_3e0;
                    uStack_1d8 = uStack_3d8;
                    uStack_1d0 = uStack_3d0;
                    uStack_1c8 = uStack_3c8;
                    local_1c0 = local_1a0;
                    iVar125 = vmovmskps_avx(local_220);
                    local_7e0 = CONCAT44((int)((ulong)pRVar127 >> 0x20),iVar125);
                    lVar18 = 0;
                    if (local_7e0 != 0) {
                      for (; (local_7e0 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar18;
                    uStack_7bc = (undefined4)((ulong)lVar18 >> 0x20);
                    _local_3e0 = auVar176;
                    if (iVar125 == 0) {
                      pRVar127 = (RTCIntersectArguments *)0x0;
LAB_00faba3c:
                    }
                    else {
                      auStack_690 = auVar248._16_16_;
                      local_6a0 = *local_6e0;
                      local_740._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      _local_5c0 = auVar297;
                      _local_5a0 = auVar333;
                      _local_580 = auVar192;
                      local_27c = uVar16;
                      do {
                        lVar18 = CONCAT44(uStack_7bc,local_7c0);
                        local_440 = local_200[lVar18];
                        local_430 = *(undefined4 *)((long)&local_1e0 + lVar18 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + lVar18 * 4);
                        fVar198 = 1.0 - local_440;
                        fVar196 = local_440 * (fVar198 + fVar198) - fVar198 * fVar198;
                        auVar234 = ZEXT464((uint)fVar196);
                        fVar182 = local_440 * 3.0;
                        auVar140 = ZEXT416((uint)((fVar198 * -2.0 * local_440 +
                                                  local_440 * local_440) * 0.5));
                        auVar140 = vshufps_avx(auVar140,auVar140,0);
                        auVar204 = ZEXT416((uint)(((fVar198 + fVar198) * (fVar182 + 2.0) +
                                                  fVar198 * fVar198 * -3.0) * 0.5));
                        auVar204 = vshufps_avx(auVar204,auVar204,0);
                        auVar205 = ZEXT416((uint)(((local_440 + local_440) * (fVar182 + -5.0) +
                                                  local_440 * fVar182) * 0.5));
                        auVar205 = vshufps_avx(auVar205,auVar205,0);
                        local_6d0.context = context->user;
                        auVar22 = vshufps_avx(ZEXT416((uint)(fVar196 * 0.5)),
                                              ZEXT416((uint)(fVar196 * 0.5)),0);
                        auVar186._0_4_ =
                             auVar22._0_4_ * (float)local_6f0._0_4_ +
                             auVar205._0_4_ * (float)local_610._0_4_ +
                             auVar140._0_4_ * (float)local_630._0_4_ +
                             auVar204._0_4_ * (float)local_620._0_4_;
                        auVar186._4_4_ =
                             auVar22._4_4_ * (float)local_6f0._4_4_ +
                             auVar205._4_4_ * (float)local_610._4_4_ +
                             auVar140._4_4_ * (float)local_630._4_4_ +
                             auVar204._4_4_ * (float)local_620._4_4_;
                        auVar186._8_4_ =
                             auVar22._8_4_ * (float)uStack_6e8 +
                             auVar205._8_4_ * (float)uStack_608 +
                             auVar140._8_4_ * fStack_628 + auVar204._8_4_ * (float)uStack_618;
                        auVar186._12_4_ =
                             auVar22._12_4_ * uStack_6e8._4_4_ +
                             auVar205._12_4_ * uStack_608._4_4_ +
                             auVar140._12_4_ * fStack_624 + auVar204._12_4_ * uStack_618._4_4_;
                        local_470 = (RTCHitN  [16])vshufps_avx(auVar186,auVar186,0);
                        local_460 = vshufps_avx(auVar186,auVar186,0x55);
                        auVar212 = ZEXT1664(local_460);
                        local_450 = vshufps_avx(auVar186,auVar186,0xaa);
                        auVar193 = ZEXT1664(local_450);
                        local_420 = local_640._0_8_;
                        uStack_418 = local_640._8_8_;
                        local_410 = local_300._0_8_;
                        uStack_408 = local_300._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_3fc = (local_6d0.context)->instID[0];
                        local_400 = uStack_3fc;
                        uStack_3f8 = uStack_3fc;
                        uStack_3f4 = uStack_3fc;
                        uStack_3f0 = (local_6d0.context)->instPrimID[0];
                        uStack_3ec = uStack_3f0;
                        uStack_3e8 = uStack_3f0;
                        uStack_3e4 = uStack_3f0;
                        local_7a0 = local_6a0;
                        local_6d0.valid = (int *)local_7a0;
                        local_6d0.geometryUserPtr = pGVar132->userPtr;
                        local_6d0.hit = local_470;
                        local_6d0.N = 4;
                        local_6d0.ray = (RTCRayN *)ray;
                        fStack_43c = local_440;
                        fStack_438 = local_440;
                        fStack_434 = local_440;
                        uStack_42c = local_430;
                        uStack_428 = local_430;
                        uStack_424 = local_430;
                        if (pGVar132->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar193 = ZEXT1664(local_450);
                          auVar212 = ZEXT1664(local_460);
                          auVar234 = ZEXT464((uint)fVar196);
                          (*pGVar132->occlusionFilterN)(&local_6d0);
                        }
                        if (local_7a0 == (undefined1  [16])0x0) {
                          auVar140 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                          auVar140 = auVar140 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_760._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar212 = ZEXT1664(auVar212._0_16_);
                            auVar234 = ZEXT1664(auVar234._0_16_);
                            (*p_Var19)(&local_6d0);
                          }
                          auVar204 = vpcmpeqd_avx(local_7a0,_DAT_01f7aa10);
                          auVar140 = auVar204 ^ _DAT_01f7ae20;
                          auVar187._8_4_ = 0xff800000;
                          auVar187._0_8_ = 0xff800000ff800000;
                          auVar187._12_4_ = 0xff800000;
                          auVar193 = ZEXT1664(auVar187);
                          auVar204 = vblendvps_avx(auVar187,*(undefined1 (*) [16])
                                                             (local_6d0.ray + 0x80),auVar204);
                          *(undefined1 (*) [16])(local_6d0.ray + 0x80) = auVar204;
                        }
                        auVar169._8_8_ = 0x100000001;
                        auVar169._0_8_ = 0x100000001;
                        if ((auVar169 & auVar140) != (undefined1  [16])0x0) {
                          pRVar127 = (RTCIntersectArguments *)0x1;
                          goto LAB_00faba3c;
                        }
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_740._0_4_;
                        local_7e0 = local_7e0 ^ 1L << ((ulong)local_7c0 & 0x3f);
                        lVar18 = 0;
                        if (local_7e0 != 0) {
                          for (; (local_7e0 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar18;
                        uStack_7bc = (undefined4)((ulong)lVar18 >> 0x20);
                        pRVar127 = (RTCIntersectArguments *)0x0;
                        pGVar132 = (Geometry *)local_760._0_8_;
                      } while (local_7e0 != 0);
                    }
                  }
                }
                bVar130 = (bool)(bVar130 | (byte)pRVar127);
                fVar331 = (float)local_780._0_4_;
                fVar337 = (float)local_780._4_4_;
                fVar338 = fStack_778;
                fVar340 = fStack_774;
                fVar182 = fStack_770;
                fVar198 = fStack_76c;
                fVar196 = fStack_768;
              }
            }
          }
          lVar134 = lVar134 + 8;
        } while ((int)lVar134 < (int)uVar16);
      }
      if (bVar130 != false) {
        return bVar130;
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar141._4_4_ = uVar12;
      auVar141._0_4_ = uVar12;
      auVar141._8_4_ = uVar12;
      auVar141._12_4_ = uVar12;
      auVar140 = vcmpps_avx(local_2f0,auVar141,2);
      uVar128 = vmovmskps_avx(auVar140);
      uVar124 = uVar124 & uVar124 + 0xf & uVar128;
    } while (uVar124 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }